

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces_box.cpp
# Opt level: O3

void EBMOL::ExtrapVelToFacesBox
               (Box *ubx,Box *vbx,Box *wbx,Array4<double> *u,Array4<double> *v,Array4<double> *w,
               Array4<const_double> *vcc,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,Geometry *geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  pointer pBVar30;
  double *pdVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  EBCellFlag *pEVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  double *pdVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  double *pdVar56;
  long lVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined8 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  int kk;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  uint uVar103;
  int iVar104;
  int iVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  Long *pLVar119;
  int iVar120;
  uint uVar121;
  int iVar122;
  int iVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  long lVar140;
  double **ppdVar141;
  int iVar142;
  long lVar143;
  long lVar144;
  double *pdVar145;
  double *pdVar146;
  int kk_14;
  int iVar147;
  int iVar148;
  long lVar149;
  uint uVar150;
  int iVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  long lVar157;
  long lVar158;
  long lVar159;
  long lVar160;
  double *pdVar161;
  long lVar162;
  double *pdVar163;
  double *pdVar164;
  uint uVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  double *pdVar169;
  long lVar170;
  char cVar171;
  int iVar172;
  long lVar173;
  double *pdVar174;
  int iVar175;
  long lVar176;
  long lVar177;
  int jj_1;
  int iVar178;
  long lVar179;
  int iVar180;
  long lVar181;
  long lVar182;
  char cVar183;
  int iVar184;
  int iVar185;
  long lVar186;
  int kk_8;
  int iVar187;
  long lVar188;
  bool bVar189;
  int iVar190;
  int iVar191;
  int iVar192;
  long lVar193;
  long lVar194;
  double *pdVar195;
  double *pdVar196;
  bool bVar197;
  ulong uVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  double dVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  double dVar212;
  double dVar213;
  undefined1 auVar217 [16];
  double dVar214;
  ulong uVar215;
  ulong uVar216;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  double dVar220;
  undefined1 auVar221 [16];
  Real delta_y;
  double dVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  double dVar225;
  double dVar228;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined4 uVar229;
  undefined4 uVar230;
  undefined4 uVar231;
  undefined4 uVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  Real delta_z_2;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  double dVar241;
  double dVar242;
  Real delta_y_2;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  undefined1 auVar247 [16];
  Real delta_z_1;
  double dVar248;
  int cuts_x_1;
  Real xf_1;
  Real zf;
  int cuts_z;
  Real zf_1;
  Real delta_x;
  Real delta_y_1;
  Real yf;
  Real delta_x_2;
  Real delta_z;
  Real A [27] [3];
  Real du [27];
  int local_7a0;
  anon_class_552_16_5c7b231c local_398;
  double adStack_108 [27];
  
  iVar192 = (geom->domain).smallend.vect[0];
  iVar148 = (geom->domain).smallend.vect[1];
  iVar4 = (geom->domain).bigend.vect[0];
  iVar5 = (geom->domain).bigend.vect[1];
  iVar6 = (geom->domain).smallend.vect[2];
  iVar7 = (geom->domain).bigend.vect[2];
  pBVar30 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pBVar30->bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar192)) {
    local_7a0 = (ubx->bigend).vect[0];
  }
  else {
    local_7a0 = (ubx->bigend).vect[0];
    if ((((local_7a0 < iVar4 || pBVar30->bc[3] - 5U < 0xfffffffe) &&
         ((1 < pBVar30->bc[1] - 3U || (iVar148 < (vbx->smallend).vect[1] + -1)))) &&
        ((pBVar30->bc[4] - 5U < 0xfffffffe || ((vbx->bigend).vect[1] < iVar5)))) &&
       (((1 < pBVar30->bc[2] - 3U || (iVar6 < (wbx->smallend).vect[2] + -1)) &&
        ((pBVar30->bc[5] - 5U < 0xfffffffe || ((wbx->bigend).vect[2] < iVar7)))))) {
      iVar8 = (ubx->smallend).vect[2];
      lVar138 = (long)iVar8;
      iVar9 = (ubx->bigend).vect[2];
      if (iVar8 <= iVar9) {
        pdVar31 = u->p;
        lVar2 = u->jstride;
        lVar32 = u->kstride;
        pdVar33 = ccc->p;
        lVar34 = ccc->nstride;
        iVar8 = (ccc->begin).x;
        lVar152 = (long)iVar8;
        uVar24 = (vfrac->begin).y;
        lVar134 = (long)(int)uVar24;
        uVar25 = (vfrac->begin).z;
        lVar135 = (long)(int)uVar25;
        iVar147 = (u->begin).z;
        iVar10 = (u->begin).y;
        iVar11 = (u->begin).x;
        uVar28 = (vcc->begin).x;
        lVar143 = (long)(int)uVar28;
        iVar187 = (ubx->smallend).vect[0];
        lVar124 = (long)iVar187;
        iVar190 = (ccc->begin).z;
        iVar191 = (ccc->begin).y;
        pdVar39 = vcc->p;
        lVar35 = vcc->jstride;
        lVar37 = vcc->kstride;
        iVar12 = (vcc->begin).y;
        lVar116 = (long)iVar12;
        iVar13 = (vcc->begin).z;
        lVar117 = (long)iVar13;
        pEVar36 = flag->p;
        lVar38 = flag->jstride;
        lVar40 = flag->kstride;
        pdVar43 = fcx->p;
        lVar41 = fcx->jstride;
        lVar42 = fcx->kstride;
        lVar44 = fcx->nstride;
        pdVar47 = fcy->p;
        lVar45 = fcy->jstride;
        lVar46 = fcy->kstride;
        lVar48 = fcy->nstride;
        iVar14 = (fcy->begin).y;
        pdVar53 = fcz->p;
        lVar49 = fcz->jstride;
        lVar50 = fcz->kstride;
        lVar51 = fcz->nstride;
        iVar15 = (fcz->begin).z;
        lVar52 = ccc->jstride;
        lVar54 = ccc->kstride;
        pdVar56 = vfrac->p;
        lVar55 = vfrac->jstride;
        lVar57 = vfrac->kstride;
        iVar16 = (vfrac->begin).x;
        lVar153 = (long)iVar16;
        iVar17 = (fcz->begin).y;
        lVar133 = (long)(fcz->begin).x;
        iVar18 = (fcy->begin).z;
        lVar106 = (long)(fcy->begin).x;
        iVar19 = (fcx->begin).z;
        iVar20 = (fcx->begin).y;
        iVar21 = (fcx->begin).x;
        iVar22 = (flag->begin).z;
        iVar23 = (flag->begin).y;
        lVar107 = (long)(flag->begin).x;
        iVar26 = (ubx->bigend).vect[1];
        iVar27 = (ubx->smallend).vect[1];
        do {
          if (iVar27 <= iVar26) {
            lVar154 = lVar138 + 1;
            lVar166 = (lVar138 - iVar22) * lVar40;
            lVar108 = (lVar138 - iVar19) * lVar42;
            iVar178 = (int)lVar138;
            iVar122 = iVar178 - iVar13;
            lVar109 = iVar122 * lVar37;
            lVar176 = (lVar138 - lVar135) * lVar57;
            lVar167 = (lVar138 - lVar117) * lVar37;
            lVar177 = ((lVar138 + -1) - lVar135) * lVar57;
            lVar179 = (lVar154 - lVar135) * lVar57;
            lVar111 = ((lVar138 + -1) - lVar117) * lVar37;
            lVar112 = (lVar154 - lVar117) * lVar37;
            lVar110 = (lVar138 - iVar190) * lVar54;
            lVar125 = (lVar138 - iVar18) * lVar46;
            lVar126 = ((int)lVar154 - iVar15) * lVar50;
            lVar136 = (lVar138 - iVar15) * lVar50;
            lVar155 = (int)(~uVar25 + iVar178) * lVar57;
            lVar160 = (int)((int)lVar154 - uVar25) * lVar57;
            lVar173 = (lVar138 + ~(long)iVar190) * lVar54;
            lVar154 = (long)iVar27;
            do {
              if (local_7a0 < iVar187) {
                uVar198 = lVar154 + 1U & 0xffffffff;
              }
              else {
                uVar198 = lVar154 + 1;
                lVar156 = (lVar154 - iVar23) * lVar38;
                lVar193 = (lVar154 - iVar20) * lVar41;
                iVar130 = (int)lVar154;
                iVar131 = iVar130 - iVar12;
                lVar149 = iVar131 * lVar35;
                lVar157 = (lVar154 - lVar134) * lVar55;
                lVar139 = (lVar154 - lVar116) * lVar35;
                lVar158 = ((lVar154 + -1) - lVar134) * lVar55;
                lVar159 = (uVar198 - lVar134) * lVar55;
                lVar113 = ((lVar154 + -1) - lVar116) * lVar35;
                lVar168 = (uVar198 - lVar116) * lVar35;
                lVar144 = (lVar154 - iVar191) * lVar52;
                lVar194 = ((int)uVar198 - iVar14) * lVar45;
                lVar186 = (lVar154 - iVar14) * lVar45;
                lVar114 = (lVar154 - iVar17) * lVar49;
                lVar115 = (int)(~uVar24 + iVar130) * lVar55;
                lVar127 = (int)((int)uVar198 - uVar24) * lVar55;
                lVar188 = (lVar154 + ~(long)iVar191) * lVar52;
                lVar137 = lVar173 + lVar124 + lVar188;
                pdVar161 = pdVar33 + ((lVar188 + lVar173 + lVar34 + lVar124 + -2) - lVar152);
                pdVar169 = pdVar33 + ((lVar34 * 2 + lVar137 + -2) - lVar152);
                pdVar174 = pdVar33 + ((lVar137 + -2) - lVar152);
                lVar188 = lVar124;
                iVar120 = (iVar187 + -1) - iVar8;
                iVar128 = (iVar187 + -1) - uVar28;
                iVar129 = (iVar187 - uVar28) + -2;
                do {
                  uVar29 = pEVar36[lVar166 + lVar156 + (lVar188 - lVar107)].flag;
                  dVar234 = 0.0;
                  if ((uVar29 >> 0x11 & 1) != 0) {
                    pdVar1 = pdVar43 + lVar108 + lVar193 + (lVar188 - iVar21);
                    dVar234 = *pdVar1;
                    dVar248 = pdVar1[lVar44];
                    iVar172 = (int)lVar188;
                    pdVar145 = pdVar33 + (iVar178 - iVar190) * lVar54 +
                                         (iVar130 - iVar191) * lVar52 + (long)(iVar172 - iVar8);
                    dVar201 = *pdVar145;
                    dVar208 = pdVar145[lVar34];
                    dVar220 = pdVar145[lVar34 * 2];
                    lVar137 = lVar188 + -1;
                    lVar140 = lVar137 - lVar143;
                    dVar3 = pdVar39[lVar109 + lVar149 + lVar140];
                    dVar246 = pdVar39[lVar109 + lVar149 + (int)(iVar172 - uVar28)];
                    lVar118 = -1;
                    cVar171 = '\x05';
                    lVar181 = 0;
                    do {
                      iVar105 = (int)lVar118;
                      lVar162 = -1;
                      cVar183 = cVar171;
                      do {
                        iVar97 = (int)lVar162;
                        iVar104 = (int)lVar181;
                        ppdVar141 = &local_398.u.p + (long)iVar104 * 3;
                        lVar181 = 0;
                        do {
                          iVar98 = (int)lVar181 + -1;
                          if (((iVar97 == 0 && iVar105 == 0) && iVar98 == 0) ||
                             ((1 << (cVar183 + (char)lVar181 & 0x1fU) & uVar29) == 0)) {
                            *ppdVar141 = (double *)0x0;
                            ppdVar141[1] = (double *)0x0;
                            ppdVar141[2] = (double *)0x0;
                          }
                          else {
                            pdVar145 = pdVar33 + ((iVar178 - iVar190) + iVar105) * lVar54 +
                                                 ((iVar130 - iVar191) + iVar97) * lVar52 +
                                                 (long)(iVar120 + (int)lVar181);
                            dVar199 = (pdVar145[lVar34] + (double)iVar97) - dVar208;
                            auVar203._8_4_ = SUB84(dVar199,0);
                            auVar203._0_8_ = (*pdVar145 + (double)iVar98) - dVar201;
                            auVar203._12_4_ = (int)((ulong)dVar199 >> 0x20);
                            *(undefined1 (*) [16])ppdVar141 = auVar203;
                            ppdVar141[2] = (double *)
                                           ((pdVar145[lVar34 * 2] + (double)iVar105) - dVar220);
                          }
                          lVar181 = lVar181 + 1;
                          ppdVar141 = ppdVar141 + 3;
                        } while (lVar181 != 3);
                        lVar162 = lVar162 + 1;
                        cVar183 = cVar183 + '\x03';
                        lVar181 = (long)iVar104 + 3;
                      } while (lVar162 != 2);
                      lVar118 = lVar118 + 1;
                      cVar171 = cVar171 + '\t';
                      lVar181 = (long)iVar104 + 3;
                    } while (lVar118 != 2);
                    lVar118 = -1;
                    cVar171 = '\x05';
                    lVar181 = 0;
                    do {
                      lVar162 = -1;
                      cVar183 = cVar171;
                      do {
                        iVar105 = (int)lVar181;
                        lVar181 = 0;
                        do {
                          dVar199 = 0.0;
                          if (((int)lVar181 != 1 || ((int)lVar162 != 0 || (int)lVar118 != 0)) &&
                             ((1 << (cVar183 + (char)lVar181 & 0x1fU) & uVar29) != 0)) {
                            dVar199 = pdVar39[(iVar122 + (int)lVar118) * lVar37 +
                                              (iVar131 + (int)lVar162) * lVar35 +
                                              (long)(iVar128 + (int)lVar181)] - dVar246;
                          }
                          adStack_108[iVar105 + lVar181] = dVar199;
                          lVar181 = lVar181 + 1;
                        } while (lVar181 != 3);
                        lVar162 = lVar162 + 1;
                        cVar183 = cVar183 + '\x03';
                        lVar181 = (long)iVar105 + 3;
                      } while (lVar162 != 2);
                      lVar118 = lVar118 + 1;
                      cVar171 = cVar171 + '\t';
                      lVar181 = (long)iVar105 + 3;
                    } while (lVar118 != 2);
                    dVar199 = dVar3;
                    if (dVar246 <= dVar3) {
                      dVar199 = dVar246;
                    }
                    dVar200 = 0.0;
                    dVar245 = 0.0;
                    dVar236 = 0.0;
                    pLVar119 = &local_398.u.kstride;
                    lVar118 = 0;
                    dVar242 = 0.0;
                    dVar212 = 0.0;
                    dVar238 = 0.0;
                    dVar243 = 0.0;
                    dVar233 = 0.0;
                    dVar235 = 0.0;
                    do {
                      pdVar145 = ((Array4<double> *)(pLVar119 + -2))->p;
                      dVar213 = (double)pLVar119[-1];
                      dVar244 = (double)*pLVar119;
                      dVar214 = adStack_108[lVar118];
                      dVar233 = dVar233 + dVar213 * (double)pLVar119[-1];
                      dVar235 = dVar235 + (double)pdVar145 * (double)*pLVar119;
                      dVar236 = dVar236 + dVar244 * dVar244;
                      dVar238 = dVar238 + dVar214 * (double)pdVar145;
                      dVar243 = dVar243 + (double)pdVar145 * (double)pdVar145;
                      dVar200 = dVar200 + dVar214 * dVar213;
                      dVar245 = dVar245 + dVar213 * (double)pdVar145;
                      dVar242 = dVar242 + dVar244 * (double)pLVar119[-1];
                      dVar212 = dVar212 + dVar214 * (double)*pLVar119;
                      lVar118 = lVar118 + 1;
                      pLVar119 = pLVar119 + 3;
                    } while (lVar118 != 0x1b);
                    dVar244 = dVar245 * dVar236 - dVar235 * dVar242;
                    dVar213 = dVar245 * dVar212 - dVar235 * dVar200;
                    dVar214 = dVar245 * dVar242 + dVar235 * -dVar233;
                    dVar222 = dVar236 * dVar233 - dVar242 * dVar242;
                    dVar236 = dVar236 * dVar200 - dVar242 * dVar212;
                    auVar205._0_8_ =
                         dVar235 * (dVar200 * dVar242 - dVar212 * dVar233) +
                         (dVar238 * dVar222 - dVar236 * dVar245);
                    auVar205._8_8_ = dVar235 * dVar213 + (dVar243 * dVar236 - dVar244 * dVar238);
                    dVar235 = dVar214 * dVar235 + (dVar222 * dVar243 - dVar244 * dVar245);
                    auVar221._8_8_ = dVar235;
                    auVar221._0_8_ = dVar235;
                    auVar203 = divpd(auVar205,auVar221);
                    dVar235 = (dVar214 * dVar238 +
                              ((dVar212 * dVar233 + -dVar200 * dVar242) * dVar243 -
                              dVar213 * dVar245)) / dVar235;
                    lVar118 = lVar188 - lVar153;
                    dVar200 = pdVar56[lVar176 + lVar157 + lVar118];
                    dVar245 = auVar203._0_8_;
                    dVar242 = auVar203._8_8_;
                    if ((dVar200 == 1.0) && (!NAN(dVar200))) {
                      if ((pdVar56[lVar157 + lVar176 + (lVar137 - lVar153)] == 1.0) &&
                         (((!NAN(pdVar56[lVar157 + lVar176 + (lVar137 - lVar153)]) &&
                           (pdVar56[lVar157 + lVar176 + lVar118 + 1] == 1.0)) &&
                          (!NAN(pdVar56[lVar157 + lVar176 + lVar118 + 1]))))) {
                        dVar212 = pdVar39[lVar139 + lVar167 + (lVar188 - lVar143)];
                        dVar245 = (pdVar39 + lVar139 + lVar167 + (lVar188 - lVar143))[1];
                        dVar238 = dVar212 - pdVar39[lVar139 + lVar167 + lVar140];
                        dVar212 = dVar245 - dVar212;
                        dVar238 = dVar238 + dVar238;
                        dVar212 = dVar212 + dVar212;
                        dVar233 = (dVar245 - pdVar39[lVar139 + lVar167 + lVar140]) * 0.5;
                        dVar245 = ABS(dVar238);
                        uVar215 = -(ulong)(0.0 < dVar233);
                        dVar233 = ABS(dVar233);
                        dVar236 = ABS(dVar212);
                        if (dVar245 <= dVar233) {
                          dVar233 = dVar245;
                        }
                        if (dVar233 <= dVar236) {
                          dVar236 = dVar233;
                        }
                        uVar216 = -(ulong)(0.0 < dVar238 * dVar212) & (ulong)dVar236;
                        dVar245 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                          uVar215 & uVar216);
                      }
                      if (((pdVar56[lVar176 + lVar158 + lVar118] == 1.0) &&
                          (!NAN(pdVar56[lVar176 + lVar158 + lVar118]))) &&
                         ((pdVar56[lVar176 + lVar159 + lVar118] == 1.0 &&
                          (!NAN(pdVar56[lVar176 + lVar159 + lVar118]))))) {
                        lVar181 = lVar188 - lVar143;
                        dVar242 = pdVar39[lVar167 + lVar139 + lVar181] -
                                  pdVar39[lVar167 + lVar113 + lVar181];
                        dVar212 = pdVar39[lVar167 + lVar168 + lVar181] -
                                  pdVar39[lVar167 + lVar139 + lVar181];
                        dVar242 = dVar242 + dVar242;
                        dVar212 = dVar212 + dVar212;
                        dVar236 = (pdVar39[lVar167 + lVar168 + lVar181] -
                                  pdVar39[lVar167 + lVar113 + lVar181]) * 0.5;
                        dVar238 = ABS(dVar242);
                        uVar215 = -(ulong)(0.0 < dVar236);
                        dVar236 = ABS(dVar236);
                        dVar233 = ABS(dVar212);
                        if (dVar238 <= dVar236) {
                          dVar236 = dVar238;
                        }
                        if (dVar236 <= dVar233) {
                          dVar233 = dVar236;
                        }
                        uVar216 = -(ulong)(0.0 < dVar242 * dVar212) & (ulong)dVar233;
                        dVar242 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                          uVar215 & uVar216);
                      }
                      if (((pdVar56[lVar157 + lVar118 + lVar177] == 1.0) &&
                          (!NAN(pdVar56[lVar157 + lVar118 + lVar177]))) &&
                         ((pdVar56[lVar157 + lVar118 + lVar179] == 1.0 &&
                          (!NAN(pdVar56[lVar157 + lVar118 + lVar179]))))) {
                        lVar181 = lVar188 - lVar143;
                        dVar212 = pdVar39[lVar139 + lVar181 + lVar167] -
                                  pdVar39[lVar139 + lVar181 + lVar111];
                        dVar233 = pdVar39[lVar139 + lVar181 + lVar112] -
                                  pdVar39[lVar139 + lVar181 + lVar167];
                        dVar212 = dVar212 + dVar212;
                        dVar233 = dVar233 + dVar233;
                        dVar236 = (pdVar39[lVar139 + lVar181 + lVar112] -
                                  pdVar39[lVar139 + lVar181 + lVar111]) * 0.5;
                        dVar238 = ABS(dVar212);
                        uVar215 = -(ulong)(0.0 < dVar236);
                        dVar236 = ABS(dVar236);
                        dVar235 = ABS(dVar233);
                        if (dVar238 <= dVar236) {
                          dVar236 = dVar238;
                        }
                        if (dVar236 <= dVar235) {
                          dVar235 = dVar236;
                        }
                        uVar216 = -(ulong)(0.0 < dVar212 * dVar233) & (ulong)dVar235;
                        dVar235 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                          uVar215 & uVar216);
                      }
                    }
                    dVar212 = dVar3;
                    if (dVar3 <= dVar246) {
                      dVar212 = dVar246;
                    }
                    iVar104 = 0;
                    iVar105 = 0;
                    iVar98 = 0;
                    iVar97 = 0;
                    uVar165 = 0xffffffff;
                    do {
                      uVar121 = uVar165 + 1;
                      uVar150 = 0xffffffff;
                      iVar99 = iVar104;
                      do {
                        uVar103 = uVar150 + 1;
                        iVar101 = 5;
                        do {
                          if (((uVar29 >> (iVar99 + iVar101 & 0x1fU) & 1) != 0) &&
                             ((iVar101 != 6 || uVar150 != 0) || uVar165 != 0)) {
                            iVar105 = iVar105 + (uint)((iVar101 - 5U & 0xfffffffd) == 0 &&
                                                      (uVar150 == 0 && uVar165 == 0));
                            iVar98 = iVar98 + (uint)((iVar101 == 6 && uVar165 == 0) &&
                                                    (uVar103 & 0xfffffffd) == 0);
                            iVar97 = iVar97 + (uint)((iVar101 == 6 && uVar150 == 0) &&
                                                    (uVar121 & 0xfffffffd) == 0);
                          }
                          iVar101 = iVar101 + 1;
                        } while (iVar101 != 8);
                        iVar99 = iVar99 + 3;
                        uVar150 = uVar103;
                      } while (uVar103 != 2);
                      iVar104 = iVar104 + 9;
                      uVar165 = uVar121;
                    } while (uVar121 != 2);
                    lVar181 = lVar188 - lVar152;
                    dVar233 = pdVar33[lVar110 + lVar144 + lVar181];
                    dVar236 = pdVar33[lVar110 + lVar144 + lVar181 + lVar34];
                    dVar238 = pdVar33[lVar110 + lVar144 + lVar181 + lVar34 * 2];
                    dVar243 = 2.0;
                    if ((uVar29 >> 0x15 & 1) != 0) {
                      lVar181 = -1;
                      cVar171 = '\b';
                      dVar244 = dVar246;
                      dVar243 = dVar246;
                      do {
                        iVar104 = 0;
                        bVar197 = true;
                        do {
                          bVar189 = bVar197;
                          lVar162 = 0;
                          do {
                            if (((int)lVar162 != 1 || (iVar104 != 0 || (int)lVar181 != 0)) &&
                               ((1 << ((char)lVar162 + (char)iVar104 * '\x03' + cVar171 & 0x1fU) &
                                uVar29) != 0)) {
                              dVar214 = pdVar39[(iVar122 + (int)lVar181) * lVar37 +
                                                (iVar131 + iVar104) * lVar35 +
                                                (long)(iVar128 + (int)lVar162)];
                              dVar213 = dVar214;
                              if (dVar214 <= dVar243) {
                                dVar213 = dVar243;
                              }
                              dVar243 = dVar213;
                              if (dVar214 < dVar244) {
                                dVar244 = dVar214;
                              }
                            }
                            lVar162 = lVar162 + 1;
                          } while (lVar162 != 3);
                          iVar104 = 1;
                          bVar197 = false;
                        } while (bVar189);
                        lVar181 = lVar181 + 1;
                        cVar171 = cVar171 + '\t';
                      } while (lVar181 != 2);
                      dVar214 = (((pdVar47 + lVar125 + lVar194 + (lVar188 - lVar106))[lVar48] -
                                 dVar238) * dVar235 +
                                (0.5 - dVar236) * dVar242 +
                                (pdVar47[lVar125 + lVar194 + (lVar188 - lVar106)] - dVar233) *
                                dVar245 + dVar246) - dVar246;
                      if (dVar214 <= 1e-13) {
                        dVar243 = 1.0;
                        if ((dVar214 < -1e-13) &&
                           (dVar243 = (dVar244 - dVar246) / dVar214, 1.0 <= dVar243)) {
                          dVar243 = 1.0;
                        }
                      }
                      else {
                        dVar243 = (dVar243 - dVar246) / dVar214;
                        if (1.0 <= dVar243) {
                          dVar243 = 1.0;
                        }
                      }
                      if (2.0 <= dVar243) {
                        dVar243 = 2.0;
                      }
                    }
                    dVar244 = dVar243;
                    if ((short)uVar29 < 0) {
                      lVar181 = -1;
                      cVar171 = '\x05';
                      dVar244 = dVar246;
                      dVar214 = dVar246;
                      do {
                        lVar162 = -1;
                        cVar183 = cVar171;
                        do {
                          lVar170 = 0;
                          do {
                            if (((int)lVar170 != 1 || ((int)lVar162 != 0 || (int)lVar181 != 0)) &&
                               ((1 << (cVar183 + (char)lVar170 & 0x1fU) & uVar29) != 0)) {
                              dVar213 = pdVar39[(iVar122 + (int)lVar181) * lVar37 +
                                                (iVar131 + (int)lVar162) * lVar35 +
                                                (long)(iVar128 + (int)lVar170)];
                              dVar222 = dVar213;
                              if (dVar213 <= dVar244) {
                                dVar222 = dVar244;
                              }
                              dVar244 = dVar222;
                              if (dVar213 < dVar214) {
                                dVar214 = dVar213;
                              }
                            }
                            lVar170 = lVar170 + 1;
                          } while (lVar170 != 3);
                          cVar183 = cVar183 + '\x03';
                          bVar197 = lVar162 != 0;
                          lVar162 = lVar162 + 1;
                        } while (bVar197);
                        lVar181 = lVar181 + 1;
                        cVar171 = cVar171 + '\t';
                      } while (lVar181 != 2);
                      dVar213 = (((pdVar47 + lVar125 + lVar186 + (lVar188 - lVar106))[lVar48] -
                                 dVar238) * dVar235 +
                                (((pdVar47[lVar125 + lVar186 + (lVar188 - lVar106)] - dVar233) *
                                  dVar245 + dVar246) - (dVar236 + 0.5) * dVar242)) - dVar246;
                      if (dVar213 <= 1e-13) {
                        dVar244 = 1.0;
                        if ((dVar213 < -1e-13) &&
                           (dVar244 = (dVar214 - dVar246) / dVar213, 1.0 <= dVar244)) {
                          dVar244 = 1.0;
                        }
                      }
                      else {
                        dVar244 = (dVar244 - dVar246) / dVar213;
                        if (1.0 <= dVar244) {
                          dVar244 = 1.0;
                        }
                      }
                      if (dVar243 <= dVar244) {
                        dVar244 = dVar243;
                      }
                    }
                    dVar243 = dVar244;
                    if ((uVar29 >> 0x13 & 1) != 0) {
                      lVar181 = -1;
                      dVar214 = dVar246;
                      dVar243 = dVar246;
                      do {
                        lVar162 = -1;
                        do {
                          iVar104 = 0;
                          bVar197 = true;
                          do {
                            bVar189 = bVar197;
                            if ((((int)lVar162 != 0 || (int)lVar181 != 0) || iVar104 != 0) &&
                               ((1 << ((char)lVar162 * '\x03' + (char)lVar181 * '\t' + '\x12' +
                                       (char)iVar104 & 0x1fU) & uVar29) != 0)) {
                              dVar213 = pdVar39[(iVar122 + (int)lVar181) * lVar37 +
                                                (iVar131 + (int)lVar162) * lVar35 +
                                                (long)(int)(iVar104 + (iVar172 - uVar28))];
                              dVar222 = dVar213;
                              if (dVar213 <= dVar243) {
                                dVar222 = dVar243;
                              }
                              dVar243 = dVar222;
                              if (dVar213 < dVar214) {
                                dVar214 = dVar213;
                              }
                            }
                            iVar104 = 1;
                            bVar197 = false;
                          } while (bVar189);
                          lVar162 = lVar162 + 1;
                        } while (lVar162 != 2);
                        lVar181 = lVar181 + 1;
                      } while (lVar181 != 2);
                      dVar213 = (((pdVar43 + lVar108 + lVar193 + ((iVar172 - iVar21) + 1))[lVar44] -
                                 dVar238) * dVar235 +
                                (pdVar43[lVar108 + lVar193 + ((iVar172 - iVar21) + 1)] - dVar236) *
                                dVar242 + (0.5 - dVar233) * dVar245 + dVar246) - dVar246;
                      if (dVar213 <= 1e-13) {
                        dVar243 = 1.0;
                        if ((dVar213 < -1e-13) &&
                           (dVar243 = (dVar214 - dVar246) / dVar213, 1.0 <= dVar243)) {
                          dVar243 = 1.0;
                        }
                      }
                      else {
                        dVar243 = (dVar243 - dVar246) / dVar213;
                        if (1.0 <= dVar243) {
                          dVar243 = 1.0;
                        }
                      }
                      if (dVar244 <= dVar243) {
                        dVar243 = dVar244;
                      }
                    }
                    lVar181 = -1;
                    cVar171 = '\x05';
                    dVar244 = dVar246;
                    dVar214 = dVar246;
                    do {
                      lVar162 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar170 = 0;
                        do {
                          if (((int)lVar170 != 1 || ((int)lVar162 != 0 || (int)lVar181 != 0)) &&
                             ((1 << (cVar183 + (char)lVar170 & 0x1fU) & uVar29) != 0)) {
                            dVar213 = pdVar39[(iVar122 + (int)lVar181) * lVar37 +
                                              (iVar131 + (int)lVar162) * lVar35 +
                                              (long)(iVar128 + (int)lVar170)];
                            dVar222 = dVar213;
                            if (dVar213 <= dVar244) {
                              dVar222 = dVar244;
                            }
                            dVar244 = dVar222;
                            if (dVar213 < dVar214) {
                              dVar214 = dVar213;
                            }
                          }
                          lVar170 = lVar170 + 1;
                        } while (lVar170 != 2);
                        lVar162 = lVar162 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar162 != 2);
                      lVar181 = lVar181 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar181 != 2);
                    dVar213 = ((dVar248 - dVar238) * dVar235 +
                              (dVar234 - dVar236) * dVar242 + (dVar246 - (dVar233 + 0.5) * dVar245))
                              - dVar246;
                    if (dVar213 <= 1e-13) {
                      dVar244 = 1.0;
                      if ((dVar213 < -1e-13) &&
                         (dVar244 = (dVar214 - dVar246) / dVar213, 1.0 <= dVar244)) {
                        dVar244 = 1.0;
                      }
                    }
                    else {
                      dVar244 = (dVar244 - dVar246) / dVar213;
                      if (1.0 <= dVar244) {
                        dVar244 = 1.0;
                      }
                    }
                    if (dVar243 <= dVar244) {
                      dVar244 = dVar243;
                    }
                    dVar243 = dVar244;
                    if ((uVar29 >> 0x1b & 1) != 0) {
                      iVar104 = 0;
                      dVar243 = dVar246;
                      bVar197 = true;
                      dVar214 = dVar246;
                      do {
                        bVar189 = bVar197;
                        iVar99 = iVar104 * 9 + 0xe;
                        lVar181 = -1;
                        do {
                          lVar162 = 0;
                          do {
                            if (((int)lVar162 != 1 || ((int)lVar181 != 0 || iVar104 != 0)) &&
                               ((1 << ((char)iVar99 + (char)lVar162 & 0x1fU) & uVar29) != 0)) {
                              dVar213 = pdVar39[(iVar122 + iVar104) * lVar37 +
                                                (iVar131 + (int)lVar181) * lVar35 +
                                                (long)(iVar128 + (int)lVar162)];
                              dVar222 = dVar213;
                              if (dVar213 <= dVar243) {
                                dVar222 = dVar243;
                              }
                              dVar243 = dVar222;
                              if (dVar213 < dVar214) {
                                dVar214 = dVar213;
                              }
                            }
                            lVar162 = lVar162 + 1;
                          } while (lVar162 != 3);
                          lVar181 = lVar181 + 1;
                          iVar99 = iVar99 + 3;
                        } while (lVar181 != 2);
                        iVar104 = 1;
                        bVar197 = false;
                      } while (bVar189);
                      dVar213 = ((0.5 - dVar238) * dVar235 +
                                ((pdVar53 + lVar126 + lVar114 + (lVar188 - lVar133))[lVar51] -
                                dVar236) * dVar242 +
                                (pdVar53[lVar126 + lVar114 + (lVar188 - lVar133)] - dVar233) *
                                dVar245 + dVar246) - dVar246;
                      if (dVar213 <= 1e-13) {
                        dVar243 = 1.0;
                        if ((dVar213 < -1e-13) &&
                           (dVar243 = (dVar214 - dVar246) / dVar213, 1.0 <= dVar243)) {
                          dVar243 = 1.0;
                        }
                      }
                      else {
                        dVar243 = (dVar243 - dVar246) / dVar213;
                        if (1.0 <= dVar243) {
                          dVar243 = 1.0;
                        }
                      }
                      if (dVar244 <= dVar243) {
                        dVar243 = dVar244;
                      }
                    }
                    dVar244 = dVar243;
                    if ((uVar29 >> 9 & 1) != 0) {
                      cVar171 = '\x05';
                      lVar181 = -1;
                      dVar244 = dVar246;
                      dVar214 = dVar246;
                      do {
                        lVar162 = -1;
                        cVar183 = cVar171;
                        do {
                          lVar170 = 0;
                          do {
                            if (((int)lVar170 != 1 || ((int)lVar162 != 0 || (int)lVar181 != 0)) &&
                               ((1 << (cVar183 + (char)lVar170 & 0x1fU) & uVar29) != 0)) {
                              dVar213 = pdVar39[(iVar122 + (int)lVar181) * lVar37 +
                                                (iVar131 + (int)lVar162) * lVar35 +
                                                (long)(iVar128 + (int)lVar170)];
                              dVar222 = dVar213;
                              if (dVar213 <= dVar244) {
                                dVar222 = dVar244;
                              }
                              dVar244 = dVar222;
                              if (dVar213 < dVar214) {
                                dVar214 = dVar213;
                              }
                            }
                            lVar170 = lVar170 + 1;
                          } while (lVar170 != 3);
                          lVar162 = lVar162 + 1;
                          cVar183 = cVar183 + '\x03';
                        } while (lVar162 != 2);
                        cVar171 = cVar171 + '\t';
                        bVar197 = lVar181 != 0;
                        lVar181 = lVar181 + 1;
                      } while (bVar197);
                      dVar233 = ((((pdVar53 + lVar136 + lVar114 + (lVar188 - lVar133))[lVar51] -
                                  dVar236) * dVar242 +
                                 (pdVar53[lVar136 + lVar114 + (lVar188 - lVar133)] - dVar233) *
                                 dVar245 + dVar246) - (dVar238 + 0.5) * dVar235) - dVar246;
                      if (dVar233 <= 1e-13) {
                        dVar244 = 1.0;
                        if ((dVar233 < -1e-13) &&
                           (dVar244 = (dVar214 - dVar246) / dVar233, 1.0 <= dVar244)) {
                          dVar244 = 1.0;
                        }
                      }
                      else {
                        dVar244 = (dVar244 - dVar246) / dVar233;
                        if (1.0 <= dVar244) {
                          dVar244 = 1.0;
                        }
                      }
                      if (dVar243 <= dVar244) {
                        dVar244 = dVar243;
                      }
                    }
                    dVar233 = 0.0;
                    if (1 < iVar105) {
                      dVar233 = dVar244;
                    }
                    uVar230 = 0;
                    uVar232 = 0;
                    if (1 < iVar98) {
                      uVar230 = SUB84(dVar244,0);
                      uVar232 = (undefined4)((ulong)dVar244 >> 0x20);
                    }
                    dVar236 = 0.0;
                    if (1 < iVar97) {
                      dVar236 = dVar244;
                    }
                    if ((dVar200 == 1.0) && (!NAN(dVar200))) {
                      if ((pdVar56[lVar157 + lVar176 + (lVar137 - lVar153)] == 1.0) &&
                         (((!NAN(pdVar56[lVar157 + lVar176 + (lVar137 - lVar153)]) &&
                           (pdVar56[lVar157 + lVar176 + ((iVar172 - iVar16) + 1)] == 1.0)) &&
                          (!NAN(pdVar56[lVar157 + lVar176 + ((iVar172 - iVar16) + 1)]))))) {
                        dVar233 = 1.0;
                      }
                      if (((pdVar56[lVar176 + lVar115 + lVar118] == 1.0) &&
                          (!NAN(pdVar56[lVar176 + lVar115 + lVar118]))) &&
                         ((pdVar56[lVar176 + lVar127 + lVar118] == 1.0 &&
                          (!NAN(pdVar56[lVar176 + lVar127 + lVar118]))))) {
                        uVar230 = 0;
                        uVar232 = 0x3ff00000;
                      }
                      if (((pdVar56[lVar157 + lVar118 + lVar155] == 1.0) &&
                          (!NAN(pdVar56[lVar157 + lVar118 + lVar155]))) &&
                         ((pdVar56[lVar157 + lVar118 + lVar160] == 1.0 &&
                          (!NAN(pdVar56[lVar157 + lVar118 + lVar160]))))) {
                        dVar236 = 1.0;
                      }
                    }
                    dVar246 = (dVar246 - (dVar201 + 0.5) * dVar245 * dVar233) +
                              (dVar234 - dVar208) * dVar242 * (double)CONCAT44(uVar232,uVar230) +
                              (dVar248 - dVar220) * dVar235 * dVar236;
                    lVar181 = lVar137 - lVar152;
                    dVar201 = pdVar33[lVar110 + lVar144 + lVar181];
                    dVar208 = pdVar33[lVar110 + lVar144 + lVar181 + lVar34];
                    dVar220 = pdVar33[lVar110 + lVar144 + lVar181 + lVar34 * 2];
                    uVar29 = pEVar36[lVar166 + lVar156 + (lVar137 - lVar107)].flag;
                    lVar181 = -1;
                    cVar171 = '\x05';
                    lVar162 = 0;
                    pdVar145 = pdVar174;
                    pdVar163 = pdVar169;
                    pdVar195 = pdVar161;
                    do {
                      lVar170 = -1;
                      pdVar146 = pdVar145;
                      pdVar164 = pdVar163;
                      pdVar196 = pdVar195;
                      cVar183 = cVar171;
                      do {
                        iVar105 = (int)lVar162;
                        ppdVar141 = &local_398.u.p + (long)iVar105 * 3;
                        lVar162 = 0;
                        do {
                          iVar104 = (int)lVar162 + -1;
                          if ((((int)lVar170 == 0 && (int)lVar181 == 0) && iVar104 == 0) ||
                             ((1 << (cVar183 + (char)lVar162 & 0x1fU) & uVar29) == 0)) {
                            *ppdVar141 = (double *)0x0;
                            ppdVar141[1] = (double *)0x0;
                            ppdVar141[2] = (double *)0x0;
                          }
                          else {
                            dVar245 = pdVar196[lVar162];
                            *ppdVar141 = (double *)((pdVar146[lVar162] + (double)iVar104) - dVar201)
                            ;
                            ppdVar141[1] = (double *)((dVar245 + (double)(int)lVar170) - dVar208);
                            ppdVar141[2] = (double *)
                                           ((pdVar164[lVar162] + (double)(int)lVar181) - dVar220);
                          }
                          lVar162 = lVar162 + 1;
                          ppdVar141 = ppdVar141 + 3;
                        } while (lVar162 != 3);
                        lVar170 = lVar170 + 1;
                        pdVar164 = pdVar164 + lVar52;
                        pdVar196 = pdVar196 + lVar52;
                        pdVar146 = pdVar146 + lVar52;
                        cVar183 = cVar183 + '\x03';
                        lVar162 = (long)iVar105 + 3;
                      } while (lVar170 != 2);
                      lVar181 = lVar181 + 1;
                      pdVar163 = pdVar163 + lVar54;
                      pdVar195 = pdVar195 + lVar54;
                      pdVar145 = pdVar145 + lVar54;
                      cVar171 = cVar171 + '\t';
                      lVar162 = (long)iVar105 + 3;
                    } while (lVar181 != 2);
                    dVar245 = dVar212;
                    if (dVar246 <= dVar212) {
                      dVar245 = dVar246;
                    }
                    iVar105 = (int)lVar137 - uVar28;
                    lVar181 = (long)iVar105;
                    lVar162 = -1;
                    cVar171 = '\x05';
                    lVar170 = 0;
                    do {
                      lVar182 = -1;
                      cVar183 = cVar171;
                      do {
                        iVar104 = (int)lVar170;
                        lVar170 = 0;
                        do {
                          dVar246 = 0.0;
                          if (((int)lVar170 != 1 || ((int)lVar182 != 0 || (int)lVar162 != 0)) &&
                             ((1 << (cVar183 + (char)lVar170 & 0x1fU) & uVar29) != 0)) {
                            dVar246 = pdVar39[(iVar122 + (int)lVar162) * lVar37 +
                                              (iVar131 + (int)lVar182) * lVar35 +
                                              (long)(iVar129 + (int)lVar170)] -
                                      pdVar39[lVar109 + lVar149 + lVar181];
                          }
                          adStack_108[iVar104 + lVar170] = dVar246;
                          lVar170 = lVar170 + 1;
                        } while (lVar170 != 3);
                        lVar182 = lVar182 + 1;
                        cVar183 = cVar183 + '\x03';
                        lVar170 = (long)iVar104 + 3;
                      } while (lVar182 != 2);
                      lVar162 = lVar162 + 1;
                      cVar171 = cVar171 + '\t';
                      lVar170 = (long)iVar104 + 3;
                    } while (lVar162 != 2);
                    dVar233 = 0.0;
                    dVar235 = 0.0;
                    dVar236 = 0.0;
                    pLVar119 = &local_398.u.kstride;
                    lVar162 = 0;
                    dVar246 = 0.0;
                    dVar242 = 0.0;
                    dVar244 = 0.0;
                    dVar214 = 0.0;
                    dVar238 = 0.0;
                    dVar243 = 0.0;
                    do {
                      pdVar145 = ((Array4<double> *)(pLVar119 + -2))->p;
                      dVar225 = (double)pLVar119[-1];
                      dVar213 = (double)*pLVar119;
                      dVar222 = adStack_108[lVar162];
                      dVar238 = dVar238 + dVar225 * (double)pLVar119[-1];
                      dVar243 = dVar243 + (double)pdVar145 * (double)*pLVar119;
                      dVar236 = dVar236 + dVar213 * dVar213;
                      dVar244 = dVar244 + dVar222 * (double)pdVar145;
                      dVar214 = dVar214 + (double)pdVar145 * (double)pdVar145;
                      dVar233 = dVar233 + dVar222 * dVar225;
                      dVar235 = dVar235 + dVar225 * (double)pdVar145;
                      dVar246 = dVar246 + dVar213 * (double)pLVar119[-1];
                      dVar242 = dVar242 + dVar222 * (double)*pLVar119;
                      lVar162 = lVar162 + 1;
                      pLVar119 = pLVar119 + 3;
                    } while (lVar162 != 0x1b);
                    dVar228 = dVar235 * dVar236 - dVar243 * dVar246;
                    dVar213 = dVar235 * dVar242 - dVar243 * dVar233;
                    dVar225 = dVar235 * dVar246 + dVar243 * -dVar238;
                    dVar222 = dVar236 * dVar238 - dVar246 * dVar246;
                    dVar236 = dVar236 * dVar233 - dVar246 * dVar242;
                    auVar218._0_8_ =
                         dVar243 * (dVar233 * dVar246 - dVar242 * dVar238) +
                         (dVar244 * dVar222 - dVar236 * dVar235);
                    auVar218._8_8_ = dVar243 * dVar213 + (dVar214 * dVar236 - dVar228 * dVar244);
                    dVar236 = dVar225 * dVar243 + (dVar222 * dVar214 - dVar228 * dVar235);
                    auVar209._8_8_ = dVar236;
                    auVar209._0_8_ = dVar236;
                    auVar203 = divpd(auVar218,auVar209);
                    dVar236 = (dVar225 * dVar244 +
                              ((dVar242 * dVar238 + -dVar233 * dVar246) * dVar214 -
                              dVar213 * dVar235)) / dVar236;
                    lVar162 = lVar137 - lVar153;
                    dVar246 = pdVar56[lVar176 + lVar157 + lVar162];
                    dVar242 = auVar203._0_8_;
                    dVar233 = auVar203._8_8_;
                    if ((dVar246 == 1.0) && (!NAN(dVar246))) {
                      if ((pdVar56[lVar157 + lVar176 + ((lVar188 + -2) - lVar153)] == 1.0) &&
                         (((!NAN(pdVar56[lVar157 + lVar176 + ((lVar188 + -2) - lVar153)]) &&
                           (dVar200 == 1.0)) && (!NAN(dVar200))))) {
                        dVar200 = pdVar39[lVar139 + lVar167 + lVar140];
                        dVar242 = (pdVar39 + lVar139 + lVar167 + lVar140)[1];
                        dVar243 = dVar200 - pdVar39[lVar139 + lVar167 + ((lVar188 + -2) - lVar143)];
                        dVar200 = dVar242 - dVar200;
                        dVar243 = dVar243 + dVar243;
                        dVar200 = dVar200 + dVar200;
                        dVar242 = (dVar242 - pdVar39[lVar139 + lVar167 + ((lVar188 + -2) - lVar143)]
                                  ) * 0.5;
                        dVar238 = ABS(dVar243);
                        uVar215 = -(ulong)(0.0 < dVar242);
                        dVar242 = ABS(dVar242);
                        dVar235 = ABS(dVar200);
                        if (dVar238 <= dVar242) {
                          dVar242 = dVar238;
                        }
                        if (dVar242 <= dVar235) {
                          dVar235 = dVar242;
                        }
                        uVar216 = -(ulong)(0.0 < dVar243 * dVar200) & (ulong)dVar235;
                        dVar242 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                          uVar215 & uVar216);
                      }
                      if (((pdVar56[lVar176 + lVar158 + lVar162] == 1.0) &&
                          (!NAN(pdVar56[lVar176 + lVar158 + lVar162]))) &&
                         ((pdVar56[lVar176 + lVar159 + lVar162] == 1.0 &&
                          (!NAN(pdVar56[lVar176 + lVar159 + lVar162]))))) {
                        dVar238 = pdVar39[lVar167 + lVar139 + lVar140] -
                                  pdVar39[lVar167 + lVar113 + lVar140];
                        dVar243 = pdVar39[lVar167 + lVar168 + lVar140] -
                                  pdVar39[lVar167 + lVar139 + lVar140];
                        dVar238 = dVar238 + dVar238;
                        dVar243 = dVar243 + dVar243;
                        dVar233 = (pdVar39[lVar167 + lVar168 + lVar140] -
                                  pdVar39[lVar167 + lVar113 + lVar140]) * 0.5;
                        dVar235 = ABS(dVar238);
                        uVar215 = -(ulong)(0.0 < dVar233);
                        dVar233 = ABS(dVar233);
                        dVar200 = ABS(dVar243);
                        if (dVar235 <= dVar233) {
                          dVar233 = dVar235;
                        }
                        if (dVar233 <= dVar200) {
                          dVar200 = dVar233;
                        }
                        uVar216 = -(ulong)(0.0 < dVar238 * dVar243) & (ulong)dVar200;
                        dVar233 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                          uVar215 & uVar216);
                      }
                      if (((pdVar56[lVar157 + lVar162 + lVar177] == 1.0) &&
                          (!NAN(pdVar56[lVar157 + lVar162 + lVar177]))) &&
                         ((pdVar56[lVar157 + lVar162 + lVar179] == 1.0 &&
                          (!NAN(pdVar56[lVar157 + lVar162 + lVar179]))))) {
                        dVar238 = pdVar39[lVar139 + lVar140 + lVar167] -
                                  pdVar39[lVar139 + lVar140 + lVar111];
                        dVar243 = pdVar39[lVar139 + lVar140 + lVar112] -
                                  pdVar39[lVar139 + lVar140 + lVar167];
                        dVar238 = dVar238 + dVar238;
                        dVar243 = dVar243 + dVar243;
                        dVar200 = (pdVar39[lVar139 + lVar140 + lVar112] -
                                  pdVar39[lVar139 + lVar140 + lVar111]) * 0.5;
                        dVar236 = ABS(dVar238);
                        uVar215 = -(ulong)(0.0 < dVar200);
                        dVar200 = ABS(dVar200);
                        dVar235 = ABS(dVar243);
                        if (dVar236 <= dVar200) {
                          dVar200 = dVar236;
                        }
                        if (dVar200 <= dVar235) {
                          dVar235 = dVar200;
                        }
                        uVar216 = -(ulong)(0.0 < dVar238 * dVar243) & (ulong)dVar235;
                        dVar236 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                          uVar215 & uVar216);
                      }
                    }
                    dVar200 = dVar199;
                    if (dVar199 <= dVar245) {
                      dVar200 = dVar245;
                    }
                    iVar97 = 0;
                    iVar104 = 0;
                    iVar99 = 0;
                    iVar98 = 0;
                    uVar165 = 0xffffffff;
                    do {
                      uVar121 = uVar165 + 1;
                      iVar101 = iVar97;
                      uVar150 = 0xffffffff;
                      do {
                        uVar103 = uVar150 + 1;
                        iVar132 = 5;
                        do {
                          if (((uVar29 >> (iVar101 + iVar132 & 0x1fU) & 1) != 0) &&
                             ((iVar132 != 6 || uVar150 != 0) || uVar165 != 0)) {
                            iVar104 = iVar104 + (uint)((iVar132 - 5U & 0xfffffffd) == 0 &&
                                                      (uVar150 == 0 && uVar165 == 0));
                            iVar99 = iVar99 + (uint)((iVar132 == 6 && uVar165 == 0) &&
                                                    (uVar103 & 0xfffffffd) == 0);
                            iVar98 = iVar98 + (uint)((iVar132 == 6 && uVar150 == 0) &&
                                                    (uVar121 & 0xfffffffd) == 0);
                          }
                          iVar132 = iVar132 + 1;
                        } while (iVar132 != 8);
                        iVar101 = iVar101 + 3;
                        uVar150 = uVar103;
                      } while (uVar103 != 2);
                      iVar97 = iVar97 + 9;
                      uVar165 = uVar121;
                    } while (uVar121 != 2);
                    dVar245 = 2.0;
                    if ((uVar29 >> 0x15 & 1) != 0) {
                      dVar235 = pdVar39[lVar109 + lVar149 + lVar181];
                      lVar140 = -1;
                      cVar171 = '\b';
                      dVar238 = dVar235;
                      dVar245 = dVar235;
                      do {
                        iVar97 = 0;
                        bVar197 = true;
                        do {
                          bVar189 = bVar197;
                          lVar170 = 0;
                          dVar243 = dVar245;
                          do {
                            dVar245 = dVar243;
                            if (((int)lVar170 != 1 || (iVar97 != 0 || (int)lVar140 != 0)) &&
                               ((1 << ((char)lVar170 + (char)iVar97 * '\x03' + cVar171 & 0x1fU) &
                                uVar29) != 0)) {
                              dVar244 = pdVar39[(iVar122 + (int)lVar140) * lVar37 +
                                                (iVar131 + iVar97) * lVar35 +
                                                (long)(iVar129 + (int)lVar170)];
                              dVar245 = dVar244;
                              if (dVar244 <= dVar243) {
                                dVar245 = dVar243;
                              }
                              if (dVar244 < dVar238) {
                                dVar238 = dVar244;
                              }
                            }
                            lVar170 = lVar170 + 1;
                            dVar243 = dVar245;
                          } while (lVar170 != 3);
                          iVar97 = 1;
                          bVar197 = false;
                        } while (bVar189);
                        lVar140 = lVar140 + 1;
                        cVar171 = cVar171 + '\t';
                      } while (lVar140 != 2);
                      dVar243 = (((pdVar47 + lVar125 + lVar194 + (lVar137 - lVar106))[lVar48] -
                                 dVar220) * dVar236 +
                                (0.5 - dVar208) * dVar233 +
                                (pdVar47[lVar125 + lVar194 + (lVar137 - lVar106)] - dVar201) *
                                dVar242 + dVar235) - dVar235;
                      if (dVar243 <= 1e-13) {
                        dVar245 = 1.0;
                        if ((dVar243 < -1e-13) &&
                           (dVar245 = (dVar238 - dVar235) / dVar243, 1.0 <= dVar245)) {
                          dVar245 = 1.0;
                        }
                      }
                      else {
                        dVar245 = (dVar245 - dVar235) / dVar243;
                        if (1.0 <= dVar245) {
                          dVar245 = 1.0;
                        }
                      }
                      if (2.0 <= dVar245) {
                        dVar245 = 2.0;
                      }
                    }
                    dVar235 = dVar245;
                    if ((short)uVar29 < 0) {
                      dVar238 = pdVar39[lVar109 + lVar149 + lVar181];
                      lVar140 = -1;
                      cVar171 = '\x05';
                      dVar243 = dVar238;
                      dVar235 = dVar238;
                      do {
                        lVar170 = -1;
                        cVar183 = cVar171;
                        do {
                          lVar182 = 0;
                          do {
                            if (((int)lVar182 != 1 || ((int)lVar170 != 0 || (int)lVar140 != 0)) &&
                               ((1 << (cVar183 + (char)lVar182 & 0x1fU) & uVar29) != 0)) {
                              dVar244 = pdVar39[(iVar122 + (int)lVar140) * lVar37 +
                                                (iVar131 + (int)lVar170) * lVar35 +
                                                (long)(iVar129 + (int)lVar182)];
                              dVar214 = dVar244;
                              if (dVar244 <= dVar235) {
                                dVar214 = dVar235;
                              }
                              dVar235 = dVar214;
                              if (dVar244 < dVar243) {
                                dVar243 = dVar244;
                              }
                            }
                            lVar182 = lVar182 + 1;
                          } while (lVar182 != 3);
                          cVar183 = cVar183 + '\x03';
                          bVar197 = lVar170 != 0;
                          lVar170 = lVar170 + 1;
                        } while (bVar197);
                        lVar140 = lVar140 + 1;
                        cVar171 = cVar171 + '\t';
                      } while (lVar140 != 2);
                      dVar244 = (((pdVar47 + lVar125 + lVar186 + (lVar137 - lVar106))[lVar48] -
                                 dVar220) * dVar236 +
                                (((pdVar47[lVar125 + lVar186 + (lVar137 - lVar106)] - dVar201) *
                                  dVar242 + dVar238) - (dVar208 + 0.5) * dVar233)) - dVar238;
                      if (dVar244 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar244 < -1e-13) &&
                           (dVar235 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar238) / dVar244;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar245 <= dVar235) {
                        dVar235 = dVar245;
                      }
                    }
                    dVar245 = dVar235;
                    if ((uVar29 >> 0x13 & 1) != 0) {
                      dVar238 = pdVar39[lVar109 + lVar149 + lVar181];
                      lVar140 = -1;
                      dVar243 = dVar238;
                      dVar245 = dVar238;
                      do {
                        lVar170 = -1;
                        do {
                          iVar97 = 0;
                          bVar197 = true;
                          do {
                            bVar189 = bVar197;
                            if ((((int)lVar170 != 0 || (int)lVar140 != 0) || iVar97 != 0) &&
                               ((1 << ((char)lVar170 * '\x03' + (char)lVar140 * '\t' + '\x12' +
                                       (char)iVar97 & 0x1fU) & uVar29) != 0)) {
                              dVar244 = pdVar39[(iVar122 + (int)lVar140) * lVar37 +
                                                (iVar131 + (int)lVar170) * lVar35 +
                                                (long)(iVar97 + iVar105)];
                              dVar214 = dVar244;
                              if (dVar244 <= dVar245) {
                                dVar214 = dVar245;
                              }
                              dVar245 = dVar214;
                              if (dVar244 < dVar243) {
                                dVar243 = dVar244;
                              }
                            }
                            iVar97 = 1;
                            bVar197 = false;
                          } while (bVar189);
                          lVar170 = lVar170 + 1;
                        } while (lVar170 != 2);
                        lVar140 = lVar140 + 1;
                      } while (lVar140 != 2);
                      dVar244 = ((pdVar1[lVar44] - dVar220) * dVar236 +
                                (*pdVar1 - dVar208) * dVar233 + (0.5 - dVar201) * dVar242 + dVar238)
                                - dVar238;
                      if (dVar244 <= 1e-13) {
                        dVar245 = 1.0;
                        if ((dVar244 < -1e-13) &&
                           (dVar245 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar245)) {
                          dVar245 = 1.0;
                        }
                      }
                      else {
                        dVar245 = (dVar245 - dVar238) / dVar244;
                        if (1.0 <= dVar245) {
                          dVar245 = 1.0;
                        }
                      }
                      if (dVar235 <= dVar245) {
                        dVar245 = dVar235;
                      }
                    }
                    dVar235 = dVar245;
                    if ((uVar29 >> 0x11 & 1) != 0) {
                      dVar238 = pdVar39[lVar109 + lVar149 + lVar181];
                      lVar140 = -1;
                      cVar171 = '\x05';
                      dVar243 = dVar238;
                      dVar235 = dVar238;
                      do {
                        lVar170 = -1;
                        cVar183 = cVar171;
                        do {
                          lVar182 = 0;
                          do {
                            if (((int)lVar182 != 1 || ((int)lVar170 != 0 || (int)lVar140 != 0)) &&
                               ((1 << (cVar183 + (char)lVar182 & 0x1fU) & uVar29) != 0)) {
                              dVar244 = pdVar39[(iVar122 + (int)lVar140) * lVar37 +
                                                (iVar131 + (int)lVar170) * lVar35 +
                                                (long)(iVar129 + (int)lVar182)];
                              dVar214 = dVar244;
                              if (dVar244 <= dVar235) {
                                dVar214 = dVar235;
                              }
                              dVar235 = dVar214;
                              if (dVar244 < dVar243) {
                                dVar243 = dVar244;
                              }
                            }
                            lVar182 = lVar182 + 1;
                          } while (lVar182 != 2);
                          lVar170 = lVar170 + 1;
                          cVar183 = cVar183 + '\x03';
                        } while (lVar170 != 2);
                        lVar140 = lVar140 + 1;
                        cVar171 = cVar171 + '\t';
                      } while (lVar140 != 2);
                      dVar244 = (((pdVar43 + lVar108 + lVar193 + (lVar137 - iVar21))[lVar44] -
                                 dVar220) * dVar236 +
                                (pdVar43[lVar108 + lVar193 + (lVar137 - iVar21)] - dVar208) *
                                dVar233 + (dVar238 - (dVar201 + 0.5) * dVar242)) - dVar238;
                      if (dVar244 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar244 < -1e-13) &&
                           (dVar235 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar238) / dVar244;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar245 <= dVar235) {
                        dVar235 = dVar245;
                      }
                    }
                    dVar245 = dVar235;
                    if ((uVar29 >> 0x1b & 1) != 0) {
                      dVar238 = pdVar39[lVar109 + lVar149 + lVar181];
                      iVar105 = 0;
                      dVar243 = dVar238;
                      dVar245 = dVar238;
                      bVar197 = true;
                      do {
                        bVar189 = bVar197;
                        iVar97 = iVar105 * 9 + 0xe;
                        lVar140 = -1;
                        do {
                          lVar170 = 0;
                          do {
                            if (((int)lVar170 != 1 || ((int)lVar140 != 0 || iVar105 != 0)) &&
                               ((1 << ((char)iVar97 + (char)lVar170 & 0x1fU) & uVar29) != 0)) {
                              dVar244 = pdVar39[(iVar122 + iVar105) * lVar37 +
                                                (iVar131 + (int)lVar140) * lVar35 +
                                                (long)(iVar129 + (int)lVar170)];
                              dVar214 = dVar244;
                              if (dVar244 <= dVar245) {
                                dVar214 = dVar245;
                              }
                              dVar245 = dVar214;
                              if (dVar244 < dVar243) {
                                dVar243 = dVar244;
                              }
                            }
                            lVar170 = lVar170 + 1;
                          } while (lVar170 != 3);
                          lVar140 = lVar140 + 1;
                          iVar97 = iVar97 + 3;
                        } while (lVar140 != 2);
                        iVar105 = 1;
                        bVar197 = false;
                      } while (bVar189);
                      dVar244 = ((0.5 - dVar220) * dVar236 +
                                ((pdVar53 + lVar126 + lVar114 + (lVar137 - lVar133))[lVar51] -
                                dVar208) * dVar233 +
                                (pdVar53[lVar126 + lVar114 + (lVar137 - lVar133)] - dVar201) *
                                dVar242 + dVar238) - dVar238;
                      if (dVar244 <= 1e-13) {
                        dVar245 = 1.0;
                        if ((dVar244 < -1e-13) &&
                           (dVar245 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar245)) {
                          dVar245 = 1.0;
                        }
                      }
                      else {
                        dVar245 = (dVar245 - dVar238) / dVar244;
                        if (1.0 <= dVar245) {
                          dVar245 = 1.0;
                        }
                      }
                      if (dVar235 <= dVar245) {
                        dVar245 = dVar235;
                      }
                    }
                    dVar235 = dVar245;
                    if ((uVar29 >> 9 & 1) != 0) {
                      dVar238 = pdVar39[lVar109 + lVar149 + lVar181];
                      cVar171 = '\x05';
                      lVar140 = -1;
                      dVar235 = dVar238;
                      dVar243 = dVar238;
                      do {
                        lVar181 = -1;
                        cVar183 = cVar171;
                        do {
                          lVar170 = 0;
                          do {
                            if (((int)lVar170 != 1 || ((int)lVar181 != 0 || (int)lVar140 != 0)) &&
                               ((1 << (cVar183 + (char)lVar170 & 0x1fU) & uVar29) != 0)) {
                              dVar244 = pdVar39[(iVar122 + (int)lVar140) * lVar37 +
                                                (iVar131 + (int)lVar181) * lVar35 +
                                                (long)(iVar129 + (int)lVar170)];
                              dVar214 = dVar244;
                              if (dVar244 <= dVar235) {
                                dVar214 = dVar235;
                              }
                              dVar235 = dVar214;
                              if (dVar244 < dVar243) {
                                dVar243 = dVar244;
                              }
                            }
                            lVar170 = lVar170 + 1;
                          } while (lVar170 != 3);
                          lVar181 = lVar181 + 1;
                          cVar183 = cVar183 + '\x03';
                        } while (lVar181 != 2);
                        cVar171 = cVar171 + '\t';
                        bVar197 = lVar140 != 0;
                        lVar140 = lVar140 + 1;
                      } while (bVar197);
                      dVar244 = ((((pdVar53 + lVar136 + lVar114 + (lVar137 - lVar133))[lVar51] -
                                  dVar208) * dVar233 +
                                 (pdVar53[lVar136 + lVar114 + (lVar137 - lVar133)] - dVar201) *
                                 dVar242 + dVar238) - (dVar220 + 0.5) * dVar236) - dVar238;
                      if (dVar244 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar244 < -1e-13) &&
                           (dVar235 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar238) / dVar244;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar245 <= dVar235) {
                        dVar235 = dVar245;
                      }
                    }
                    dVar245 = 0.0;
                    if (1 < iVar104) {
                      dVar245 = dVar235;
                    }
                    dVar238 = 0.0;
                    if (1 < iVar99) {
                      dVar238 = dVar235;
                    }
                    dVar243 = 0.0;
                    if (1 < iVar98) {
                      dVar243 = dVar235;
                    }
                    if ((dVar246 == 1.0) && (!NAN(dVar246))) {
                      if ((pdVar56[lVar157 + lVar176 + ((iVar172 - iVar16) + -2)] == 1.0) &&
                         (((!NAN(pdVar56[lVar157 + lVar176 + ((iVar172 - iVar16) + -2)]) &&
                           (pdVar56[lVar157 + lVar176 + lVar118] == 1.0)) &&
                          (!NAN(pdVar56[lVar157 + lVar176 + lVar118]))))) {
                        dVar245 = 1.0;
                      }
                      if (((pdVar56[lVar176 + lVar115 + lVar162] == 1.0) &&
                          (!NAN(pdVar56[lVar176 + lVar115 + lVar162]))) &&
                         ((pdVar56[lVar176 + lVar127 + lVar162] == 1.0 &&
                          (!NAN(pdVar56[lVar176 + lVar127 + lVar162]))))) {
                        dVar238 = 1.0;
                      }
                      if (((pdVar56[lVar157 + lVar162 + lVar155] == 1.0) &&
                          (!NAN(pdVar56[lVar157 + lVar162 + lVar155]))) &&
                         ((pdVar56[lVar157 + lVar162 + lVar160] == 1.0 &&
                          (!NAN(pdVar56[lVar157 + lVar162 + lVar160]))))) {
                        dVar243 = 1.0;
                      }
                    }
                    dVar234 = (0.5 - dVar201) * dVar242 * dVar245 + dVar3 +
                              (dVar234 - dVar208) * dVar233 * dVar238 +
                              (dVar248 - dVar220) * dVar236 * dVar243;
                    if (dVar234 <= dVar212) {
                      dVar212 = dVar234;
                    }
                    if (dVar199 <= dVar212) {
                      dVar199 = dVar212;
                    }
                    iVar105 = d_bcrec->bc[3];
                    if (iVar192 == iVar172) {
                      iVar104 = d_bcrec->bc[0];
                      switch(iVar104) {
                      case 1:
                      case 2:
                      case 4:
                        dVar199 = dVar200;
                      default:
                        if ((iVar104 == 4) || (iVar104 == 2)) {
                          dVar199 = 0.0;
                          if (dVar200 <= 0.0) {
                            dVar199 = dVar200;
                          }
switchD_00458b2b_caseD_1:
                          dVar200 = dVar199;
                          dVar199 = dVar200;
                        }
                        break;
                      case 3:
                        lVar137 = (long)(int)(~uVar28 + iVar192);
LAB_00458b54:
                        dVar200 = pdVar39[lVar167 + lVar139 + lVar137];
                        dVar199 = dVar200;
                        break;
                      case -1:
switchD_00458aef_caseD_ffffffff:
                        dVar200 = 0.0;
                        dVar199 = 0.0;
                      }
                    }
                    else if (iVar4 + 1 == iVar172) {
                      switch(iVar105) {
                      default:
                        break;
                      case 1:
                      case 2:
                      case 4:
                        goto switchD_00458b2b_caseD_1;
                      case 3:
                        lVar137 = lVar188 - lVar143;
                        goto LAB_00458b54;
                      case -1:
                        goto switchD_00458aef_caseD_ffffffff;
                      }
                    }
                    dVar234 = dVar199;
                    if ((iVar4 + 1 == iVar172) &&
                       (((iVar105 == 4 || (iVar105 == 2)) &&
                        (dVar200 = 0.0, dVar234 = 0.0, 0.0 <= dVar199)))) {
                      dVar200 = dVar199;
                      dVar234 = dVar199;
                    }
                    if ((0.0 <= dVar234) || (dVar200 <= 0.0)) {
                      dVar248 = (dVar200 + dVar234) * 0.5;
                      if ((dVar248 < 1e-08) && (dVar234 = 0.0, dVar248 <= -1e-08)) {
                        dVar234 = dVar200;
                      }
                    }
                    else {
                      dVar234 = 0.0;
                    }
                  }
                  pdVar31[(lVar138 - iVar147) * lVar32 +
                          (lVar154 - iVar10) * lVar2 + (lVar188 - iVar11)] = dVar234;
                  lVar188 = lVar188 + 1;
                  iVar120 = iVar120 + 1;
                  iVar128 = iVar128 + 1;
                  pdVar169 = pdVar169 + 1;
                  pdVar161 = pdVar161 + 1;
                  pdVar174 = pdVar174 + 1;
                  iVar129 = iVar129 + 1;
                } while (local_7a0 + 1 != (int)lVar188);
              }
              lVar154 = lVar154 + 1;
            } while (iVar26 + 1 != (int)uVar198);
          }
          lVar138 = lVar138 + 1;
        } while (iVar9 + 1 != (int)lVar138);
      }
      goto LAB_00451b84;
    }
  }
  iVar8 = (ubx->smallend).vect[0];
  iVar9 = (ubx->smallend).vect[1];
  iVar147 = (ubx->smallend).vect[2];
  iVar10 = (ubx->bigend).vect[1];
  uVar64 = *(undefined8 *)&(u->begin).z;
  uVar65 = (u->end).y;
  iVar11 = (ubx->bigend).vect[2];
  local_398.u.end.y = uVar65;
  local_398.u._52_8_ = *(undefined8 *)&(u->end).z;
  local_398.u.begin.x = (u->begin).x;
  local_398.u.begin.y = (u->begin).y;
  local_398.u.begin.z = (int)uVar64;
  local_398.u.end.x = (int)((ulong)uVar64 >> 0x20);
  local_398.u.kstride = u->kstride;
  local_398.u.nstride = u->nstride;
  local_398.u.p = u->p;
  local_398.u.jstride = u->jstride;
  uVar64 = *(undefined8 *)&(vcc->begin).z;
  uVar66 = (vcc->end).y;
  local_398.vcc.end.y = uVar66;
  local_398.vcc._52_8_ = *(undefined8 *)&(vcc->end).z;
  local_398.vcc.begin.x = (vcc->begin).x;
  local_398.vcc.begin.y = (vcc->begin).y;
  local_398.vcc.begin.z = (int)uVar64;
  local_398.vcc.end.x = (int)((ulong)uVar64 >> 0x20);
  local_398.vcc.kstride = vcc->kstride;
  local_398.vcc.nstride = vcc->nstride;
  local_398.vcc.p = vcc->p;
  local_398.vcc.jstride = vcc->jstride;
  uVar67 = (flag->end).x;
  uVar68 = (flag->end).y;
  local_398.flag.p = flag->p;
  local_398.flag.jstride = flag->jstride;
  local_398.flag.kstride = flag->kstride;
  local_398.flag.nstride = flag->nstride;
  local_398.flag.begin.x = (flag->begin).x;
  local_398.flag.begin.y = (flag->begin).y;
  local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
  local_398.flag.end.x = uVar67;
  local_398.flag.end.y = uVar68;
  local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  uVar69 = (ccc->end).x;
  uVar70 = (ccc->end).y;
  local_398.ccc.p = ccc->p;
  local_398.ccc.jstride = ccc->jstride;
  local_398.ccc.kstride = ccc->kstride;
  local_398.ccc.nstride = ccc->nstride;
  local_398.ccc.begin.x = (ccc->begin).x;
  local_398.ccc.begin.y = (ccc->begin).y;
  local_398.ccc.begin.z = (int)*(undefined8 *)&(ccc->begin).z;
  local_398.ccc.end.x = uVar69;
  local_398.ccc.end.y = uVar70;
  local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  uVar71 = (vfrac->end).x;
  uVar72 = (vfrac->end).y;
  local_398.vfrac.p = vfrac->p;
  local_398.vfrac.jstride = vfrac->jstride;
  local_398.vfrac.kstride = vfrac->kstride;
  local_398.vfrac.nstride = vfrac->nstride;
  local_398.vfrac.begin.x = (vfrac->begin).x;
  local_398.vfrac.begin.y = (vfrac->begin).y;
  local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_398.vfrac.end.x = uVar71;
  local_398.vfrac.end.y = uVar72;
  local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_398.d_bcrec = d_bcrec;
  uVar64 = *(undefined8 *)&(fcx->begin).z;
  uVar73 = (fcx->end).y;
  local_398.fcx.end.y = uVar73;
  local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_398.fcx.begin.x = (fcx->begin).x;
  local_398.fcx.begin.y = (fcx->begin).y;
  local_398.fcx.begin.z = (int)uVar64;
  local_398.fcx.end.x = (int)((ulong)uVar64 >> 0x20);
  local_398.fcx.kstride = fcx->kstride;
  local_398.fcx.nstride = fcx->nstride;
  local_398.fcx.p = fcx->p;
  local_398.fcx.jstride = fcx->jstride;
  uVar64 = *(undefined8 *)&(fcy->begin).z;
  uVar74 = (fcy->end).y;
  local_398.fcy.end.y = uVar74;
  local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_398.fcy.begin.x = (fcy->begin).x;
  local_398.fcy.begin.y = (fcy->begin).y;
  local_398.fcy.begin.z = (int)uVar64;
  local_398.fcy.end.x = (int)((ulong)uVar64 >> 0x20);
  local_398.fcy.kstride = fcy->kstride;
  local_398.fcy.nstride = fcy->nstride;
  local_398.fcy.p = fcy->p;
  local_398.fcy.jstride = fcy->jstride;
  uVar60 = (fcz->end).x;
  uVar61 = (fcz->end).y;
  local_398.fcz.p = fcz->p;
  local_398.fcz.jstride = fcz->jstride;
  local_398.fcz.kstride = fcz->kstride;
  local_398.fcz.nstride = fcz->nstride;
  local_398.fcz.begin.x = (fcz->begin).x;
  local_398.fcz.begin.y = (fcz->begin).y;
  local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
  local_398.fcz.end.x = uVar60;
  local_398.fcz.end.y = uVar61;
  local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_398.domain_ilo = iVar192;
  local_398.domain_jlo = iVar148;
  local_398.domain_klo = iVar6;
  local_398.domain_ihi = iVar4;
  local_398.domain_jhi = iVar5;
  local_398.domain_khi = iVar7;
  local_398.order = 2;
  if (iVar147 <= iVar11) {
    do {
      iVar187 = iVar9;
      if (iVar9 <= iVar10) {
        do {
          iVar190 = iVar8;
          if (iVar8 <= local_7a0) {
            do {
              ExtrapVelToFacesBox::anon_class_552_16_5c7b231c::operator()
                        (&local_398,iVar190,iVar187,iVar147);
              iVar190 = iVar190 + 1;
            } while (local_7a0 + 1 != iVar190);
          }
          bVar197 = iVar187 != iVar10;
          iVar187 = iVar187 + 1;
        } while (bVar197);
      }
      bVar197 = iVar147 != iVar11;
      iVar147 = iVar147 + 1;
    } while (bVar197);
  }
LAB_00451b84:
  pBVar30 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((((pBVar30[1].bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar192)) ||
       ((0xfffffffd < pBVar30[1].bc[3] - 5U && (iVar4 <= (ubx->bigend).vect[0])))) ||
      ((((pBVar30[1].bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar148)) ||
        (iVar8 = (vbx->bigend).vect[1], iVar5 <= iVar8 && 0xfffffffd < pBVar30[1].bc[4] - 5U)) ||
       ((pBVar30[1].bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar6)))))) ||
     ((0xfffffffd < pBVar30[1].bc[5] - 5U && (iVar7 <= (wbx->bigend).vect[2])))) {
    iVar8 = (vbx->smallend).vect[0];
    iVar9 = (vbx->smallend).vect[1];
    iVar147 = (vbx->smallend).vect[2];
    iVar10 = (vbx->bigend).vect[0];
    iVar11 = (vbx->bigend).vect[1];
    uVar64 = *(undefined8 *)&(v->begin).z;
    uVar75 = (v->end).y;
    iVar187 = (vbx->bigend).vect[2];
    local_398.u.end.y = uVar75;
    local_398.u._52_8_ = *(undefined8 *)&(v->end).z;
    local_398.u.begin.x = (v->begin).x;
    local_398.u.begin.y = (v->begin).y;
    local_398.u.begin.z = (int)uVar64;
    local_398.u.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.u.kstride = v->kstride;
    local_398.u.nstride = v->nstride;
    local_398.u.p = v->p;
    local_398.u.jstride = v->jstride;
    uVar64 = *(undefined8 *)&(vcc->begin).z;
    uVar76 = (vcc->end).y;
    local_398.vcc.end.y = uVar76;
    local_398.vcc._52_8_ = *(undefined8 *)&(vcc->end).z;
    local_398.vcc.begin.x = (vcc->begin).x;
    local_398.vcc.begin.y = (vcc->begin).y;
    local_398.vcc.begin.z = (int)uVar64;
    local_398.vcc.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.vcc.kstride = vcc->kstride;
    local_398.vcc.nstride = vcc->nstride;
    local_398.vcc.p = vcc->p;
    local_398.vcc.jstride = vcc->jstride;
    uVar77 = (flag->end).x;
    uVar78 = (flag->end).y;
    local_398.flag.p = flag->p;
    local_398.flag.jstride = flag->jstride;
    local_398.flag.kstride = flag->kstride;
    local_398.flag.nstride = flag->nstride;
    local_398.flag.begin.x = (flag->begin).x;
    local_398.flag.begin.y = (flag->begin).y;
    local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
    local_398.flag.end.x = uVar77;
    local_398.flag.end.y = uVar78;
    local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    uVar79 = (ccc->end).x;
    uVar80 = (ccc->end).y;
    local_398.ccc.p = ccc->p;
    local_398.ccc.jstride = ccc->jstride;
    local_398.ccc.kstride = ccc->kstride;
    local_398.ccc.nstride = ccc->nstride;
    local_398.ccc.begin.x = (ccc->begin).x;
    local_398.ccc.begin.y = (ccc->begin).y;
    local_398.ccc.begin.z = (int)*(undefined8 *)&(ccc->begin).z;
    local_398.ccc.end.x = uVar79;
    local_398.ccc.end.y = uVar80;
    local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    uVar81 = (vfrac->end).x;
    uVar82 = (vfrac->end).y;
    local_398.vfrac.p = vfrac->p;
    local_398.vfrac.jstride = vfrac->jstride;
    local_398.vfrac.kstride = vfrac->kstride;
    local_398.vfrac.nstride = vfrac->nstride;
    local_398.vfrac.begin.x = (vfrac->begin).x;
    local_398.vfrac.begin.y = (vfrac->begin).y;
    local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
    local_398.vfrac.end.x = uVar81;
    local_398.vfrac.end.y = uVar82;
    local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_398.d_bcrec = d_bcrec;
    uVar64 = *(undefined8 *)&(fcx->begin).z;
    uVar83 = (fcx->end).y;
    local_398.fcx.end.y = uVar83;
    local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_398.fcx.begin.x = (fcx->begin).x;
    local_398.fcx.begin.y = (fcx->begin).y;
    local_398.fcx.begin.z = (int)uVar64;
    local_398.fcx.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.fcx.kstride = fcx->kstride;
    local_398.fcx.nstride = fcx->nstride;
    local_398.fcx.p = fcx->p;
    local_398.fcx.jstride = fcx->jstride;
    uVar64 = *(undefined8 *)&(fcy->begin).z;
    uVar84 = (fcy->end).y;
    local_398.fcy.end.y = uVar84;
    local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_398.fcy.begin.x = (fcy->begin).x;
    local_398.fcy.begin.y = (fcy->begin).y;
    local_398.fcy.begin.z = (int)uVar64;
    local_398.fcy.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.fcy.kstride = fcy->kstride;
    local_398.fcy.nstride = fcy->nstride;
    local_398.fcy.p = fcy->p;
    local_398.fcy.jstride = fcy->jstride;
    uVar62 = (fcz->end).x;
    uVar63 = (fcz->end).y;
    local_398.fcz.p = fcz->p;
    local_398.fcz.jstride = fcz->jstride;
    local_398.fcz.kstride = fcz->kstride;
    local_398.fcz.nstride = fcz->nstride;
    local_398.fcz.begin.x = (fcz->begin).x;
    local_398.fcz.begin.y = (fcz->begin).y;
    local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
    local_398.fcz.end.x = uVar62;
    local_398.fcz.end.y = uVar63;
    local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_398.domain_ilo = iVar192;
    local_398.domain_jlo = iVar148;
    local_398.domain_klo = iVar6;
    local_398.domain_ihi = iVar4;
    local_398.domain_jhi = iVar5;
    local_398.domain_khi = iVar7;
    local_398.order = 2;
    if (iVar147 <= iVar187) {
      do {
        iVar190 = iVar9;
        if (iVar9 <= iVar11) {
          do {
            iVar191 = iVar8;
            if (iVar8 <= iVar10) {
              do {
                ExtrapVelToFacesBox::anon_class_552_16_3e0d00fb::operator()
                          ((anon_class_552_16_3e0d00fb *)&local_398,iVar191,iVar190,iVar147);
                iVar191 = iVar191 + 1;
              } while (iVar10 + 1 != iVar191);
            }
            bVar197 = iVar190 != iVar11;
            iVar190 = iVar190 + 1;
          } while (bVar197);
        }
        bVar197 = iVar147 != iVar187;
        iVar147 = iVar147 + 1;
      } while (bVar197);
    }
  }
  else {
    iVar9 = (vbx->smallend).vect[2];
    iVar147 = (vbx->bigend).vect[2];
    if (iVar9 <= iVar147) {
      pdVar31 = v->p;
      lVar32 = v->jstride;
      lVar34 = v->kstride;
      iVar10 = (v->begin).x;
      iVar11 = (v->begin).y;
      iVar187 = (v->begin).z;
      pdVar33 = ccc->p;
      lVar35 = ccc->nstride;
      iVar190 = (ccc->begin).x;
      lVar133 = (long)iVar190;
      uVar24 = (vfrac->begin).x;
      uVar25 = (vfrac->begin).z;
      uVar28 = (vcc->begin).y;
      iVar191 = (vbx->smallend).vect[0];
      iVar12 = (vcc->begin).x;
      iVar13 = (ccc->begin).z;
      iVar14 = (ccc->begin).y;
      iVar15 = (vbx->smallend).vect[1];
      iVar16 = (vbx->bigend).vect[0];
      pdVar39 = vcc->p;
      lVar37 = vcc->jstride;
      lVar38 = vcc->kstride;
      lVar40 = vcc->nstride;
      iVar17 = (vcc->begin).z;
      pEVar36 = flag->p;
      lVar41 = flag->jstride;
      lVar42 = flag->kstride;
      iVar18 = (flag->begin).x;
      iVar19 = (flag->begin).y;
      iVar20 = (flag->begin).z;
      pdVar43 = fcx->p;
      lVar44 = fcx->jstride;
      lVar45 = fcx->kstride;
      lVar46 = fcx->nstride;
      iVar21 = (fcx->begin).x;
      iVar22 = (fcx->begin).y;
      iVar23 = (fcx->begin).z;
      pdVar47 = fcy->p;
      lVar48 = fcy->jstride;
      lVar49 = fcy->kstride;
      lVar50 = fcy->nstride;
      iVar26 = (fcy->begin).x;
      iVar27 = (fcy->begin).y;
      iVar122 = (fcy->begin).z;
      pdVar53 = fcz->p;
      lVar51 = fcz->jstride;
      lVar52 = fcz->kstride;
      lVar54 = fcz->nstride;
      iVar178 = (fcz->begin).x;
      iVar120 = (fcz->begin).y;
      iVar128 = (fcz->begin).z;
      lVar55 = ccc->jstride;
      lVar57 = ccc->kstride;
      pdVar56 = vfrac->p;
      lVar116 = vfrac->jstride;
      lVar117 = vfrac->kstride;
      iVar129 = (vfrac->begin).y;
      lVar138 = lVar57 * 8;
      lVar2 = lVar55 * 8;
      do {
        if (iVar15 <= iVar8) {
          lVar112 = (long)iVar9;
          lVar106 = (lVar112 - iVar20) * lVar42;
          lVar107 = (lVar112 - iVar122) * lVar49;
          iVar131 = iVar9 - iVar13;
          lVar124 = iVar131 * lVar57;
          iVar172 = iVar9 - iVar17;
          lVar111 = iVar172 * lVar38;
          lVar110 = lVar117 * (int)(iVar9 - uVar25);
          lVar166 = (int)((iVar9 + -1) - uVar25) * lVar117;
          lVar108 = (int)((iVar9 + 1) - uVar25) * lVar117;
          lVar135 = ((iVar9 + -1) - iVar17) * lVar38;
          lVar143 = ((iVar9 + 1) - iVar17) * lVar38;
          lVar152 = (lVar112 - iVar23) * lVar45;
          iVar130 = iVar9 - iVar128;
          lVar109 = (iVar130 + 1) * lVar52;
          lVar153 = iVar130 * lVar52;
          lVar154 = (int)(~uVar25 + iVar9) * lVar117;
          lVar134 = (int)((iVar9 - uVar25) + 1) * lVar117;
          lVar125 = (lVar112 + ~(long)iVar13) * lVar138;
          iVar130 = iVar15;
          do {
            if (iVar191 <= iVar16) {
              iVar98 = iVar130 - iVar27;
              iVar99 = iVar130 + -1;
              iVar101 = iVar99 - uVar28;
              lVar173 = iVar101 * lVar37;
              iVar132 = iVar130 - uVar28;
              lVar176 = iVar132 * lVar37;
              iVar102 = iVar130 - iVar129;
              lVar188 = lVar116 * iVar102;
              lVar177 = (iVar99 - iVar129) * lVar116;
              lVar155 = (iVar130 - iVar22) * lVar44;
              lVar160 = (iVar130 - iVar120) * lVar51;
              lVar167 = ((long)iVar99 - (long)iVar14) * lVar55;
              lVar126 = (iVar99 - iVar22) * lVar44;
              lVar136 = (iVar99 - iVar120) * lVar51;
              lVar179 = ((long)iVar99 + ~(long)iVar14) * lVar2;
              iVar104 = iVar191;
              iVar105 = (iVar191 + -1) - iVar190;
              iVar97 = (iVar191 + -1) - iVar12;
              do {
                lVar168 = (long)iVar104;
                lVar113 = lVar168 - iVar18;
                uVar29 = pEVar36[lVar106 + (iVar130 - iVar19) * lVar41 + lVar113].flag;
                dVar234 = 0.0;
                if ((short)uVar29 < 0) {
                  lVar144 = (long)pdVar33 + lVar168 * 8 + lVar179 + lVar125 + lVar133 * -8 + -8;
                  lVar194 = (long)pdVar33 +
                            lVar168 * 8 + lVar179 + lVar125 + lVar35 * 8 + lVar133 * -8 + -8;
                  lVar186 = (long)pdVar33 +
                            lVar168 * 8 + lVar179 + lVar125 + lVar35 * 0x10 + lVar133 * -8 + -8;
                  lVar114 = lVar168 - iVar26;
                  dVar234 = pdVar47[lVar107 + lVar48 * iVar98 + lVar114];
                  dVar248 = (pdVar47 + lVar107 + lVar48 * iVar98 + lVar114)[lVar50];
                  lVar115 = (long)(iVar104 - iVar190);
                  pdVar161 = pdVar33 + lVar124 + (iVar130 - iVar14) * lVar55 + lVar115;
                  dVar201 = *pdVar161;
                  dVar208 = pdVar161[lVar35];
                  dVar220 = pdVar161[lVar35 * 2];
                  iVar100 = iVar104 - iVar12;
                  lVar127 = (long)iVar100;
                  dVar3 = pdVar39[lVar173 + lVar127 + lVar111 + lVar40];
                  dVar246 = pdVar39[lVar176 + lVar127 + lVar111 + lVar40];
                  lVar156 = -1;
                  cVar171 = '\x05';
                  lVar137 = 0;
                  do {
                    iVar180 = (int)lVar156;
                    lVar193 = -1;
                    cVar183 = cVar171;
                    do {
                      iVar142 = (int)lVar193;
                      iVar184 = (int)lVar137;
                      ppdVar141 = &local_398.u.p + (long)iVar184 * 3;
                      lVar137 = 0;
                      do {
                        iVar123 = (int)lVar137 + -1;
                        if (((iVar142 == 0 && iVar180 == 0) && iVar123 == 0) ||
                           ((1 << (cVar183 + (char)lVar137 & 0x1fU) & uVar29) == 0)) {
                          *ppdVar141 = (double *)0x0;
                          ppdVar141[1] = (double *)0x0;
                          ppdVar141[2] = (double *)0x0;
                        }
                        else {
                          pdVar161 = pdVar33 + (iVar131 + iVar180) * lVar57 +
                                               ((iVar130 - iVar14) + iVar142) * lVar55 +
                                               (long)(iVar105 + (int)lVar137);
                          dVar199 = pdVar161[lVar35];
                          *ppdVar141 = (double *)((*pdVar161 + (double)iVar123) - dVar201);
                          ppdVar141[1] = (double *)((dVar199 + (double)iVar142) - dVar208);
                          ppdVar141[2] = (double *)
                                         ((pdVar161[lVar35 * 2] + (double)iVar180) - dVar220);
                        }
                        lVar137 = lVar137 + 1;
                        ppdVar141 = ppdVar141 + 3;
                      } while (lVar137 != 3);
                      lVar193 = lVar193 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar137 = (long)iVar184 + 3;
                    } while (lVar193 != 2);
                    lVar156 = lVar156 + 1;
                    cVar171 = cVar171 + '\t';
                    lVar137 = (long)iVar184 + 3;
                  } while (lVar156 != 2);
                  dVar199 = dVar234 - dVar201;
                  lVar156 = -1;
                  cVar171 = '\x05';
                  lVar137 = 0;
                  do {
                    lVar193 = -1;
                    cVar183 = cVar171;
                    do {
                      iVar180 = (int)lVar137;
                      lVar137 = 0;
                      do {
                        dVar200 = 0.0;
                        if (((int)lVar137 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                           ((1 << (cVar183 + (char)lVar137 & 0x1fU) & uVar29) != 0)) {
                          dVar200 = pdVar39[lVar40 + (iVar172 + (int)lVar156) * lVar38 +
                                                     (iVar132 + (int)lVar193) * lVar37 +
                                                     (long)(iVar97 + (int)lVar137)] - dVar246;
                        }
                        adStack_108[iVar180 + lVar137] = dVar200;
                        lVar137 = lVar137 + 1;
                      } while (lVar137 != 3);
                      lVar193 = lVar193 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar137 = (long)iVar180 + 3;
                    } while (lVar193 != 2);
                    lVar156 = lVar156 + 1;
                    cVar171 = cVar171 + '\t';
                    lVar137 = (long)iVar180 + 3;
                  } while (lVar156 != 2);
                  dVar245 = dVar248 - dVar220;
                  dVar200 = dVar3;
                  if (dVar3 <= dVar246) {
                    dVar200 = dVar246;
                  }
                  dVar233 = 0.0;
                  dVar235 = 0.0;
                  dVar236 = 0.0;
                  pLVar119 = &local_398.u.kstride;
                  lVar137 = 0;
                  dVar244 = 0.0;
                  dVar214 = 0.0;
                  dVar238 = 0.0;
                  dVar243 = 0.0;
                  dVar242 = 0.0;
                  dVar212 = 0.0;
                  do {
                    pdVar161 = ((Array4<double> *)(pLVar119 + -2))->p;
                    dVar225 = (double)pLVar119[-1];
                    dVar213 = (double)*pLVar119;
                    dVar222 = adStack_108[lVar137];
                    dVar242 = dVar242 + dVar225 * (double)pLVar119[-1];
                    dVar212 = dVar212 + (double)pdVar161 * (double)*pLVar119;
                    dVar236 = dVar236 + dVar213 * dVar213;
                    dVar238 = dVar238 + dVar222 * (double)pdVar161;
                    dVar243 = dVar243 + (double)pdVar161 * (double)pdVar161;
                    dVar233 = dVar233 + dVar222 * dVar225;
                    dVar235 = dVar235 + dVar225 * (double)pdVar161;
                    dVar244 = dVar244 + dVar213 * (double)pLVar119[-1];
                    dVar214 = dVar214 + dVar222 * (double)*pLVar119;
                    lVar137 = lVar137 + 1;
                    pLVar119 = pLVar119 + 3;
                  } while (lVar137 != 0x1b);
                  dVar222 = dVar235 * dVar236 - dVar212 * dVar244;
                  dVar225 = dVar235 * dVar214 - dVar212 * dVar233;
                  dVar213 = dVar235 * dVar244 + dVar212 * -dVar242;
                  dVar228 = dVar236 * dVar242 - dVar244 * dVar244;
                  dVar236 = dVar236 * dVar233 - dVar244 * dVar214;
                  auVar226._0_8_ =
                       dVar212 * (dVar233 * dVar244 - dVar214 * dVar242) +
                       (dVar238 * dVar228 - dVar236 * dVar235);
                  auVar226._8_8_ = dVar212 * dVar225 + (dVar243 * dVar236 - dVar222 * dVar238);
                  dVar212 = dVar213 * dVar212 + (dVar228 * dVar243 - dVar222 * dVar235);
                  auVar210._8_8_ = dVar212;
                  auVar210._0_8_ = dVar212;
                  auVar203 = divpd(auVar226,auVar210);
                  dVar212 = (dVar213 * dVar238 +
                            ((dVar214 * dVar242 + -dVar233 * dVar244) * dVar243 - dVar225 * dVar235)
                            ) / dVar212;
                  iVar180 = iVar104 - uVar24;
                  lVar137 = (long)iVar180;
                  dVar242 = pdVar56[lVar188 + lVar110 + lVar137];
                  dVar233 = auVar203._0_8_;
                  dVar235 = auVar203._8_8_;
                  if ((dVar242 == 1.0) && (!NAN(dVar242))) {
                    if (pdVar56[lVar188 + lVar110 + (int)((iVar104 + -1) - uVar24)] == 1.0) {
                      if ((pdVar56[lVar188 + lVar110 + (int)((iVar104 + 1) - uVar24)] == 1.0) &&
                         (!NAN(pdVar56[lVar188 + lVar110 + (int)((iVar104 + 1) - uVar24)]))) {
                        dVar233 = dVar246 - pdVar39[lVar176 + lVar111 + lVar40 + ((iVar104 + -1) -
                                                                                 iVar12)];
                        dVar236 = pdVar39[lVar176 + lVar111 + lVar40 + ((iVar104 + 1) - iVar12)] -
                                  dVar246;
                        dVar233 = dVar233 + dVar233;
                        dVar236 = dVar236 + dVar236;
                        dVar238 = (pdVar39[lVar176 + lVar111 + lVar40 + ((iVar104 + 1) - iVar12)] -
                                  pdVar39[lVar176 + lVar111 + lVar40 + ((iVar104 + -1) - iVar12)]) *
                                  0.5;
                        dVar244 = ABS(dVar233);
                        uVar198 = -(ulong)(0.0 < dVar238);
                        dVar238 = ABS(dVar238);
                        dVar243 = ABS(dVar236);
                        if (dVar244 <= dVar238) {
                          dVar238 = dVar244;
                        }
                        if (dVar238 <= dVar243) {
                          dVar243 = dVar238;
                        }
                        uVar215 = -(ulong)(0.0 < dVar233 * dVar236) & (ulong)dVar243;
                        dVar233 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                          uVar198 & uVar215);
                      }
                    }
                    if (((pdVar56[lVar110 + lVar177 + lVar137] == 1.0) &&
                        (pdVar56[lVar110 + ((iVar130 + 1) - iVar129) * lVar116 + lVar137] == 1.0))
                       && (!NAN(pdVar56[lVar110 + ((iVar130 + 1) - iVar129) * lVar116 + lVar137])))
                    {
                      dVar244 = pdVar39[lVar40 + lVar111 + (int)((iVar130 + 1) - uVar28) * lVar37 +
                                                           lVar127] - dVar246;
                      dVar243 = (dVar246 - dVar3) + (dVar246 - dVar3);
                      dVar244 = dVar244 + dVar244;
                      dVar238 = (pdVar39[lVar40 + lVar111 + (int)((iVar130 + 1) - uVar28) * lVar37 +
                                                            lVar127] - dVar3) * 0.5;
                      dVar235 = ABS(dVar243);
                      uVar198 = -(ulong)(0.0 < dVar238);
                      dVar238 = ABS(dVar238);
                      dVar236 = ABS(dVar244);
                      if (dVar235 <= dVar238) {
                        dVar238 = dVar235;
                      }
                      if (dVar238 <= dVar236) {
                        dVar236 = dVar238;
                      }
                      uVar215 = -(ulong)(0.0 < dVar243 * dVar244) & (ulong)dVar236;
                      dVar235 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                        uVar198 & uVar215);
                    }
                    if (((pdVar56[lVar188 + lVar137 + lVar166] == 1.0) &&
                        (pdVar56[lVar188 + lVar137 + lVar108] == 1.0)) &&
                       (!NAN(pdVar56[lVar188 + lVar137 + lVar108]))) {
                      dVar238 = dVar246 - pdVar39[lVar176 + lVar127 + lVar135 + lVar40];
                      dVar243 = pdVar39[lVar176 + lVar127 + lVar143 + lVar40] - dVar246;
                      dVar238 = dVar238 + dVar238;
                      dVar243 = dVar243 + dVar243;
                      dVar236 = (pdVar39[lVar176 + lVar127 + lVar143 + lVar40] -
                                pdVar39[lVar176 + lVar127 + lVar135 + lVar40]) * 0.5;
                      dVar244 = ABS(dVar238);
                      uVar198 = -(ulong)(0.0 < dVar236);
                      dVar236 = ABS(dVar236);
                      dVar212 = ABS(dVar243);
                      if (dVar244 <= dVar236) {
                        dVar236 = dVar244;
                      }
                      if (dVar236 <= dVar212) {
                        dVar212 = dVar236;
                      }
                      uVar215 = -(ulong)(0.0 < dVar238 * dVar243) & (ulong)dVar212;
                      dVar212 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                        uVar198 & uVar215);
                    }
                  }
                  dVar236 = dVar3;
                  if (dVar246 <= dVar3) {
                    dVar236 = dVar246;
                  }
                  iVar142 = 0;
                  iVar184 = 0;
                  iVar123 = 0;
                  iVar175 = 0;
                  uVar165 = 0xffffffff;
                  do {
                    uVar121 = uVar165 + 1;
                    uVar150 = 0xffffffff;
                    iVar151 = iVar142;
                    do {
                      uVar103 = uVar150 + 1;
                      iVar185 = 5;
                      do {
                        if (((uVar29 >> (iVar151 + iVar185 & 0x1fU) & 1) != 0) &&
                           ((iVar185 != 6 || uVar150 != 0) || uVar165 != 0)) {
                          iVar184 = iVar184 + (uint)((iVar185 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar150 == 0 && uVar165 == 0));
                          iVar123 = iVar123 + (uint)((iVar185 == 6 && uVar165 == 0) &&
                                                    (uVar103 & 0xfffffffd) == 0);
                          iVar175 = iVar175 + (uint)((iVar185 == 6 && uVar150 == 0) &&
                                                    (uVar121 & 0xfffffffd) == 0);
                        }
                        iVar185 = iVar185 + 1;
                      } while (iVar185 != 8);
                      iVar151 = iVar151 + 3;
                      uVar150 = uVar103;
                    } while (uVar103 != 2);
                    iVar142 = iVar142 + 9;
                    uVar165 = uVar121;
                  } while (uVar121 != 2);
                  dVar238 = 2.0;
                  if ((uVar29 >> 0x15 & 1) != 0) {
                    lVar156 = -1;
                    cVar171 = '\b';
                    auVar227._8_8_ = 0;
                    auVar227._0_8_ = (ulong)dVar246;
                    dVar243 = dVar246;
                    do {
                      iVar142 = 0;
                      bVar197 = true;
                      do {
                        bVar189 = bVar197;
                        lVar193 = 0;
                        do {
                          if (((int)lVar193 != 1 || (iVar142 != 0 || (int)lVar156 != 0)) &&
                             ((1 << ((char)lVar193 + (char)iVar142 * '\x03' + cVar171 & 0x1fU) &
                              uVar29) != 0)) {
                            dVar238 = pdVar39[lVar40 + (iVar172 + (int)lVar156) * lVar38 +
                                                       (iVar132 + iVar142) * lVar37 +
                                                       (long)(iVar97 + (int)lVar193)];
                            uVar230 = SUB84(dVar238,0);
                            uVar232 = (undefined4)((ulong)dVar238 >> 0x20);
                            if (dVar238 <= auVar227._0_8_) {
                              uVar230 = auVar227._0_4_;
                              uVar232 = auVar227._4_4_;
                            }
                            auVar227._4_4_ = uVar232;
                            auVar227._0_4_ = uVar230;
                            auVar227._8_8_ = 0;
                            if (dVar238 < dVar243) {
                              dVar243 = dVar238;
                            }
                          }
                          lVar193 = lVar193 + 1;
                        } while (lVar193 != 3);
                        iVar142 = 1;
                        bVar197 = false;
                      } while (bVar189);
                      lVar156 = lVar156 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar156 != 2);
                    dVar244 = (((pdVar47 + lVar107 + (iVar98 + 1) * lVar48 + lVar114)[lVar50] -
                               dVar220) * dVar212 +
                              (0.5 - dVar208) * dVar235 +
                              (pdVar47[lVar107 + (iVar98 + 1) * lVar48 + lVar114] - dVar201) *
                              dVar233 + dVar246) - dVar246;
                    if (dVar244 <= 1e-13) {
                      dVar238 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar238 = (dVar243 - dVar246) / dVar244, 1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = (auVar227._0_8_ - dVar246) / dVar244;
                      if (1.0 <= dVar238) {
                        dVar238 = 1.0;
                      }
                    }
                    if (2.0 <= dVar238) {
                      dVar238 = 2.0;
                    }
                  }
                  lVar156 = -1;
                  cVar171 = '\x05';
                  dVar244 = dVar246;
                  dVar243 = dVar246;
                  do {
                    lVar193 = -1;
                    cVar183 = cVar171;
                    do {
                      lVar149 = 0;
                      dVar214 = dVar243;
                      do {
                        dVar243 = dVar214;
                        if (((int)lVar149 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                           ((1 << (cVar183 + (char)lVar149 & 0x1fU) & uVar29) != 0)) {
                          dVar213 = pdVar39[lVar40 + (iVar172 + (int)lVar156) * lVar38 +
                                                     (iVar132 + (int)lVar193) * lVar37 +
                                                     (long)(iVar97 + (int)lVar149)];
                          dVar243 = dVar213;
                          if (dVar213 <= dVar214) {
                            dVar243 = dVar214;
                          }
                          if (dVar213 < dVar244) {
                            dVar244 = dVar213;
                          }
                        }
                        lVar149 = lVar149 + 1;
                        dVar214 = dVar243;
                      } while (lVar149 != 3);
                      cVar183 = cVar183 + '\x03';
                      bVar197 = lVar193 != 0;
                      lVar193 = lVar193 + 1;
                    } while (bVar197);
                    lVar156 = lVar156 + 1;
                    cVar171 = cVar171 + '\t';
                  } while (lVar156 != 2);
                  dVar214 = (dVar245 * dVar212 +
                            -(dVar208 + 0.5) * dVar235 + dVar199 * dVar233 + dVar246) - dVar246;
                  if (dVar214 <= 1e-13) {
                    dVar243 = 1.0;
                    if ((dVar214 < -1e-13) &&
                       (dVar243 = (dVar244 - dVar246) / dVar214, 1.0 <= dVar243)) {
                      dVar243 = 1.0;
                    }
                  }
                  else {
                    dVar243 = (dVar243 - dVar246) / dVar214;
                    if (1.0 <= dVar243) {
                      dVar243 = 1.0;
                    }
                  }
                  if (dVar238 <= dVar243) {
                    dVar243 = dVar238;
                  }
                  dVar238 = dVar243;
                  if ((uVar29 >> 0x13 & 1) != 0) {
                    lVar156 = -1;
                    auVar239._8_8_ = 0;
                    auVar239._0_8_ = (ulong)dVar246;
                    dVar244 = dVar246;
                    do {
                      lVar193 = -1;
                      do {
                        iVar142 = 0;
                        bVar197 = true;
                        do {
                          bVar189 = bVar197;
                          if ((((int)lVar193 != 0 || (int)lVar156 != 0) || iVar142 != 0) &&
                             ((1 << ((char)lVar193 * '\x03' + (char)lVar156 * '\t' + '\x12' +
                                     (char)iVar142 & 0x1fU) & uVar29) != 0)) {
                            dVar238 = pdVar39[lVar40 + (iVar172 + (int)lVar156) * lVar38 +
                                                       (iVar132 + (int)lVar193) * lVar37 +
                                                       (long)(iVar142 + iVar100)];
                            uVar230 = SUB84(dVar238,0);
                            uVar232 = (undefined4)((ulong)dVar238 >> 0x20);
                            if (dVar238 <= auVar239._0_8_) {
                              uVar230 = auVar239._0_4_;
                              uVar232 = auVar239._4_4_;
                            }
                            if (dVar238 < dVar244) {
                              dVar244 = dVar238;
                            }
                            auVar239._4_4_ = uVar232;
                            auVar239._0_4_ = uVar230;
                            auVar239._8_8_ = 0;
                          }
                          iVar142 = 1;
                          bVar197 = false;
                        } while (bVar189);
                        lVar193 = lVar193 + 1;
                      } while (lVar193 != 2);
                      lVar156 = lVar156 + 1;
                    } while (lVar156 != 2);
                    dVar214 = (((pdVar43 + lVar152 + lVar155 + ((iVar104 - iVar21) + 1))[lVar46] -
                               dVar220) * dVar212 +
                              (pdVar43[lVar152 + lVar155 + ((iVar104 - iVar21) + 1)] - dVar208) *
                              dVar235 + (0.5 - dVar201) * dVar233 + dVar246) - dVar246;
                    if (dVar214 <= 1e-13) {
                      dVar238 = 1.0;
                      if ((dVar214 < -1e-13) &&
                         (dVar238 = (dVar244 - dVar246) / dVar214, 1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = (auVar239._0_8_ - dVar246) / dVar214;
                      if (1.0 <= dVar238) {
                        dVar238 = 1.0;
                      }
                    }
                    if (dVar243 <= dVar238) {
                      dVar238 = dVar243;
                    }
                  }
                  dVar243 = dVar238;
                  if ((uVar29 >> 0x11 & 1) != 0) {
                    lVar156 = -1;
                    cVar171 = '\x05';
                    dVar244 = dVar246;
                    dVar243 = dVar246;
                    do {
                      lVar193 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar149 = 0;
                        do {
                          if (((int)lVar149 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                             ((1 << (cVar183 + (char)lVar149 & 0x1fU) & uVar29) != 0)) {
                            dVar214 = pdVar39[lVar40 + (iVar172 + (int)lVar156) * lVar38 +
                                                       (iVar132 + (int)lVar193) * lVar37 +
                                                       (long)(iVar97 + (int)lVar149)];
                            dVar213 = dVar214;
                            if (dVar214 <= dVar243) {
                              dVar213 = dVar243;
                            }
                            dVar243 = dVar213;
                            if (dVar214 < dVar244) {
                              dVar244 = dVar214;
                            }
                          }
                          lVar149 = lVar149 + 1;
                        } while (lVar149 != 2);
                        lVar193 = lVar193 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar193 != 2);
                      lVar156 = lVar156 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar156 != 2);
                    dVar214 = (((pdVar43 + lVar152 + lVar155 + (iVar104 - iVar21))[lVar46] - dVar220
                               ) * dVar212 +
                              (pdVar43[lVar152 + lVar155 + (iVar104 - iVar21)] - dVar208) * dVar235
                              + (dVar246 - (dVar201 + 0.5) * dVar233)) - dVar246;
                    if (dVar214 <= 1e-13) {
                      dVar243 = 1.0;
                      if ((dVar214 < -1e-13) &&
                         (dVar243 = (dVar244 - dVar246) / dVar214, 1.0 <= dVar243)) {
                        dVar243 = 1.0;
                      }
                    }
                    else {
                      dVar243 = (dVar243 - dVar246) / dVar214;
                      if (1.0 <= dVar243) {
                        dVar243 = 1.0;
                      }
                    }
                    if (dVar238 <= dVar243) {
                      dVar243 = dVar238;
                    }
                  }
                  dVar238 = dVar243;
                  if ((uVar29 >> 0x1b & 1) != 0) {
                    iVar142 = 0;
                    dVar238 = dVar246;
                    dVar244 = dVar246;
                    bVar197 = true;
                    do {
                      bVar189 = bVar197;
                      iVar151 = iVar142 * 9 + 0xe;
                      lVar156 = -1;
                      do {
                        lVar193 = 0;
                        do {
                          if (((int)lVar193 != 1 || ((int)lVar156 != 0 || iVar142 != 0)) &&
                             ((1 << ((char)iVar151 + (char)lVar193 & 0x1fU) & uVar29) != 0)) {
                            dVar214 = pdVar39[lVar40 + (iVar172 + iVar142) * lVar38 +
                                                       (iVar132 + (int)lVar156) * lVar37 +
                                                       (long)(iVar97 + (int)lVar193)];
                            dVar213 = dVar214;
                            if (dVar214 <= dVar238) {
                              dVar213 = dVar238;
                            }
                            dVar238 = dVar213;
                            if (dVar214 < dVar244) {
                              dVar244 = dVar214;
                            }
                          }
                          lVar193 = lVar193 + 1;
                        } while (lVar193 != 3);
                        lVar156 = lVar156 + 1;
                        iVar151 = iVar151 + 3;
                      } while (lVar156 != 2);
                      iVar142 = 1;
                      bVar197 = false;
                    } while (bVar189);
                    dVar214 = ((0.5 - dVar220) * dVar212 +
                              ((pdVar53 + lVar109 + lVar160 + (iVar104 - iVar178))[lVar54] - dVar208
                              ) * dVar235 +
                              (pdVar53[lVar109 + lVar160 + (iVar104 - iVar178)] - dVar201) * dVar233
                              + dVar246) - dVar246;
                    if (dVar214 <= 1e-13) {
                      dVar238 = 1.0;
                      if ((dVar214 < -1e-13) &&
                         (dVar238 = (dVar244 - dVar246) / dVar214, 1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = (dVar238 - dVar246) / dVar214;
                      if (1.0 <= dVar238) {
                        dVar238 = 1.0;
                      }
                    }
                    if (dVar243 <= dVar238) {
                      dVar238 = dVar243;
                    }
                  }
                  dVar243 = dVar238;
                  if ((uVar29 >> 9 & 1) != 0) {
                    cVar171 = '\x05';
                    lVar156 = -1;
                    dVar244 = dVar246;
                    dVar243 = dVar246;
                    do {
                      lVar193 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar149 = 0;
                        do {
                          if (((int)lVar149 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                             ((1 << (cVar183 + (char)lVar149 & 0x1fU) & uVar29) != 0)) {
                            dVar214 = pdVar39[lVar40 + (iVar172 + (int)lVar156) * lVar38 +
                                                       (iVar132 + (int)lVar193) * lVar37 +
                                                       (long)(iVar97 + (int)lVar149)];
                            dVar213 = dVar214;
                            if (dVar214 <= dVar243) {
                              dVar213 = dVar243;
                            }
                            dVar243 = dVar213;
                            if (dVar214 < dVar244) {
                              dVar244 = dVar214;
                            }
                          }
                          lVar149 = lVar149 + 1;
                        } while (lVar149 != 3);
                        lVar193 = lVar193 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar193 != 2);
                      cVar171 = cVar171 + '\t';
                      bVar197 = lVar156 != 0;
                      lVar156 = lVar156 + 1;
                    } while (bVar197);
                    dVar201 = ((((pdVar53 + lVar153 + lVar160 + (iVar104 - iVar178))[lVar54] -
                                dVar208) * dVar235 +
                               (pdVar53[lVar153 + lVar160 + (iVar104 - iVar178)] - dVar201) *
                               dVar233 + dVar246) - (dVar220 + 0.5) * dVar212) - dVar246;
                    if (dVar201 <= 1e-13) {
                      dVar243 = 1.0;
                      if ((dVar201 < -1e-13) &&
                         (dVar243 = (dVar244 - dVar246) / dVar201, 1.0 <= dVar243)) {
                        dVar243 = 1.0;
                      }
                    }
                    else {
                      dVar243 = (dVar243 - dVar246) / dVar201;
                      if (1.0 <= dVar243) {
                        dVar243 = 1.0;
                      }
                    }
                    if (dVar238 <= dVar243) {
                      dVar243 = dVar238;
                    }
                  }
                  dVar201 = 0.0;
                  if (1 < iVar184) {
                    dVar201 = dVar243;
                  }
                  dVar220 = 0.0;
                  if (1 < iVar123) {
                    dVar220 = dVar243;
                  }
                  dVar238 = 0.0;
                  if (1 < iVar175) {
                    dVar238 = dVar243;
                  }
                  if ((dVar242 == 1.0) && (!NAN(dVar242))) {
                    if ((pdVar56[lVar188 + lVar110 + (int)(~uVar24 + iVar104)] == 1.0) &&
                       ((pdVar56[lVar188 + lVar110 + (iVar180 + 1)] == 1.0 &&
                        (!NAN(pdVar56[lVar188 + lVar110 + (iVar180 + 1)]))))) {
                      dVar201 = 1.0;
                    }
                    if (((pdVar56[lVar110 + lVar177 + lVar137] == 1.0) &&
                        (pdVar56[lVar110 + (iVar102 + 1) * lVar116 + lVar137] == 1.0)) &&
                       (!NAN(pdVar56[lVar110 + (iVar102 + 1) * lVar116 + lVar137]))) {
                      dVar220 = 1.0;
                    }
                    if (((pdVar56[lVar188 + lVar154 + lVar137] == 1.0) &&
                        (pdVar56[lVar188 + lVar134 + lVar137] == 1.0)) &&
                       (!NAN(pdVar56[lVar188 + lVar134 + lVar137]))) {
                      dVar238 = 1.0;
                    }
                  }
                  dVar208 = dVar245 * dVar212 * dVar238 +
                            ((dVar199 * dVar233 * dVar201 + dVar246) -
                            (dVar208 + 0.5) * dVar235 * dVar220);
                  dVar201 = dVar200;
                  if (dVar208 <= dVar200) {
                    dVar201 = dVar208;
                  }
                  dVar208 = pdVar33[lVar124 + lVar167 + lVar115];
                  dVar220 = pdVar33[lVar124 + lVar167 + lVar115 + lVar35];
                  dVar199 = pdVar33[lVar124 + lVar167 + lVar115 + lVar35 * 2];
                  uVar29 = pEVar36[lVar106 + (iVar99 - iVar19) * lVar41 + lVar113].flag;
                  lVar115 = -1;
                  cVar171 = '\x05';
                  lVar113 = 0;
                  do {
                    lVar157 = -1;
                    lVar156 = lVar186;
                    lVar193 = lVar144;
                    lVar149 = lVar194;
                    cVar183 = cVar171;
                    do {
                      iVar184 = (int)lVar113;
                      ppdVar141 = &local_398.u.p + (long)iVar184 * 3;
                      lVar113 = 0;
                      do {
                        iVar142 = (int)lVar113 + -1;
                        if ((((int)lVar157 == 0 && (int)lVar115 == 0) && iVar142 == 0) ||
                           ((1 << (cVar183 + (char)lVar113 & 0x1fU) & uVar29) == 0)) {
                          *ppdVar141 = (double *)0x0;
                          ppdVar141[1] = (double *)0x0;
                          ppdVar141[2] = (double *)0x0;
                        }
                        else {
                          dVar245 = (*(double *)(lVar149 + lVar113 * 8) + (double)(int)lVar157) -
                                    dVar220;
                          auVar59._8_4_ = SUB84(dVar245,0);
                          auVar59._0_8_ =
                               (*(double *)(lVar193 + lVar113 * 8) + (double)iVar142) - dVar208;
                          auVar59._12_4_ = (int)((ulong)dVar245 >> 0x20);
                          *(undefined1 (*) [16])ppdVar141 = auVar59;
                          ppdVar141[2] = (double *)
                                         ((*(double *)(lVar156 + lVar113 * 8) + (double)(int)lVar115
                                          ) - dVar199);
                        }
                        lVar113 = lVar113 + 1;
                        ppdVar141 = ppdVar141 + 3;
                      } while (lVar113 != 3);
                      lVar157 = lVar157 + 1;
                      lVar193 = lVar193 + lVar55 * 8;
                      lVar149 = lVar149 + lVar2;
                      lVar156 = lVar156 + lVar2;
                      cVar183 = cVar183 + '\x03';
                      lVar113 = (long)iVar184 + 3;
                    } while (lVar157 != 2);
                    lVar115 = lVar115 + 1;
                    lVar144 = lVar144 + lVar57 * 8;
                    lVar194 = lVar194 + lVar138;
                    lVar186 = lVar186 + lVar138;
                    cVar171 = cVar171 + '\t';
                    lVar113 = (long)iVar184 + 3;
                  } while (lVar115 != 2);
                  dVar245 = dVar236;
                  if (dVar236 <= dVar201) {
                    dVar245 = dVar201;
                  }
                  lVar113 = -1;
                  cVar171 = '\x05';
                  lVar144 = 0;
                  do {
                    lVar194 = -1;
                    cVar183 = cVar171;
                    do {
                      iVar184 = (int)lVar144;
                      lVar144 = 0;
                      do {
                        dVar201 = 0.0;
                        if (((int)lVar144 != 1 || ((int)lVar194 != 0 || (int)lVar113 != 0)) &&
                           ((1 << (cVar183 + (char)lVar144 & 0x1fU) & uVar29) != 0)) {
                          dVar201 = pdVar39[lVar40 + (iVar172 + (int)lVar113) * lVar38 +
                                                     (iVar101 + (int)lVar194) * lVar37 +
                                                     (long)(iVar97 + (int)lVar144)] - dVar3;
                        }
                        adStack_108[iVar184 + lVar144] = dVar201;
                        lVar144 = lVar144 + 1;
                      } while (lVar144 != 3);
                      lVar194 = lVar194 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar144 = (long)iVar184 + 3;
                    } while (lVar194 != 2);
                    lVar113 = lVar113 + 1;
                    cVar171 = cVar171 + '\t';
                    lVar144 = (long)iVar184 + 3;
                  } while (lVar113 != 2);
                  dVar201 = 0.0;
                  dVar212 = 0.0;
                  dVar238 = 0.0;
                  pLVar119 = &local_398.u.kstride;
                  lVar113 = 0;
                  dVar243 = 0.0;
                  dVar244 = 0.0;
                  dVar233 = 0.0;
                  dVar235 = 0.0;
                  dVar214 = 0.0;
                  dVar213 = 0.0;
                  do {
                    pdVar161 = ((Array4<double> *)(pLVar119 + -2))->p;
                    dVar228 = (double)pLVar119[-1];
                    dVar222 = (double)*pLVar119;
                    dVar225 = adStack_108[lVar113];
                    dVar214 = dVar214 + (double)pdVar161 * dVar222;
                    dVar213 = dVar213 + dVar228 * dVar228;
                    dVar238 = dVar238 + dVar222 * dVar222;
                    dVar233 = dVar233 + (double)pdVar161 * (double)pdVar161;
                    dVar235 = dVar235 + dVar225 * (double)pdVar161;
                    dVar201 = dVar201 + dVar228 * (double)pdVar161;
                    dVar212 = dVar212 + dVar225 * dVar228;
                    dVar243 = dVar243 + dVar225 * dVar222;
                    dVar244 = dVar244 + dVar222 * dVar228;
                    lVar113 = lVar113 + 1;
                    pLVar119 = pLVar119 + 3;
                  } while (lVar113 != 0x1b);
                  dVar222 = dVar201 * dVar238 - dVar214 * dVar244;
                  dVar225 = dVar201 * dVar244 + -dVar213 * dVar214;
                  dVar228 = dVar238 * dVar212 - dVar243 * dVar244;
                  dVar238 = dVar238 * dVar213 - dVar244 * dVar244;
                  dVar237 = dVar201 * dVar243 - dVar214 * dVar212;
                  auVar206._0_8_ = dVar214 * dVar237 + (dVar233 * dVar228 - dVar222 * dVar235);
                  auVar206._8_8_ =
                       dVar214 * (dVar212 * dVar244 - dVar243 * dVar213) +
                       (dVar235 * dVar238 - dVar228 * dVar201);
                  dVar238 = dVar225 * dVar214 + (dVar238 * dVar233 - dVar201 * dVar222);
                  auVar211._8_8_ = dVar238;
                  auVar211._0_8_ = dVar238;
                  auVar207 = divpd(auVar206,auVar211);
                  uVar198 = auVar207._0_8_;
                  dVar238 = (dVar225 * dVar235 +
                            ((dVar213 * dVar243 + -dVar212 * dVar244) * dVar233 - dVar201 * dVar237)
                            ) / dVar238;
                  dVar201 = pdVar56[lVar177 + lVar110 + lVar137];
                  if ((dVar201 == 1.0) && (!NAN(dVar201))) {
                    uVar215 = auVar207._8_8_;
                    if ((pdVar56[lVar177 + lVar110 + (int)((iVar104 + -1) - uVar24)] == 1.0) &&
                       (!NAN(pdVar56[lVar177 + lVar110 + (int)((iVar104 + -1) - uVar24)]))) {
                      if ((pdVar56[lVar177 + lVar110 + (int)((iVar104 + 1) - uVar24)] == 1.0) &&
                         (!NAN(pdVar56[lVar177 + lVar110 + (int)((iVar104 + 1) - uVar24)]))) {
                        dVar212 = dVar3 - pdVar39[lVar173 + lVar111 + lVar40 + ((iVar104 + -1) -
                                                                               iVar12)];
                        dVar233 = pdVar39[lVar173 + lVar111 + lVar40 + ((iVar104 + 1) - iVar12)] -
                                  dVar3;
                        dVar212 = dVar212 + dVar212;
                        dVar233 = dVar233 + dVar233;
                        dVar235 = (pdVar39[lVar173 + lVar111 + lVar40 + ((iVar104 + 1) - iVar12)] -
                                  pdVar39[lVar173 + lVar111 + lVar40 + ((iVar104 + -1) - iVar12)]) *
                                  0.5;
                        dVar244 = ABS(dVar212);
                        uVar215 = -(ulong)(0.0 < dVar235);
                        dVar235 = ABS(dVar235);
                        dVar243 = ABS(dVar233);
                        if (dVar244 <= dVar235) {
                          dVar235 = dVar244;
                        }
                        if (dVar235 <= dVar243) {
                          dVar243 = dVar235;
                        }
                        uVar216 = -(ulong)(0.0 < dVar212 * dVar233) & (ulong)dVar243;
                        uVar215 = ~uVar215 & (uVar216 ^ 0x8000000000000000) | uVar215 & uVar216;
                      }
                    }
                    if ((((pdVar56[lVar110 + ((iVar130 + -2) - iVar129) * lVar116 + lVar137] == 1.0)
                         && (!NAN(pdVar56[lVar110 + ((iVar130 + -2) - iVar129) * lVar116 + lVar137])
                            )) && (dVar242 == 1.0)) && (!NAN(dVar242))) {
                      dVar212 = dVar3 - pdVar39[lVar40 + lVar111 + (int)((iVar130 + -2) - uVar28) *
                                                                   lVar37 + lVar127];
                      dVar212 = dVar212 + dVar212;
                      dVar233 = (dVar246 - dVar3) + (dVar246 - dVar3);
                      dVar242 = (dVar246 -
                                pdVar39[lVar40 + lVar111 + (int)((iVar130 + -2) - uVar28) * lVar37 +
                                                           lVar127]) * 0.5;
                      dVar235 = ABS(dVar212);
                      uVar198 = -(ulong)(0.0 < dVar242);
                      dVar242 = ABS(dVar242);
                      dVar246 = ABS(dVar233);
                      if (dVar235 <= dVar242) {
                        dVar242 = dVar235;
                      }
                      if (dVar242 <= dVar246) {
                        dVar246 = dVar242;
                      }
                      uVar216 = -(ulong)(0.0 < dVar212 * dVar233) & (ulong)dVar246;
                      uVar198 = ~uVar198 & (uVar216 ^ 0x8000000000000000) | uVar198 & uVar216;
                    }
                    auVar207._8_8_ = uVar215;
                    auVar207._0_8_ = uVar198;
                    if (((pdVar56[lVar177 + lVar137 + lVar166] == 1.0) &&
                        (!NAN(pdVar56[lVar177 + lVar137 + lVar166]))) &&
                       ((pdVar56[lVar177 + lVar137 + lVar108] == 1.0 &&
                        (!NAN(pdVar56[lVar177 + lVar137 + lVar108]))))) {
                      dVar233 = dVar3 - pdVar39[lVar173 + lVar127 + lVar135 + lVar40];
                      dVar235 = pdVar39[lVar173 + lVar127 + lVar143 + lVar40] - dVar3;
                      dVar233 = dVar233 + dVar233;
                      dVar235 = dVar235 + dVar235;
                      dVar242 = (pdVar39[lVar173 + lVar127 + lVar143 + lVar40] -
                                pdVar39[lVar173 + lVar127 + lVar135 + lVar40]) * 0.5;
                      dVar212 = ABS(dVar233);
                      uVar198 = -(ulong)(0.0 < dVar242);
                      dVar242 = ABS(dVar242);
                      dVar246 = ABS(dVar235);
                      if (dVar212 <= dVar242) {
                        dVar242 = dVar212;
                      }
                      if (dVar242 <= dVar246) {
                        dVar246 = dVar242;
                      }
                      uVar215 = -(ulong)(0.0 < dVar233 * dVar235) & (ulong)dVar246;
                      dVar238 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                        uVar198 & uVar215);
                    }
                  }
                  dVar234 = dVar234 - dVar208;
                  dVar248 = dVar248 - dVar199;
                  iVar123 = 0;
                  iVar184 = 0;
                  iVar175 = 0;
                  iVar142 = 0;
                  uVar165 = 0xffffffff;
                  do {
                    uVar121 = uVar165 + 1;
                    iVar151 = iVar123;
                    uVar150 = 0xffffffff;
                    do {
                      uVar103 = uVar150 + 1;
                      iVar185 = 5;
                      do {
                        if (((uVar29 >> (iVar151 + iVar185 & 0x1fU) & 1) != 0) &&
                           ((iVar185 != 6 || uVar150 != 0) || uVar165 != 0)) {
                          iVar184 = iVar184 + (uint)((iVar185 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar150 == 0 && uVar165 == 0));
                          iVar175 = iVar175 + (uint)((iVar185 == 6 && uVar165 == 0) &&
                                                    (uVar103 & 0xfffffffd) == 0);
                          iVar142 = iVar142 + (uint)((iVar185 == 6 && uVar150 == 0) &&
                                                    (uVar121 & 0xfffffffd) == 0);
                        }
                        iVar185 = iVar185 + 1;
                      } while (iVar185 != 8);
                      iVar151 = iVar151 + 3;
                      uVar150 = uVar103;
                    } while (uVar103 != 2);
                    iVar123 = iVar123 + 9;
                    uVar165 = uVar121;
                  } while (uVar121 != 2);
                  dVar242 = auVar207._0_8_;
                  dVar212 = auVar207._8_8_;
                  dVar246 = 2.0;
                  if ((uVar29 >> 0x15 & 1) != 0) {
                    lVar113 = -1;
                    cVar171 = '\b';
                    auVar247._8_8_ = 0;
                    auVar247._0_8_ = (ulong)dVar3;
                    dVar233 = dVar3;
                    do {
                      iVar123 = 0;
                      bVar197 = true;
                      do {
                        bVar189 = bVar197;
                        lVar144 = 0;
                        do {
                          if (((int)lVar144 != 1 || (iVar123 != 0 || (int)lVar113 != 0)) &&
                             ((1 << ((char)lVar144 + (char)iVar123 * '\x03' + cVar171 & 0x1fU) &
                              uVar29) != 0)) {
                            dVar246 = pdVar39[lVar40 + (iVar172 + (int)lVar113) * lVar38 +
                                                       (iVar101 + iVar123) * lVar37 +
                                                       (long)(iVar97 + (int)lVar144)];
                            uVar230 = SUB84(dVar246,0);
                            uVar232 = (undefined4)((ulong)dVar246 >> 0x20);
                            if (dVar246 <= auVar247._0_8_) {
                              uVar230 = auVar247._0_4_;
                              uVar232 = auVar247._4_4_;
                            }
                            auVar247._4_4_ = uVar232;
                            auVar247._0_4_ = uVar230;
                            auVar247._8_8_ = 0;
                            if (dVar246 < dVar233) {
                              dVar233 = dVar246;
                            }
                          }
                          lVar144 = lVar144 + 1;
                        } while (lVar144 != 3);
                        iVar123 = 1;
                        bVar197 = false;
                      } while (bVar189);
                      lVar113 = lVar113 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar113 != 2);
                    dVar235 = (dVar248 * dVar238 +
                              (0.5 - dVar220) * dVar242 + dVar234 * dVar212 + dVar3) - dVar3;
                    if (dVar235 <= 1e-13) {
                      dVar246 = 1.0;
                      if ((dVar235 < -1e-13) &&
                         (dVar246 = (dVar233 - dVar3) / dVar235, 1.0 <= dVar246)) {
                        dVar246 = 1.0;
                      }
                    }
                    else {
                      dVar246 = (auVar247._0_8_ - dVar3) / dVar235;
                      if (1.0 <= dVar246) {
                        dVar246 = 1.0;
                      }
                    }
                    if (2.0 <= dVar246) {
                      dVar246 = 2.0;
                    }
                  }
                  dVar233 = dVar246;
                  if ((short)uVar29 < 0) {
                    lVar113 = -1;
                    cVar171 = '\x05';
                    auVar219._8_8_ = 0;
                    auVar219._0_8_ = (ulong)dVar3;
                    dVar235 = dVar3;
                    do {
                      lVar144 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar194 = 0;
                        do {
                          if (((int)lVar194 != 1 || ((int)lVar144 != 0 || (int)lVar113 != 0)) &&
                             ((1 << (cVar183 + (char)lVar194 & 0x1fU) & uVar29) != 0)) {
                            dVar233 = pdVar39[lVar40 + (iVar172 + (int)lVar113) * lVar38 +
                                                       (iVar101 + (int)lVar144) * lVar37 +
                                                       (long)(iVar97 + (int)lVar194)];
                            uVar230 = SUB84(dVar233,0);
                            uVar232 = (undefined4)((ulong)dVar233 >> 0x20);
                            if (dVar233 <= auVar219._0_8_) {
                              uVar230 = auVar219._0_4_;
                              uVar232 = auVar219._4_4_;
                            }
                            auVar219._4_4_ = uVar232;
                            auVar219._0_4_ = uVar230;
                            auVar219._8_8_ = 0;
                            if (dVar233 < dVar235) {
                              dVar235 = dVar233;
                            }
                          }
                          lVar194 = lVar194 + 1;
                        } while (lVar194 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar197 = lVar144 != 0;
                        lVar144 = lVar144 + 1;
                      } while (bVar197);
                      lVar113 = lVar113 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar113 != 2);
                    dVar243 = (((pdVar47 + lVar107 + (iVar99 - iVar27) * lVar48 + lVar114)[lVar50] -
                               dVar199) * dVar238 +
                              -(dVar220 + 0.5) * dVar242 +
                              (pdVar47[lVar107 + (iVar99 - iVar27) * lVar48 + lVar114] - dVar208) *
                              dVar212 + dVar3) - dVar3;
                    if (dVar243 <= 1e-13) {
                      dVar233 = 1.0;
                      if ((dVar243 < -1e-13) &&
                         (dVar233 = (dVar235 - dVar3) / dVar243, 1.0 <= dVar233)) {
                        dVar233 = 1.0;
                      }
                    }
                    else {
                      dVar233 = (auVar219._0_8_ - dVar3) / dVar243;
                      if (1.0 <= dVar233) {
                        dVar233 = 1.0;
                      }
                    }
                    if (dVar246 <= dVar233) {
                      dVar233 = dVar246;
                    }
                  }
                  dVar246 = dVar233;
                  if ((uVar29 >> 0x13 & 1) != 0) {
                    dVar235 = pdVar39[lVar173 + lVar127 + lVar111 + lVar40];
                    lVar113 = -1;
                    dVar243 = dVar235;
                    dVar246 = dVar235;
                    do {
                      lVar144 = -1;
                      do {
                        iVar123 = 0;
                        bVar197 = true;
                        do {
                          bVar189 = bVar197;
                          if ((((int)lVar144 != 0 || (int)lVar113 != 0) || iVar123 != 0) &&
                             ((1 << ((char)lVar144 * '\x03' + (char)lVar113 * '\t' + '\x12' +
                                     (char)iVar123 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar39[lVar40 + (iVar172 + (int)lVar113) * lVar38 +
                                                       (iVar101 + (int)lVar144) * lVar37 +
                                                       (long)(iVar123 + iVar100)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar246) {
                              dVar214 = dVar246;
                            }
                            dVar246 = dVar214;
                            if (dVar244 < dVar243) {
                              dVar243 = dVar244;
                            }
                          }
                          iVar123 = 1;
                          bVar197 = false;
                        } while (bVar189);
                        lVar144 = lVar144 + 1;
                      } while (lVar144 != 2);
                      lVar113 = lVar113 + 1;
                    } while (lVar113 != 2);
                    dVar244 = (((pdVar43 + lVar152 + lVar126 + ((iVar104 - iVar21) + 1))[lVar46] -
                               dVar199) * dVar238 +
                              (pdVar43[lVar152 + lVar126 + ((iVar104 - iVar21) + 1)] - dVar220) *
                              dVar242 + (0.5 - dVar208) * dVar212 + dVar235) - dVar235;
                    if (dVar244 <= 1e-13) {
                      dVar246 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar246 = (dVar243 - dVar235) / dVar244, 1.0 <= dVar246)) {
                        dVar246 = 1.0;
                      }
                    }
                    else {
                      dVar246 = (dVar246 - dVar235) / dVar244;
                      if (1.0 <= dVar246) {
                        dVar246 = 1.0;
                      }
                    }
                    if (dVar233 <= dVar246) {
                      dVar246 = dVar233;
                    }
                  }
                  dVar233 = dVar246;
                  if ((uVar29 >> 0x11 & 1) != 0) {
                    dVar235 = pdVar39[lVar173 + lVar127 + lVar111 + lVar40];
                    lVar113 = -1;
                    cVar171 = '\x05';
                    dVar243 = dVar235;
                    dVar233 = dVar235;
                    do {
                      lVar144 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar194 = 0;
                        do {
                          if (((int)lVar194 != 1 || ((int)lVar144 != 0 || (int)lVar113 != 0)) &&
                             ((1 << (cVar183 + (char)lVar194 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar39[lVar40 + (iVar172 + (int)lVar113) * lVar38 +
                                                       (iVar101 + (int)lVar144) * lVar37 +
                                                       (long)(iVar97 + (int)lVar194)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar233) {
                              dVar214 = dVar233;
                            }
                            dVar233 = dVar214;
                            if (dVar244 < dVar243) {
                              dVar243 = dVar244;
                            }
                          }
                          lVar194 = lVar194 + 1;
                        } while (lVar194 != 2);
                        lVar144 = lVar144 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar144 != 2);
                      lVar113 = lVar113 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar113 != 2);
                    dVar244 = (((pdVar43 + lVar152 + lVar126 + (iVar104 - iVar21))[lVar46] - dVar199
                               ) * dVar238 +
                              (pdVar43[lVar152 + lVar126 + (iVar104 - iVar21)] - dVar220) * dVar242
                              + (dVar235 - (dVar208 + 0.5) * dVar212)) - dVar235;
                    if (dVar244 <= 1e-13) {
                      dVar233 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar233 = (dVar243 - dVar235) / dVar244, 1.0 <= dVar233)) {
                        dVar233 = 1.0;
                      }
                    }
                    else {
                      dVar233 = (dVar233 - dVar235) / dVar244;
                      if (1.0 <= dVar233) {
                        dVar233 = 1.0;
                      }
                    }
                    if (dVar246 <= dVar233) {
                      dVar233 = dVar246;
                    }
                  }
                  dVar246 = dVar233;
                  if ((uVar29 >> 0x1b & 1) != 0) {
                    dVar235 = pdVar39[lVar173 + lVar127 + lVar111 + lVar40];
                    iVar100 = 0;
                    dVar246 = dVar235;
                    dVar243 = dVar235;
                    bVar197 = true;
                    do {
                      bVar189 = bVar197;
                      iVar123 = iVar100 * 9 + 0xe;
                      lVar113 = -1;
                      do {
                        lVar144 = 0;
                        do {
                          if (((int)lVar144 != 1 || ((int)lVar113 != 0 || iVar100 != 0)) &&
                             ((1 << ((char)iVar123 + (char)lVar144 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar39[lVar40 + (iVar172 + iVar100) * lVar38 +
                                                       (iVar101 + (int)lVar113) * lVar37 +
                                                       (long)(iVar97 + (int)lVar144)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar246) {
                              dVar214 = dVar246;
                            }
                            dVar246 = dVar214;
                            if (dVar244 < dVar243) {
                              dVar243 = dVar244;
                            }
                          }
                          lVar144 = lVar144 + 1;
                        } while (lVar144 != 3);
                        lVar113 = lVar113 + 1;
                        iVar123 = iVar123 + 3;
                      } while (lVar113 != 2);
                      iVar100 = 1;
                      bVar197 = false;
                    } while (bVar189);
                    dVar244 = ((0.5 - dVar199) * dVar238 +
                              ((pdVar53 + lVar109 + lVar136 + (iVar104 - iVar178))[lVar54] - dVar220
                              ) * dVar242 +
                              (pdVar53[lVar109 + lVar136 + (iVar104 - iVar178)] - dVar208) * dVar212
                              + dVar235) - dVar235;
                    if (dVar244 <= 1e-13) {
                      dVar246 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar246 = (dVar243 - dVar235) / dVar244, 1.0 <= dVar246)) {
                        dVar246 = 1.0;
                      }
                    }
                    else {
                      dVar246 = (dVar246 - dVar235) / dVar244;
                      if (1.0 <= dVar246) {
                        dVar246 = 1.0;
                      }
                    }
                    if (dVar233 <= dVar246) {
                      dVar246 = dVar233;
                    }
                  }
                  dVar233 = dVar246;
                  if ((uVar29 >> 9 & 1) != 0) {
                    dVar235 = pdVar39[lVar173 + lVar127 + lVar111 + lVar40];
                    cVar171 = '\x05';
                    auVar240._8_8_ = 0;
                    auVar240._0_8_ = (ulong)dVar235;
                    lVar113 = -1;
                    dVar243 = dVar235;
                    do {
                      lVar144 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar194 = 0;
                        do {
                          if (((int)lVar194 != 1 || ((int)lVar144 != 0 || (int)lVar113 != 0)) &&
                             ((1 << (cVar183 + (char)lVar194 & 0x1fU) & uVar29) != 0)) {
                            dVar233 = pdVar39[lVar40 + (iVar172 + (int)lVar113) * lVar38 +
                                                       (iVar101 + (int)lVar144) * lVar37 +
                                                       (long)(iVar97 + (int)lVar194)];
                            uVar230 = SUB84(dVar233,0);
                            uVar232 = (undefined4)((ulong)dVar233 >> 0x20);
                            if (dVar233 <= auVar240._0_8_) {
                              uVar230 = auVar240._0_4_;
                              uVar232 = auVar240._4_4_;
                            }
                            if (dVar233 < dVar243) {
                              dVar243 = dVar233;
                            }
                            auVar240._4_4_ = uVar232;
                            auVar240._0_4_ = uVar230;
                            auVar240._8_8_ = 0;
                          }
                          lVar194 = lVar194 + 1;
                        } while (lVar194 != 3);
                        lVar144 = lVar144 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar144 != 2);
                      cVar171 = cVar171 + '\t';
                      bVar197 = lVar113 != 0;
                      lVar113 = lVar113 + 1;
                    } while (bVar197);
                    dVar208 = ((((pdVar53 + lVar153 + lVar136 + (iVar104 - iVar178))[lVar54] -
                                dVar220) * dVar242 +
                               (pdVar53[lVar153 + lVar136 + (iVar104 - iVar178)] - dVar208) *
                               dVar212 + dVar235) - (dVar199 + 0.5) * dVar238) - dVar235;
                    if (dVar208 <= 1e-13) {
                      dVar233 = 1.0;
                      if ((dVar208 < -1e-13) &&
                         (dVar233 = (dVar243 - dVar235) / dVar208, 1.0 <= dVar233)) {
                        dVar233 = 1.0;
                      }
                    }
                    else {
                      dVar233 = (auVar240._0_8_ - dVar235) / dVar208;
                      if (1.0 <= dVar233) {
                        dVar233 = 1.0;
                      }
                    }
                    if (dVar246 <= dVar233) {
                      dVar233 = dVar246;
                    }
                  }
                  dVar208 = 0.0;
                  if (1 < iVar184) {
                    dVar208 = dVar233;
                  }
                  dVar246 = 0.0;
                  if (1 < iVar175) {
                    dVar246 = dVar233;
                  }
                  dVar199 = 0.0;
                  if (1 < iVar142) {
                    dVar199 = dVar233;
                  }
                  if ((dVar201 == 1.0) && (!NAN(dVar201))) {
                    if ((pdVar56[lVar177 + lVar110 + (int)(~uVar24 + iVar104)] == 1.0) &&
                       (((!NAN(pdVar56[lVar177 + lVar110 + (int)(~uVar24 + iVar104)]) &&
                         (pdVar56[lVar177 + lVar110 + (iVar180 + 1)] == 1.0)) &&
                        (!NAN(pdVar56[lVar177 + lVar110 + (iVar180 + 1)]))))) {
                      dVar208 = 1.0;
                    }
                    if (((pdVar56[lVar110 + (iVar102 + -2) * lVar116 + lVar137] == 1.0) &&
                        (!NAN(pdVar56[lVar110 + (iVar102 + -2) * lVar116 + lVar137]))) &&
                       ((pdVar56[lVar110 + lVar188 + lVar137] == 1.0 &&
                        (!NAN(pdVar56[lVar110 + lVar188 + lVar137]))))) {
                      dVar246 = 1.0;
                    }
                    if (((pdVar56[lVar177 + lVar154 + lVar137] == 1.0) &&
                        (!NAN(pdVar56[lVar177 + lVar154 + lVar137]))) &&
                       ((pdVar56[lVar177 + lVar134 + lVar137] == 1.0 &&
                        (!NAN(pdVar56[lVar177 + lVar134 + lVar137]))))) {
                      dVar199 = 1.0;
                    }
                  }
                  dVar234 = dVar248 * dVar238 * dVar199 +
                            (0.5 - dVar220) * dVar242 * dVar246 +
                            dVar234 * dVar212 * dVar208 + dVar3;
                  if (dVar234 <= dVar200) {
                    dVar200 = dVar234;
                  }
                  if (dVar236 <= dVar200) {
                    dVar236 = dVar200;
                  }
                  iVar100 = d_bcrec[1].bc[4];
                  if (iVar148 == iVar130) {
                    iVar180 = d_bcrec[1].bc[1];
                    switch(iVar180) {
                    case 1:
                    case 2:
                    case 4:
                      dVar236 = dVar245;
                    default:
                      if (((iVar180 == 4) || (dVar234 = dVar245, iVar180 == 2)) &&
                         (dVar234 = 0.0, dVar236 = 0.0, dVar245 <= 0.0)) {
                        dVar234 = dVar245;
                        dVar236 = dVar245;
                      }
                      break;
                    case 3:
                      dVar234 = pdVar39[lVar40 + lVar111 + (int)(~uVar28 + iVar130) * lVar37 +
                                                           lVar127];
                      dVar236 = pdVar39[lVar40 + lVar111 + (int)(~uVar28 + iVar130) * lVar37 +
                                                           lVar127];
                      break;
                    case -1:
                      dVar234 = 0.0;
                      dVar236 = 0.0;
                    }
                    dVar248 = dVar236;
                    dVar245 = dVar234;
                    if (iVar5 + 1 == iVar130) goto switchD_0045c02d_caseD_0;
                  }
                  else {
                    dVar248 = dVar236;
                    if (iVar5 + 1 != iVar130) goto LAB_0045c078;
                    switch(iVar100) {
                    case 1:
                    case 2:
                    case 4:
                      dVar245 = dVar236;
                    default:
switchD_0045c02d_caseD_0:
                      if (((iVar100 == 4) || (dVar248 = dVar236, iVar100 == 2)) &&
                         (dVar248 = 0.0, dVar245 = 0.0, 0.0 <= dVar236)) {
                        dVar248 = dVar236;
                        dVar245 = dVar236;
                      }
                      break;
                    case 3:
                      dVar248 = pdVar39[lVar176 + lVar127 + lVar111 + lVar40];
                      dVar245 = dVar248;
                      break;
                    case -1:
                      dVar248 = 0.0;
                      dVar245 = 0.0;
                      goto LAB_0045c08c;
                    }
                  }
LAB_0045c078:
                  if ((0.0 <= dVar248) || (dVar234 = 0.0, dVar245 <= 0.0)) {
LAB_0045c08c:
                    dVar201 = (dVar245 + dVar248) * 0.5;
                    dVar234 = dVar248;
                    if ((dVar201 < 1e-08) && (dVar234 = 0.0, dVar201 <= -1e-08)) {
                      dVar234 = dVar245;
                    }
                  }
                }
                pdVar31[(lVar112 - iVar187) * lVar34 +
                        ((long)iVar130 - (long)iVar11) * lVar32 + (lVar168 - iVar10)] = dVar234;
                iVar105 = iVar105 + 1;
                iVar97 = iVar97 + 1;
                bVar197 = iVar104 != iVar16;
                iVar104 = iVar104 + 1;
              } while (bVar197);
            }
            bVar197 = iVar130 != iVar8;
            iVar130 = iVar130 + 1;
          } while (bVar197);
        }
        bVar197 = iVar9 != iVar147;
        iVar9 = iVar9 + 1;
      } while (bVar197);
    }
  }
  pBVar30 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((((pBVar30[2].bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar192)) ||
       (((0xfffffffd < pBVar30[2].bc[3] - 5U && (iVar4 <= (ubx->bigend).vect[0])) ||
        ((pBVar30[2].bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar148)))))) ||
      ((0xfffffffd < pBVar30[2].bc[4] - 5U && (iVar5 <= (vbx->bigend).vect[1])))) ||
     (((pBVar30[2].bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar6)) ||
      (iVar8 = (wbx->bigend).vect[2], iVar7 <= iVar8 && 0xfffffffd < pBVar30[2].bc[5] - 5U)))) {
    local_398.u.p = w->p;
    local_398.u.jstride = w->jstride;
    local_398.u.kstride = w->kstride;
    local_398.u.nstride = w->nstride;
    local_398.u.begin.x = (w->begin).x;
    local_398.u.begin.y = (w->begin).y;
    uVar64 = *(undefined8 *)&(w->begin).z;
    uVar85 = (w->end).y;
    local_398.u._52_8_ = *(undefined8 *)&(w->end).z;
    iVar8 = (wbx->smallend).vect[0];
    iVar9 = (wbx->smallend).vect[1];
    iVar147 = (wbx->smallend).vect[2];
    iVar10 = (wbx->bigend).vect[0];
    iVar11 = (wbx->bigend).vect[1];
    iVar187 = (wbx->bigend).vect[2];
    local_398.u.begin.z = (int)uVar64;
    local_398.u.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.vcc.p = vcc->p;
    local_398.vcc.jstride = vcc->jstride;
    local_398.vcc.kstride = vcc->kstride;
    local_398.vcc.nstride = vcc->nstride;
    local_398.vcc.begin.x = (vcc->begin).x;
    local_398.vcc.begin.y = (vcc->begin).y;
    uVar64 = *(undefined8 *)&(vcc->begin).z;
    uVar86 = (vcc->end).y;
    local_398.vcc._52_8_ = *(undefined8 *)&(vcc->end).z;
    local_398.vcc.begin.z = (int)uVar64;
    local_398.vcc.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.flag.p = flag->p;
    local_398.flag.jstride = flag->jstride;
    local_398.flag.kstride = flag->kstride;
    local_398.flag.nstride = flag->nstride;
    local_398.flag.begin.x = (flag->begin).x;
    local_398.flag.begin.y = (flag->begin).y;
    uVar87 = (flag->end).x;
    uVar88 = (flag->end).y;
    local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
    local_398.ccc.p = ccc->p;
    local_398.ccc.jstride = ccc->jstride;
    local_398.ccc.kstride = ccc->kstride;
    local_398.ccc.nstride = ccc->nstride;
    local_398.ccc.begin.x = (ccc->begin).x;
    local_398.ccc.begin.y = (ccc->begin).y;
    uVar89 = (ccc->end).x;
    uVar90 = (ccc->end).y;
    local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_398.ccc.begin.z = (int)*(undefined8 *)&(ccc->begin).z;
    local_398.vfrac.p = vfrac->p;
    local_398.vfrac.jstride = vfrac->jstride;
    local_398.vfrac.kstride = vfrac->kstride;
    local_398.vfrac.nstride = vfrac->nstride;
    local_398.vfrac.begin.x = (vfrac->begin).x;
    local_398.vfrac.begin.y = (vfrac->begin).y;
    uVar91 = (vfrac->end).x;
    uVar92 = (vfrac->end).y;
    local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
    local_398.fcx.p = fcx->p;
    local_398.fcx.jstride = fcx->jstride;
    local_398.fcx.kstride = fcx->kstride;
    local_398.fcx.nstride = fcx->nstride;
    local_398.fcx.begin.x = (fcx->begin).x;
    local_398.fcx.begin.y = (fcx->begin).y;
    uVar64 = *(undefined8 *)&(fcx->begin).z;
    uVar93 = (fcx->end).y;
    local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_398.fcx.begin.z = (int)uVar64;
    local_398.fcx.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.fcy.p = fcy->p;
    local_398.fcy.jstride = fcy->jstride;
    local_398.fcy.kstride = fcy->kstride;
    local_398.fcy.nstride = fcy->nstride;
    local_398.fcy.begin.x = (fcy->begin).x;
    local_398.fcy.begin.y = (fcy->begin).y;
    uVar64 = *(undefined8 *)&(fcy->begin).z;
    uVar94 = (fcy->end).y;
    local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_398.fcy.begin.z = (int)uVar64;
    local_398.fcy.end.x = (int)((ulong)uVar64 >> 0x20);
    local_398.fcz.p = fcz->p;
    local_398.fcz.jstride = fcz->jstride;
    local_398.fcz.kstride = fcz->kstride;
    local_398.fcz.nstride = fcz->nstride;
    local_398.fcz.begin.x = (fcz->begin).x;
    local_398.fcz.begin.y = (fcz->begin).y;
    uVar95 = (fcz->end).x;
    uVar96 = (fcz->end).y;
    local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
    local_398.order = 2;
    if (iVar147 <= iVar187) {
      local_398.u.end.y = uVar85;
      local_398.vcc.end.y = uVar86;
      local_398.flag.end.x = uVar87;
      local_398.flag.end.y = uVar88;
      local_398.ccc.end.x = uVar89;
      local_398.ccc.end.y = uVar90;
      local_398.vfrac.end.x = uVar91;
      local_398.vfrac.end.y = uVar92;
      local_398.d_bcrec = d_bcrec;
      local_398.fcx.end.y = uVar93;
      local_398.fcy.end.y = uVar94;
      local_398.fcz.end.x = uVar95;
      local_398.fcz.end.y = uVar96;
      local_398.domain_ilo = iVar192;
      local_398.domain_jlo = iVar4;
      local_398.domain_klo = iVar148;
      local_398.domain_ihi = iVar5;
      local_398.domain_jhi = iVar6;
      local_398.domain_khi = iVar7;
      do {
        iVar192 = iVar9;
        if (iVar9 <= iVar11) {
          do {
            iVar148 = iVar8;
            if (iVar8 <= iVar10) {
              do {
                ExtrapVelToFacesBox::anon_class_552_16_a6c64e1e::operator()
                          ((anon_class_552_16_a6c64e1e *)&local_398,iVar148,iVar192,iVar147);
                iVar148 = iVar148 + 1;
              } while (iVar10 + 1 != iVar148);
            }
            bVar197 = iVar192 != iVar11;
            iVar192 = iVar192 + 1;
          } while (bVar197);
        }
        bVar197 = iVar147 != iVar187;
        iVar147 = iVar147 + 1;
      } while (bVar197);
    }
  }
  else {
    iVar192 = (wbx->smallend).vect[2];
    if (iVar192 <= iVar8) {
      pdVar31 = ccc->p;
      lVar32 = ccc->nstride;
      iVar148 = (ccc->begin).x;
      lVar133 = (long)iVar148;
      iVar4 = (wbx->smallend).vect[0];
      iVar5 = (wbx->smallend).vect[1];
      iVar9 = (wbx->bigend).vect[0];
      iVar147 = (wbx->bigend).vect[1];
      pdVar33 = w->p;
      lVar34 = w->jstride;
      lVar35 = w->kstride;
      iVar10 = (w->begin).x;
      iVar11 = (w->begin).y;
      iVar187 = (w->begin).z;
      pEVar36 = flag->p;
      lVar37 = flag->jstride;
      lVar38 = flag->kstride;
      iVar190 = (flag->begin).x;
      iVar191 = (flag->begin).y;
      iVar12 = (flag->begin).z;
      pdVar39 = fcx->p;
      lVar40 = fcx->jstride;
      lVar41 = fcx->kstride;
      lVar42 = fcx->nstride;
      iVar13 = (fcx->begin).x;
      iVar14 = (fcx->begin).y;
      iVar15 = (fcx->begin).z;
      pdVar43 = fcy->p;
      lVar44 = fcy->jstride;
      lVar45 = fcy->kstride;
      lVar46 = fcy->nstride;
      iVar16 = (fcy->begin).x;
      iVar17 = (fcy->begin).y;
      iVar18 = (fcy->begin).z;
      pdVar47 = fcz->p;
      lVar48 = fcz->jstride;
      lVar49 = fcz->kstride;
      lVar50 = fcz->nstride;
      iVar19 = (fcz->begin).x;
      iVar20 = (fcz->begin).y;
      iVar21 = (fcz->begin).z;
      lVar51 = ccc->jstride;
      lVar52 = ccc->kstride;
      iVar22 = (ccc->begin).y;
      iVar23 = (ccc->begin).z;
      pdVar53 = vfrac->p;
      lVar54 = vfrac->jstride;
      lVar55 = vfrac->kstride;
      uVar24 = (vfrac->begin).x;
      uVar25 = (vfrac->begin).y;
      iVar26 = (vfrac->begin).z;
      pdVar56 = vcc->p;
      lVar57 = vcc->jstride;
      lVar116 = vcc->kstride;
      iVar27 = (vcc->begin).x;
      iVar122 = (vcc->begin).y;
      uVar28 = (vcc->begin).z;
      lVar117 = vcc->nstride;
      lVar138 = lVar52 * 8;
      lVar2 = lVar51 * 8;
      do {
        if (iVar5 <= iVar147) {
          iVar120 = iVar192 - iVar21;
          iVar128 = iVar192 + -1;
          iVar129 = iVar128 - uVar28;
          lVar134 = iVar129 * lVar116;
          iVar130 = iVar192 - uVar28;
          lVar135 = iVar130 * lVar116;
          iVar131 = iVar192 - iVar26;
          lVar143 = lVar55 * iVar131;
          lVar152 = (iVar128 - iVar26) * lVar55;
          lVar153 = (iVar192 - iVar18) * lVar45;
          lVar154 = (iVar192 - iVar15) * lVar41;
          lVar124 = ((long)iVar128 - (long)iVar23) * lVar52;
          lVar106 = (iVar128 - iVar18) * lVar45;
          lVar107 = (iVar128 - iVar15) * lVar41;
          lVar166 = ((long)iVar128 + ~(long)iVar23) * lVar138;
          iVar178 = iVar5;
          do {
            if (iVar4 <= iVar9) {
              lVar176 = (long)iVar178;
              lVar108 = (lVar176 - iVar191) * lVar37;
              lVar109 = (lVar176 - iVar20) * lVar48;
              iVar97 = iVar178 - iVar22;
              lVar110 = iVar97 * lVar51;
              iVar98 = iVar178 - iVar122;
              lVar111 = iVar98 * lVar57;
              lVar125 = lVar54 * (int)(iVar178 - uVar25);
              lVar126 = (int)((iVar178 + -1) - uVar25) * lVar54;
              lVar136 = (int)((iVar178 + 1) - uVar25) * lVar54;
              lVar155 = ((iVar178 + -1) - iVar122) * lVar57;
              lVar160 = ((iVar178 + 1) - iVar122) * lVar57;
              iVar172 = iVar178 - iVar17;
              lVar167 = (iVar172 + 1) * lVar44;
              lVar173 = iVar172 * lVar44;
              lVar188 = (lVar176 - iVar14) * lVar40;
              lVar179 = (int)(~uVar25 + iVar178) * lVar54;
              lVar112 = (int)((iVar178 - uVar25) + 1) * lVar54;
              lVar177 = (lVar176 + ~(long)iVar22) * lVar2;
              iVar104 = iVar4;
              iVar105 = (iVar4 + -1) - iVar27;
              iVar172 = (iVar4 + -1) - iVar148;
              do {
                lVar168 = (long)iVar104;
                lVar113 = lVar168 - iVar190;
                uVar29 = pEVar36[lVar108 + lVar113 + (iVar192 - iVar12) * lVar38].flag;
                dVar234 = 0.0;
                if ((uVar29 >> 9 & 1) != 0) {
                  lVar144 = (long)pdVar31 + lVar168 * 8 + lVar177 + lVar166 + lVar133 * -8 + -8;
                  lVar194 = (long)pdVar31 +
                            lVar168 * 8 + lVar177 + lVar166 + lVar32 * 8 + lVar133 * -8 + -8;
                  lVar186 = (long)pdVar31 +
                            lVar168 * 8 + lVar177 + lVar166 + lVar32 * 0x10 + lVar133 * -8 + -8;
                  lVar114 = lVar168 - iVar19;
                  pdVar161 = pdVar47 + lVar109 + lVar114 + lVar49 * iVar120;
                  dVar234 = *pdVar161;
                  dVar248 = pdVar161[lVar50];
                  lVar115 = (long)(iVar104 - iVar148);
                  pdVar169 = pdVar31 + lVar110 + lVar115 + (iVar192 - iVar23) * lVar52;
                  dVar201 = *pdVar169;
                  dVar208 = pdVar169[lVar32];
                  dVar220 = pdVar169[lVar32 * 2];
                  iVar99 = iVar104 - iVar27;
                  lVar127 = (long)iVar99;
                  dVar3 = pdVar56[lVar111 + lVar127 + lVar134 + lVar117 * 2];
                  dVar246 = pdVar56[lVar111 + lVar127 + lVar135 + lVar117 * 2];
                  lVar137 = -1;
                  cVar171 = '\x05';
                  lVar156 = 0;
                  do {
                    iVar101 = (int)lVar137;
                    lVar193 = -1;
                    cVar183 = cVar171;
                    do {
                      iVar102 = (int)lVar193;
                      iVar132 = (int)lVar156;
                      ppdVar141 = &local_398.u.p + (long)iVar132 * 3;
                      lVar156 = 0;
                      do {
                        iVar100 = (int)lVar156 + -1;
                        if (((iVar102 == 0 && iVar101 == 0) && iVar100 == 0) ||
                           ((1 << ((char)lVar156 + cVar183 & 0x1fU) & uVar29) == 0)) {
                          *ppdVar141 = (double *)0x0;
                          ppdVar141[1] = (double *)0x0;
                          ppdVar141[2] = (double *)0x0;
                        }
                        else {
                          pdVar169 = pdVar31 + ((iVar192 - iVar23) + iVar101) * lVar52 +
                                               (iVar97 + iVar102) * lVar51 +
                                               (long)(iVar172 + (int)lVar156);
                          dVar199 = pdVar169[lVar32];
                          *ppdVar141 = (double *)((*pdVar169 + (double)iVar100) - dVar201);
                          ppdVar141[1] = (double *)((dVar199 + (double)iVar102) - dVar208);
                          ppdVar141[2] = (double *)
                                         ((pdVar169[lVar32 * 2] + (double)iVar101) - dVar220);
                        }
                        lVar156 = lVar156 + 1;
                        ppdVar141 = ppdVar141 + 3;
                      } while (lVar156 != 3);
                      lVar193 = lVar193 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar156 = (long)iVar132 + 3;
                    } while (lVar193 != 2);
                    lVar137 = lVar137 + 1;
                    cVar171 = cVar171 + '\t';
                    lVar156 = (long)iVar132 + 3;
                  } while (lVar137 != 2);
                  dVar199 = dVar234 - dVar201;
                  lVar137 = -1;
                  cVar171 = '\x05';
                  lVar156 = 0;
                  do {
                    lVar193 = -1;
                    cVar183 = cVar171;
                    do {
                      iVar101 = (int)lVar156;
                      lVar156 = 0;
                      do {
                        dVar200 = 0.0;
                        if (((int)lVar156 != 1 || ((int)lVar193 != 0 || (int)lVar137 != 0)) &&
                           ((1 << (cVar183 + (char)lVar156 & 0x1fU) & uVar29) != 0)) {
                          dVar200 = pdVar56[lVar117 * 2 +
                                            (iVar130 + (int)lVar137) * lVar116 +
                                            (iVar98 + (int)lVar193) * lVar57 +
                                            (long)(iVar105 + (int)lVar156)] - dVar246;
                        }
                        adStack_108[iVar101 + lVar156] = dVar200;
                        lVar156 = lVar156 + 1;
                      } while (lVar156 != 3);
                      lVar193 = lVar193 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar156 = (long)iVar101 + 3;
                    } while (lVar193 != 2);
                    lVar137 = lVar137 + 1;
                    cVar171 = cVar171 + '\t';
                    lVar156 = (long)iVar101 + 3;
                  } while (lVar137 != 2);
                  dVar200 = dVar3;
                  if (dVar3 <= dVar246) {
                    dVar200 = dVar246;
                  }
                  dVar245 = 0.0;
                  dVar242 = 0.0;
                  dVar212 = 0.0;
                  pLVar119 = &local_398.u.kstride;
                  lVar137 = 0;
                  dVar243 = 0.0;
                  dVar244 = 0.0;
                  dVar236 = 0.0;
                  dVar238 = 0.0;
                  dVar233 = 0.0;
                  dVar235 = 0.0;
                  do {
                    pdVar169 = ((Array4<double> *)(pLVar119 + -2))->p;
                    dVar222 = (double)pLVar119[-1];
                    dVar214 = (double)*pLVar119;
                    dVar213 = adStack_108[lVar137];
                    dVar233 = dVar233 + dVar222 * (double)pLVar119[-1];
                    dVar235 = dVar235 + (double)pdVar169 * (double)*pLVar119;
                    dVar212 = dVar212 + dVar214 * dVar214;
                    dVar236 = dVar236 + dVar213 * (double)pdVar169;
                    dVar238 = dVar238 + (double)pdVar169 * (double)pdVar169;
                    dVar245 = dVar245 + dVar213 * dVar222;
                    dVar242 = dVar242 + dVar222 * (double)pdVar169;
                    dVar243 = dVar243 + dVar214 * (double)pLVar119[-1];
                    dVar244 = dVar244 + dVar213 * (double)*pLVar119;
                    lVar137 = lVar137 + 1;
                    pLVar119 = pLVar119 + 3;
                  } while (lVar137 != 0x1b);
                  dVar225 = dVar242 * dVar212 - dVar235 * dVar243;
                  dVar214 = dVar242 * dVar244 - dVar235 * dVar245;
                  dVar222 = dVar242 * dVar243 + dVar235 * -dVar233;
                  dVar213 = dVar212 * dVar233 - dVar243 * dVar243;
                  dVar212 = dVar212 * dVar245 - dVar243 * dVar244;
                  auVar202._0_8_ =
                       dVar235 * (dVar245 * dVar243 - dVar244 * dVar233) +
                       (dVar236 * dVar213 - dVar212 * dVar242);
                  auVar202._8_8_ = dVar235 * dVar214 + (dVar238 * dVar212 - dVar225 * dVar236);
                  dVar235 = dVar222 * dVar235 + (dVar213 * dVar238 - dVar225 * dVar242);
                  auVar217._8_8_ = dVar235;
                  auVar217._0_8_ = dVar235;
                  auVar203 = divpd(auVar202,auVar217);
                  dVar235 = (dVar222 * dVar236 +
                            ((dVar244 * dVar233 + -dVar245 * dVar243) * dVar238 - dVar214 * dVar242)
                            ) / dVar235;
                  iVar101 = iVar104 - uVar24;
                  lVar137 = (long)iVar101;
                  dVar245 = pdVar53[lVar125 + lVar143 + lVar137];
                  dVar242 = auVar203._0_8_;
                  dVar212 = auVar203._8_8_;
                  if ((dVar245 == 1.0) && (!NAN(dVar245))) {
                    if ((pdVar53[lVar125 + lVar143 + (int)((iVar104 + -1) - uVar24)] == 1.0) &&
                       (!NAN(pdVar53[lVar125 + lVar143 + (int)((iVar104 + -1) - uVar24)]))) {
                      if ((pdVar53[lVar125 + lVar143 + (int)((iVar104 + 1) - uVar24)] == 1.0) &&
                         (!NAN(pdVar53[lVar125 + lVar143 + (int)((iVar104 + 1) - uVar24)]))) {
                        dVar238 = dVar246 - pdVar56[lVar111 + lVar135 + lVar117 * 2 +
                                                                        (long)((iVar104 + -1) -
                                                                              iVar27)];
                        dVar243 = pdVar56[lVar111 + lVar135 + lVar117 * 2 +
                                                              (long)((iVar104 + 1) - iVar27)] -
                                  dVar246;
                        dVar238 = dVar238 + dVar238;
                        dVar243 = dVar243 + dVar243;
                        dVar233 = (pdVar56[lVar111 + lVar135 + lVar117 * 2 +
                                                               (long)((iVar104 + 1) - iVar27)] -
                                  pdVar56[lVar111 + lVar135 + lVar117 * 2 +
                                                              (long)((iVar104 + -1) - iVar27)]) *
                                  0.5;
                        dVar236 = ABS(dVar238);
                        uVar198 = -(ulong)(0.0 < dVar233);
                        dVar233 = ABS(dVar233);
                        dVar242 = ABS(dVar243);
                        if (dVar236 <= dVar233) {
                          dVar233 = dVar236;
                        }
                        if (dVar233 <= dVar242) {
                          dVar242 = dVar233;
                        }
                        uVar215 = -(ulong)(0.0 < dVar238 * dVar243) & (ulong)dVar242;
                        dVar242 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                          uVar198 & uVar215);
                      }
                    }
                    if ((((pdVar53[lVar143 + lVar126 + lVar137] == 1.0) &&
                         (!NAN(pdVar53[lVar143 + lVar126 + lVar137]))) &&
                        (pdVar53[lVar143 + lVar136 + lVar137] == 1.0)) &&
                       (!NAN(pdVar53[lVar143 + lVar136 + lVar137]))) {
                      dVar236 = dVar246 - pdVar56[lVar117 * 2 + lVar135 + lVar155 + lVar127];
                      dVar238 = pdVar56[lVar117 * 2 + lVar135 + lVar160 + lVar127] - dVar246;
                      dVar236 = dVar236 + dVar236;
                      dVar238 = dVar238 + dVar238;
                      dVar233 = (pdVar56[lVar117 * 2 + lVar135 + lVar160 + lVar127] -
                                pdVar56[lVar117 * 2 + lVar135 + lVar155 + lVar127]) * 0.5;
                      dVar243 = ABS(dVar236);
                      uVar198 = -(ulong)(0.0 < dVar233);
                      dVar233 = ABS(dVar233);
                      dVar212 = ABS(dVar238);
                      if (dVar243 <= dVar233) {
                        dVar233 = dVar243;
                      }
                      if (dVar233 <= dVar212) {
                        dVar212 = dVar233;
                      }
                      uVar215 = -(ulong)(0.0 < dVar236 * dVar238) & (ulong)dVar212;
                      dVar212 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                        uVar198 & uVar215);
                    }
                    if (((pdVar53[lVar125 + lVar137 + lVar152] == 1.0) &&
                        (!NAN(pdVar53[lVar125 + lVar137 + lVar152]))) &&
                       ((pdVar53[lVar125 + lVar137 + ((iVar192 + 1) - iVar26) * lVar55] == 1.0 &&
                        (!NAN(pdVar53[lVar125 + lVar137 + ((iVar192 + 1) - iVar26) * lVar55]))))) {
                      dVar238 = pdVar56[lVar111 + lVar127 + (int)((iVar192 + 1) - uVar28) * lVar116
                                                            + lVar117 * 2] - dVar246;
                      dVar236 = (dVar246 - dVar3) + (dVar246 - dVar3);
                      dVar238 = dVar238 + dVar238;
                      dVar235 = (pdVar56[lVar111 + lVar127 + (int)((iVar192 + 1) - uVar28) * lVar116
                                                             + lVar117 * 2] - dVar3) * 0.5;
                      dVar243 = ABS(dVar236);
                      uVar198 = -(ulong)(0.0 < dVar235);
                      dVar235 = ABS(dVar235);
                      dVar233 = ABS(dVar238);
                      if (dVar243 <= dVar235) {
                        dVar235 = dVar243;
                      }
                      if (dVar235 <= dVar233) {
                        dVar233 = dVar235;
                      }
                      uVar215 = -(ulong)(0.0 < dVar236 * dVar238) & (ulong)dVar233;
                      dVar235 = (double)(~uVar198 & (uVar215 ^ 0x8000000000000000) |
                                        uVar198 & uVar215);
                    }
                  }
                  dVar233 = dVar3;
                  if (dVar246 <= dVar3) {
                    dVar233 = dVar246;
                  }
                  dVar236 = dVar248 - dVar208;
                  iVar102 = 0;
                  iVar132 = 0;
                  iVar100 = 0;
                  iVar180 = 0;
                  uVar165 = 0xffffffff;
                  do {
                    uVar121 = uVar165 + 1;
                    uVar150 = 0xffffffff;
                    iVar184 = iVar102;
                    do {
                      uVar103 = uVar150 + 1;
                      iVar142 = 5;
                      do {
                        if (((uVar29 >> (iVar142 + iVar184 & 0x1fU) & 1) != 0) &&
                           ((iVar142 != 6 || uVar150 != 0) || uVar165 != 0)) {
                          iVar132 = iVar132 + (uint)((iVar142 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar150 == 0 && uVar165 == 0));
                          iVar100 = iVar100 + (uint)((iVar142 == 6 && uVar165 == 0) &&
                                                    (uVar103 & 0xfffffffd) == 0);
                          iVar180 = iVar180 + (uint)((iVar142 == 6 && uVar150 == 0) &&
                                                    (uVar121 & 0xfffffffd) == 0);
                        }
                        iVar142 = iVar142 + 1;
                      } while (iVar142 != 8);
                      iVar184 = iVar184 + 3;
                      uVar150 = uVar103;
                    } while (uVar103 != 2);
                    iVar102 = iVar102 + 9;
                    uVar165 = uVar121;
                  } while (uVar121 != 2);
                  dVar238 = 2.0;
                  if ((uVar29 >> 0x15 & 1) != 0) {
                    lVar156 = -1;
                    cVar171 = '\b';
                    dVar243 = dVar246;
                    dVar238 = dVar246;
                    do {
                      iVar102 = 0;
                      bVar197 = true;
                      do {
                        bVar189 = bVar197;
                        lVar193 = 0;
                        do {
                          if (((int)lVar193 != 1 || (iVar102 != 0 || (int)lVar156 != 0)) &&
                             ((1 << ((char)iVar102 * '\x03' + cVar171 + (char)lVar193 & 0x1fU) &
                              uVar29) != 0)) {
                            dVar244 = pdVar56[lVar117 * 2 +
                                              (iVar130 + (int)lVar156) * lVar116 +
                                              (iVar98 + iVar102) * lVar57 +
                                              (long)(iVar105 + (int)lVar193)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar238) {
                              dVar214 = dVar238;
                            }
                            dVar238 = dVar214;
                            if (dVar244 < dVar243) {
                              dVar243 = dVar244;
                            }
                          }
                          lVar193 = lVar193 + 1;
                        } while (lVar193 != 3);
                        iVar102 = 1;
                        bVar197 = false;
                      } while (bVar189);
                      lVar156 = lVar156 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar156 != 2);
                    dVar244 = (((pdVar43 + lVar153 + lVar167 + (iVar104 - iVar16))[lVar46] - dVar220
                               ) * dVar235 +
                              (0.5 - dVar208) * dVar212 +
                              (pdVar43[lVar153 + lVar167 + (iVar104 - iVar16)] - dVar201) * dVar242
                              + dVar246) - dVar246;
                    if (dVar244 <= 1e-13) {
                      dVar238 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar238 = (dVar243 - dVar246) / dVar244, 1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = (dVar238 - dVar246) / dVar244;
                      if (1.0 <= dVar238) {
                        dVar238 = 1.0;
                      }
                    }
                    if (2.0 <= dVar238) {
                      dVar238 = 2.0;
                    }
                  }
                  dVar243 = dVar238;
                  if ((short)uVar29 < 0) {
                    lVar156 = -1;
                    cVar171 = '\x05';
                    dVar244 = dVar246;
                    dVar243 = dVar246;
                    do {
                      lVar193 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar149 = 0;
                        do {
                          if (((int)lVar149 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                             ((1 << (cVar183 + (char)lVar149 & 0x1fU) & uVar29) != 0)) {
                            dVar214 = pdVar56[lVar117 * 2 +
                                              (iVar130 + (int)lVar156) * lVar116 +
                                              (iVar98 + (int)lVar193) * lVar57 +
                                              (long)(iVar105 + (int)lVar149)];
                            dVar213 = dVar214;
                            if (dVar214 <= dVar243) {
                              dVar213 = dVar243;
                            }
                            dVar243 = dVar213;
                            if (dVar214 < dVar244) {
                              dVar244 = dVar214;
                            }
                          }
                          lVar149 = lVar149 + 1;
                        } while (lVar149 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar197 = lVar193 != 0;
                        lVar193 = lVar193 + 1;
                      } while (bVar197);
                      lVar156 = lVar156 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar156 != 2);
                    dVar214 = (((pdVar43 + lVar153 + lVar173 + (iVar104 - iVar16))[lVar46] - dVar220
                               ) * dVar235 +
                              -(dVar208 + 0.5) * dVar212 +
                              (pdVar43[lVar153 + lVar173 + (iVar104 - iVar16)] - dVar201) * dVar242
                              + dVar246) - dVar246;
                    if (dVar214 <= 1e-13) {
                      dVar243 = 1.0;
                      if ((dVar214 < -1e-13) &&
                         (dVar243 = (dVar244 - dVar246) / dVar214, 1.0 <= dVar243)) {
                        dVar243 = 1.0;
                      }
                    }
                    else {
                      dVar243 = (dVar243 - dVar246) / dVar214;
                      if (1.0 <= dVar243) {
                        dVar243 = 1.0;
                      }
                    }
                    if (dVar238 <= dVar243) {
                      dVar243 = dVar238;
                    }
                  }
                  uVar230 = SUB84(dVar246,0);
                  uVar232 = (undefined4)((ulong)dVar246 >> 0x20);
                  dVar238 = dVar243;
                  if ((uVar29 >> 0x13 & 1) != 0) {
                    lVar156 = -1;
                    uVar229 = uVar230;
                    uVar231 = uVar232;
                    dVar238 = dVar246;
                    do {
                      lVar193 = -1;
                      do {
                        iVar102 = 0;
                        bVar197 = true;
                        do {
                          bVar189 = bVar197;
                          if ((((int)lVar193 != 0 || (int)lVar156 != 0) || iVar102 != 0) &&
                             ((1 << ((char)lVar193 * '\x03' + (char)lVar156 * '\t' + '\x12' +
                                     (char)iVar102 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar56[lVar117 * 2 +
                                              (iVar130 + (int)lVar156) * lVar116 +
                                              (iVar98 + (int)lVar193) * lVar57 +
                                              (long)(iVar102 + iVar99)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar238) {
                              dVar214 = dVar238;
                            }
                            dVar238 = dVar214;
                            if (dVar244 <= (double)CONCAT44(uVar231,uVar229) &&
                                (double)CONCAT44(uVar231,uVar229) != dVar244) {
                              uVar229 = SUB84(dVar244,0);
                              uVar231 = (undefined4)((ulong)dVar244 >> 0x20);
                            }
                          }
                          iVar102 = 1;
                          bVar197 = false;
                        } while (bVar189);
                        lVar193 = lVar193 + 1;
                      } while (lVar193 != 2);
                      lVar156 = lVar156 + 1;
                    } while (lVar156 != 2);
                    dVar244 = (((pdVar39 + lVar154 + lVar188 + ((iVar104 - iVar13) + 1))[lVar42] -
                               dVar220) * dVar235 +
                              (pdVar39[lVar154 + lVar188 + ((iVar104 - iVar13) + 1)] - dVar208) *
                              dVar212 + (0.5 - dVar201) * dVar242 + dVar246) - dVar246;
                    if (dVar244 <= 1e-13) {
                      dVar238 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar238 = ((double)CONCAT44(uVar231,uVar229) - dVar246) / dVar244,
                         1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = (dVar238 - dVar246) / dVar244;
                      if (1.0 <= dVar238) {
                        dVar238 = 1.0;
                      }
                    }
                    if (dVar243 <= dVar238) {
                      dVar238 = dVar243;
                    }
                  }
                  dVar243 = dVar238;
                  if ((uVar29 >> 0x11 & 1) != 0) {
                    lVar156 = -1;
                    cVar171 = '\x05';
                    uVar229 = uVar230;
                    uVar231 = uVar232;
                    dVar243 = dVar246;
                    do {
                      lVar193 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar149 = 0;
                        do {
                          if (((int)lVar149 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                             ((1 << (cVar183 + (char)lVar149 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar56[lVar117 * 2 +
                                              (iVar130 + (int)lVar156) * lVar116 +
                                              (iVar98 + (int)lVar193) * lVar57 +
                                              (long)(iVar105 + (int)lVar149)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar243) {
                              dVar214 = dVar243;
                            }
                            dVar243 = dVar214;
                            if (dVar244 <= (double)CONCAT44(uVar231,uVar229) &&
                                (double)CONCAT44(uVar231,uVar229) != dVar244) {
                              uVar229 = SUB84(dVar244,0);
                              uVar231 = (undefined4)((ulong)dVar244 >> 0x20);
                            }
                          }
                          lVar149 = lVar149 + 1;
                        } while (lVar149 != 2);
                        lVar193 = lVar193 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar193 != 2);
                      lVar156 = lVar156 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar156 != 2);
                    dVar244 = (((pdVar39 + lVar154 + lVar188 + (iVar104 - iVar13))[lVar42] - dVar220
                               ) * dVar235 +
                              (pdVar39[lVar154 + lVar188 + (iVar104 - iVar13)] - dVar208) * dVar212
                              + (dVar246 - (dVar201 + 0.5) * dVar242)) - dVar246;
                    if (dVar244 <= 1e-13) {
                      dVar243 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar243 = ((double)CONCAT44(uVar231,uVar229) - dVar246) / dVar244,
                         1.0 <= dVar243)) {
                        dVar243 = 1.0;
                      }
                    }
                    else {
                      dVar243 = (dVar243 - dVar246) / dVar244;
                      if (1.0 <= dVar243) {
                        dVar243 = 1.0;
                      }
                    }
                    if (dVar238 <= dVar243) {
                      dVar243 = dVar238;
                    }
                  }
                  dVar244 = 1.0;
                  dVar238 = dVar243;
                  if ((uVar29 >> 0x1b & 1) != 0) {
                    iVar102 = 0;
                    dVar214 = dVar246;
                    bVar197 = true;
                    do {
                      bVar189 = bVar197;
                      iVar184 = iVar102 * 9 + 0xe;
                      lVar156 = -1;
                      do {
                        lVar193 = 0;
                        do {
                          if (((int)lVar193 != 1 || ((int)lVar156 != 0 || iVar102 != 0)) &&
                             ((1 << ((char)iVar184 + (char)lVar193 & 0x1fU) & uVar29) != 0)) {
                            dVar238 = pdVar56[lVar117 * 2 +
                                              (iVar130 + iVar102) * lVar116 +
                                              (iVar98 + (int)lVar156) * lVar57 +
                                              (long)(iVar105 + (int)lVar193)];
                            dVar213 = dVar238;
                            if (dVar238 <= (double)CONCAT44(uVar232,uVar230)) {
                              dVar213 = (double)CONCAT44(uVar232,uVar230);
                            }
                            if (dVar238 < dVar214) {
                              dVar214 = dVar238;
                            }
                            uVar230 = SUB84(dVar213,0);
                            uVar232 = (undefined4)((ulong)dVar213 >> 0x20);
                          }
                          lVar193 = lVar193 + 1;
                        } while (lVar193 != 3);
                        lVar156 = lVar156 + 1;
                        iVar184 = iVar184 + 3;
                      } while (lVar156 != 2);
                      iVar102 = 1;
                      bVar197 = false;
                    } while (bVar189);
                    dVar201 = ((0.5 - dVar220) * dVar235 +
                              ((pdVar47 + lVar109 + lVar114 + (iVar120 + 1) * lVar49)[lVar50] -
                              dVar208) * dVar212 +
                              (pdVar47[lVar109 + lVar114 + (iVar120 + 1) * lVar49] - dVar201) *
                              dVar242 + dVar246) - dVar246;
                    if (dVar201 <= 1e-13) {
                      dVar238 = dVar244;
                      if ((dVar201 < -1e-13) &&
                         (dVar238 = (dVar214 - dVar246) / dVar201, 1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = ((double)CONCAT44(uVar232,uVar230) - dVar246) / dVar201;
                      if (1.0 <= dVar238) {
                        dVar238 = dVar244;
                      }
                    }
                    if (dVar243 <= dVar238) {
                      dVar238 = dVar243;
                    }
                  }
                  cVar171 = '\x05';
                  lVar156 = -1;
                  dVar201 = dVar246;
                  dVar208 = dVar246;
                  do {
                    lVar193 = -1;
                    cVar183 = cVar171;
                    do {
                      lVar149 = 0;
                      do {
                        if (((int)lVar149 != 1 || ((int)lVar193 != 0 || (int)lVar156 != 0)) &&
                           ((1 << (cVar183 + (char)lVar149 & 0x1fU) & uVar29) != 0)) {
                          dVar243 = pdVar56[lVar117 * 2 +
                                            (iVar130 + (int)lVar156) * lVar116 +
                                            (iVar98 + (int)lVar193) * lVar57 +
                                            (long)(iVar105 + (int)lVar149)];
                          dVar214 = dVar243;
                          if (dVar243 <= dVar208) {
                            dVar214 = dVar208;
                          }
                          dVar208 = dVar214;
                          if (dVar243 < dVar201) {
                            dVar201 = dVar243;
                          }
                        }
                        lVar149 = lVar149 + 1;
                      } while (lVar149 != 3);
                      lVar193 = lVar193 + 1;
                      cVar183 = cVar183 + '\x03';
                    } while (lVar193 != 2);
                    cVar171 = cVar171 + '\t';
                    bVar197 = lVar156 != 0;
                    lVar156 = lVar156 + 1;
                  } while (bVar197);
                  dVar243 = ((dVar236 * dVar212 + dVar242 * dVar199 + dVar246) -
                            (dVar220 + 0.5) * dVar235) - dVar246;
                  if (dVar243 <= 1e-13) {
                    dVar208 = 1.0;
                    if ((dVar243 < -1e-13) &&
                       (dVar208 = (dVar201 - dVar246) / dVar243, 1.0 <= dVar208)) {
                      dVar208 = 1.0;
                    }
                  }
                  else {
                    dVar208 = (dVar208 - dVar246) / dVar243;
                    if (1.0 <= dVar208) {
                      dVar208 = dVar244;
                    }
                  }
                  if (dVar238 <= dVar208) {
                    dVar208 = dVar238;
                  }
                  uVar230 = 0;
                  uVar232 = 0;
                  dVar201 = 0.0;
                  if (1 < iVar132) {
                    dVar201 = dVar208;
                  }
                  dVar238 = 0.0;
                  if (1 < iVar100) {
                    dVar238 = dVar208;
                  }
                  if (1 < iVar180) {
                    uVar230 = SUB84(dVar208,0);
                    uVar232 = (undefined4)((ulong)dVar208 >> 0x20);
                  }
                  if ((dVar245 == 1.0) && (!NAN(dVar245))) {
                    if ((pdVar53[lVar125 + lVar143 + (int)(~uVar24 + iVar104)] == 1.0) &&
                       (((!NAN(pdVar53[lVar125 + lVar143 + (int)(~uVar24 + iVar104)]) &&
                         (pdVar53[lVar125 + lVar143 + (iVar101 + 1)] == 1.0)) &&
                        (!NAN(pdVar53[lVar125 + lVar143 + (iVar101 + 1)]))))) {
                      dVar201 = dVar244;
                    }
                    if (((pdVar53[lVar143 + lVar179 + lVar137] == 1.0) &&
                        (!NAN(pdVar53[lVar143 + lVar179 + lVar137]))) &&
                       ((pdVar53[lVar143 + lVar112 + lVar137] == 1.0 &&
                        (!NAN(pdVar53[lVar143 + lVar112 + lVar137]))))) {
                      dVar238 = dVar244;
                    }
                    if (((pdVar53[lVar125 + lVar152 + lVar137] == 1.0) &&
                        (!NAN(pdVar53[lVar125 + lVar152 + lVar137]))) &&
                       ((pdVar53[lVar125 + (iVar131 + 1) * lVar55 + lVar137] == 1.0 &&
                        (!NAN(pdVar53[lVar125 + (iVar131 + 1) * lVar55 + lVar137]))))) {
                      uVar230 = 0;
                      uVar232 = 0x3ff00000;
                    }
                  }
                  dVar208 = (dVar236 * dVar212 * dVar238 + dVar199 * dVar201 * dVar242 + dVar246) -
                            (dVar220 + 0.5) * dVar235 * (double)CONCAT44(uVar232,uVar230);
                  dVar201 = dVar200;
                  if (dVar208 <= dVar200) {
                    dVar201 = dVar208;
                  }
                  dVar208 = pdVar31[lVar110 + lVar115 + lVar124];
                  dVar220 = pdVar31[lVar110 + lVar115 + lVar124 + lVar32];
                  dVar199 = pdVar31[lVar110 + lVar115 + lVar124 + lVar32 * 2];
                  uVar29 = pEVar36[lVar108 + lVar113 + (iVar128 - iVar12) * lVar38].flag;
                  lVar115 = -1;
                  cVar171 = '\x05';
                  lVar113 = 0;
                  do {
                    lVar157 = -1;
                    lVar156 = lVar144;
                    lVar193 = lVar186;
                    lVar149 = lVar194;
                    cVar183 = cVar171;
                    do {
                      iVar132 = (int)lVar113;
                      ppdVar141 = &local_398.u.p + (long)iVar132 * 3;
                      lVar113 = 0;
                      do {
                        iVar102 = (int)lVar113 + -1;
                        if ((((int)lVar157 == 0 && (int)lVar115 == 0) && iVar102 == 0) ||
                           ((1 << (cVar183 + (char)lVar113 & 0x1fU) & uVar29) == 0)) {
                          *ppdVar141 = (double *)0x0;
                          ppdVar141[1] = (double *)0x0;
                          ppdVar141[2] = (double *)0x0;
                        }
                        else {
                          dVar242 = (*(double *)(lVar149 + lVar113 * 8) + (double)(int)lVar157) -
                                    dVar220;
                          auVar58._8_4_ = SUB84(dVar242,0);
                          auVar58._0_8_ =
                               (*(double *)(lVar156 + lVar113 * 8) + (double)iVar102) - dVar208;
                          auVar58._12_4_ = (int)((ulong)dVar242 >> 0x20);
                          *(undefined1 (*) [16])ppdVar141 = auVar58;
                          ppdVar141[2] = (double *)
                                         ((*(double *)(lVar193 + lVar113 * 8) + (double)(int)lVar115
                                          ) - dVar199);
                        }
                        lVar113 = lVar113 + 1;
                        ppdVar141 = ppdVar141 + 3;
                      } while (lVar113 != 3);
                      lVar157 = lVar157 + 1;
                      lVar156 = lVar156 + lVar51 * 8;
                      lVar149 = lVar149 + lVar2;
                      lVar193 = lVar193 + lVar2;
                      cVar183 = cVar183 + '\x03';
                      lVar113 = (long)iVar132 + 3;
                    } while (lVar157 != 2);
                    lVar115 = lVar115 + 1;
                    lVar144 = lVar144 + lVar52 * 8;
                    lVar194 = lVar194 + lVar138;
                    lVar186 = lVar186 + lVar138;
                    cVar171 = cVar171 + '\t';
                    lVar113 = (long)iVar132 + 3;
                  } while (lVar115 != 2);
                  dVar242 = dVar233;
                  if (dVar233 <= dVar201) {
                    dVar242 = dVar201;
                  }
                  lVar113 = -1;
                  cVar171 = '\x05';
                  lVar144 = 0;
                  do {
                    lVar194 = -1;
                    cVar183 = cVar171;
                    do {
                      iVar132 = (int)lVar144;
                      lVar144 = 0;
                      do {
                        dVar201 = 0.0;
                        if (((int)lVar144 != 1 || ((int)lVar194 != 0 || (int)lVar113 != 0)) &&
                           ((1 << (cVar183 + (char)lVar144 & 0x1fU) & uVar29) != 0)) {
                          dVar201 = pdVar56[lVar117 * 2 +
                                            (iVar129 + (int)lVar113) * lVar116 +
                                            (iVar98 + (int)lVar194) * lVar57 +
                                            (long)(iVar105 + (int)lVar144)] - dVar3;
                        }
                        adStack_108[iVar132 + lVar144] = dVar201;
                        lVar144 = lVar144 + 1;
                      } while (lVar144 != 3);
                      lVar194 = lVar194 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar144 = (long)iVar132 + 3;
                    } while (lVar194 != 2);
                    lVar113 = lVar113 + 1;
                    cVar171 = cVar171 + '\t';
                    lVar144 = (long)iVar132 + 3;
                  } while (lVar113 != 2);
                  dVar201 = 0.0;
                  dVar212 = 0.0;
                  dVar222 = 0.0;
                  pLVar119 = &local_398.u.kstride;
                  lVar113 = 0;
                  dVar214 = 0.0;
                  dVar213 = 0.0;
                  dVar235 = 0.0;
                  dVar236 = 0.0;
                  dVar238 = 0.0;
                  dVar243 = 0.0;
                  do {
                    pdVar169 = ((Array4<double> *)(pLVar119 + -2))->p;
                    dVar237 = (double)pLVar119[-1];
                    dVar225 = adStack_108[lVar113];
                    dVar238 = dVar238 + (double)pdVar169 * (double)pdVar169;
                    dVar243 = dVar243 + dVar237 * dVar237;
                    dVar228 = (double)*pLVar119;
                    dVar222 = dVar222 + dVar237 * dVar228;
                    dVar201 = dVar201 + (double)pdVar169 * dVar225;
                    dVar212 = dVar212 + (double)pdVar169 * dVar228;
                    dVar214 = dVar214 + dVar237 * (double)pdVar169;
                    dVar213 = dVar213 + dVar225 * dVar237;
                    dVar235 = dVar235 + dVar228 * dVar225;
                    dVar236 = dVar236 + dVar228 * dVar228;
                    lVar113 = lVar113 + 1;
                    pLVar119 = pLVar119 + 3;
                  } while (lVar113 != 0x1b);
                  dVar241 = dVar236 * dVar214 + -dVar222 * dVar212;
                  dVar228 = dVar243 * dVar236 - dVar222 * dVar222;
                  dVar237 = dVar214 * dVar222 - dVar243 * dVar212;
                  dVar225 = dVar235 * dVar214 - dVar212 * dVar213;
                  dVar236 = dVar236 * dVar213 - dVar235 * dVar222;
                  auVar223._0_8_ =
                       dVar201 * dVar237 +
                       (dVar238 * (dVar243 * dVar235 - dVar222 * dVar213) - dVar214 * dVar225);
                  auVar223._8_8_ =
                       dVar212 * (dVar213 * dVar222 - dVar243 * dVar235) +
                       (dVar201 * dVar228 - dVar214 * dVar236);
                  dVar235 = dVar237 * dVar212 + (dVar228 * dVar238 - dVar241 * dVar214);
                  auVar204._8_8_ = dVar235;
                  auVar204._0_8_ = dVar235;
                  dVar235 = (dVar225 * dVar212 + (dVar236 * dVar238 - dVar241 * dVar201)) / dVar235;
                  auVar224 = divpd(auVar223,auVar204);
                  dVar201 = pdVar53[lVar125 + lVar152 + lVar137];
                  if ((dVar201 == 1.0) && (!NAN(dVar201))) {
                    uVar198 = auVar224._8_8_;
                    if ((pdVar53[lVar125 + lVar152 + (int)((iVar104 + -1) - uVar24)] == 1.0) &&
                       (!NAN(pdVar53[lVar125 + lVar152 + (int)((iVar104 + -1) - uVar24)]))) {
                      if ((pdVar53[lVar125 + lVar152 + (int)((iVar104 + 1) - uVar24)] == 1.0) &&
                         (!NAN(pdVar53[lVar125 + lVar152 + (int)((iVar104 + 1) - uVar24)]))) {
                        dVar243 = dVar3 - pdVar56[lVar111 + lVar134 + lVar117 * 2 +
                                                                      (long)((iVar104 + -1) - iVar27
                                                                            )];
                        dVar214 = pdVar56[lVar111 + lVar134 + lVar117 * 2 +
                                                              (long)((iVar104 + 1) - iVar27)] -
                                  dVar3;
                        dVar243 = dVar243 + dVar243;
                        dVar214 = dVar214 + dVar214;
                        dVar236 = (pdVar56[lVar111 + lVar134 + lVar117 * 2 +
                                                               (long)((iVar104 + 1) - iVar27)] -
                                  pdVar56[lVar111 + lVar134 + lVar117 * 2 +
                                                              (long)((iVar104 + -1) - iVar27)]) *
                                  0.5;
                        dVar212 = ABS(dVar243);
                        uVar198 = -(ulong)(0.0 < dVar236);
                        dVar236 = ABS(dVar236);
                        dVar238 = ABS(dVar214);
                        if (dVar212 <= dVar236) {
                          dVar236 = dVar212;
                        }
                        if (dVar236 <= dVar238) {
                          dVar238 = dVar236;
                        }
                        uVar215 = -(ulong)(0.0 < dVar243 * dVar214) & (ulong)dVar238;
                        uVar198 = ~uVar198 & (uVar215 ^ 0x8000000000000000) | uVar198 & uVar215;
                      }
                    }
                    if ((((pdVar53[lVar152 + lVar126 + lVar137] == 1.0) &&
                         (!NAN(pdVar53[lVar152 + lVar126 + lVar137]))) &&
                        (pdVar53[lVar152 + lVar136 + lVar137] == 1.0)) &&
                       (!NAN(pdVar53[lVar152 + lVar136 + lVar137]))) {
                      dVar238 = dVar3 - pdVar56[lVar117 * 2 + lVar134 + lVar155 + lVar127];
                      dVar243 = pdVar56[lVar117 * 2 + lVar134 + lVar160 + lVar127] - dVar3;
                      dVar238 = dVar238 + dVar238;
                      dVar243 = dVar243 + dVar243;
                      dVar236 = (pdVar56[lVar117 * 2 + lVar134 + lVar160 + lVar127] -
                                pdVar56[lVar117 * 2 + lVar134 + lVar155 + lVar127]) * 0.5;
                      dVar212 = ABS(dVar238);
                      uVar215 = -(ulong)(0.0 < dVar236);
                      dVar236 = ABS(dVar236);
                      dVar235 = ABS(dVar243);
                      if (dVar212 <= dVar236) {
                        dVar236 = dVar212;
                      }
                      if (dVar236 <= dVar235) {
                        dVar235 = dVar236;
                      }
                      uVar216 = -(ulong)(0.0 < dVar238 * dVar243) & (ulong)dVar235;
                      dVar235 = (double)(~uVar215 & (uVar216 ^ 0x8000000000000000) |
                                        uVar215 & uVar216);
                    }
                    auVar224._8_8_ = uVar198;
                    if (((pdVar53[lVar125 + ((iVar192 + -2) - iVar26) * lVar55 + lVar137] == 1.0) &&
                        (!NAN(pdVar53[lVar125 + ((iVar192 + -2) - iVar26) * lVar55 + lVar137]))) &&
                       ((dVar245 == 1.0 && (!NAN(dVar245))))) {
                      dVar236 = dVar3 - pdVar56[lVar111 + lVar127 + (int)((iVar192 + -2) - uVar28) *
                                                                    lVar116 + lVar117 * 2];
                      dVar236 = dVar236 + dVar236;
                      dVar238 = (dVar246 - dVar3) + (dVar246 - dVar3);
                      dVar245 = (dVar246 -
                                pdVar56[lVar111 + lVar127 + (int)((iVar192 + -2) - uVar28) * lVar116
                                                            + lVar117 * 2]) * 0.5;
                      dVar212 = ABS(dVar236);
                      uVar215 = -(ulong)(0.0 < dVar245);
                      dVar245 = ABS(dVar245);
                      dVar246 = ABS(dVar238);
                      if (dVar212 <= dVar245) {
                        dVar245 = dVar212;
                      }
                      if (dVar245 <= dVar246) {
                        dVar246 = dVar245;
                      }
                      uVar216 = -(ulong)(0.0 < dVar236 * dVar238) & (ulong)dVar246;
                      auVar224._0_8_ = ~uVar215 & (uVar216 ^ 0x8000000000000000) | uVar215 & uVar216
                      ;
                    }
                  }
                  iVar102 = 0;
                  iVar132 = 0;
                  iVar100 = 0;
                  iVar180 = 0;
                  uVar165 = 0xffffffff;
                  do {
                    uVar121 = uVar165 + 1;
                    iVar184 = iVar102;
                    uVar150 = 0xffffffff;
                    do {
                      uVar103 = uVar150 + 1;
                      iVar142 = 5;
                      do {
                        if (((uVar29 >> (iVar142 + iVar184 & 0x1fU) & 1) != 0) &&
                           ((iVar142 != 6 || uVar150 != 0) || uVar165 != 0)) {
                          iVar132 = iVar132 + (uint)((iVar142 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar150 == 0 && uVar165 == 0));
                          iVar100 = iVar100 + (uint)((iVar142 == 6 && uVar165 == 0) &&
                                                    (uVar103 & 0xfffffffd) == 0);
                          iVar180 = iVar180 + (uint)((iVar142 == 6 && uVar150 == 0) &&
                                                    (uVar121 & 0xfffffffd) == 0);
                        }
                        iVar142 = iVar142 + 1;
                      } while (iVar142 != 8);
                      iVar184 = iVar184 + 3;
                      uVar150 = uVar103;
                    } while (uVar103 != 2);
                    iVar102 = iVar102 + 9;
                    uVar165 = uVar121;
                  } while (uVar121 != 2);
                  dVar245 = auVar224._0_8_;
                  dVar212 = auVar224._8_8_;
                  dVar246 = 2.0;
                  if ((uVar29 >> 0x15 & 1) != 0) {
                    lVar113 = -1;
                    cVar171 = '\b';
                    dVar236 = dVar3;
                    dVar246 = dVar3;
                    do {
                      iVar102 = 0;
                      bVar197 = true;
                      do {
                        bVar189 = bVar197;
                        lVar144 = 0;
                        do {
                          if (((int)lVar144 != 1 || (iVar102 != 0 || (int)lVar113 != 0)) &&
                             ((1 << ((char)iVar102 * '\x03' + cVar171 + (char)lVar144 & 0x1fU) &
                              uVar29) != 0)) {
                            dVar238 = pdVar56[lVar117 * 2 +
                                              (iVar129 + (int)lVar113) * lVar116 +
                                              (iVar98 + iVar102) * lVar57 +
                                              (long)(iVar105 + (int)lVar144)];
                            dVar243 = dVar238;
                            if (dVar238 <= dVar246) {
                              dVar243 = dVar246;
                            }
                            dVar246 = dVar243;
                            if (dVar238 < dVar236) {
                              dVar236 = dVar238;
                            }
                          }
                          lVar144 = lVar144 + 1;
                        } while (lVar144 != 3);
                        iVar102 = 1;
                        bVar197 = false;
                      } while (bVar189);
                      lVar113 = lVar113 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar113 != 2);
                    dVar238 = (((pdVar43 + lVar106 + lVar167 + (iVar104 - iVar16))[lVar46] - dVar199
                               ) * dVar245 +
                              (0.5 - dVar220) * dVar235 +
                              (pdVar43[lVar106 + lVar167 + (iVar104 - iVar16)] - dVar208) * dVar212
                              + dVar3) - dVar3;
                    if (dVar238 <= 1e-13) {
                      if ((dVar238 < -1e-13) &&
                         (dVar244 = (dVar236 - dVar3) / dVar238, 1.0 <= dVar244)) {
                        dVar244 = 1.0;
                      }
                    }
                    else {
                      dVar244 = (dVar246 - dVar3) / dVar238;
                      if (1.0 <= dVar244) {
                        dVar244 = 1.0;
                      }
                    }
                    dVar246 = dVar244;
                    if (2.0 <= dVar244) {
                      dVar246 = 2.0;
                    }
                  }
                  dVar236 = dVar246;
                  if ((short)uVar29 < 0) {
                    lVar113 = -1;
                    cVar171 = '\x05';
                    dVar236 = dVar3;
                    dVar238 = dVar3;
                    do {
                      lVar144 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar194 = 0;
                        do {
                          if (((int)lVar194 != 1 || ((int)lVar144 != 0 || (int)lVar113 != 0)) &&
                             ((1 << (cVar183 + (char)lVar194 & 0x1fU) & uVar29) != 0)) {
                            dVar243 = pdVar56[lVar117 * 2 +
                                              (iVar129 + (int)lVar113) * lVar116 +
                                              (iVar98 + (int)lVar144) * lVar57 +
                                              (long)(iVar105 + (int)lVar194)];
                            dVar244 = dVar243;
                            if (dVar243 <= dVar236) {
                              dVar244 = dVar236;
                            }
                            dVar236 = dVar244;
                            if (dVar243 < dVar238) {
                              dVar238 = dVar243;
                            }
                          }
                          lVar194 = lVar194 + 1;
                        } while (lVar194 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar197 = lVar144 != 0;
                        lVar144 = lVar144 + 1;
                      } while (bVar197);
                      lVar113 = lVar113 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar113 != 2);
                    dVar243 = (((pdVar43 + lVar106 + lVar173 + (iVar104 - iVar16))[lVar46] - dVar199
                               ) * dVar245 +
                              -(dVar220 + 0.5) * dVar235 +
                              (pdVar43[lVar106 + lVar173 + (iVar104 - iVar16)] - dVar208) * dVar212
                              + dVar3) - dVar3;
                    if (dVar243 <= 1e-13) {
                      dVar236 = 1.0;
                      if ((dVar243 < -1e-13) &&
                         (dVar236 = (dVar238 - dVar3) / dVar243, 1.0 <= dVar236)) {
                        dVar236 = 1.0;
                      }
                    }
                    else {
                      dVar236 = (dVar236 - dVar3) / dVar243;
                      if (1.0 <= dVar236) {
                        dVar236 = 1.0;
                      }
                    }
                    if (dVar246 <= dVar236) {
                      dVar236 = dVar246;
                    }
                  }
                  dVar246 = dVar236;
                  if ((uVar29 >> 0x13 & 1) != 0) {
                    dVar238 = pdVar56[lVar111 + lVar127 + lVar134 + lVar117 * 2];
                    lVar113 = -1;
                    dVar246 = dVar238;
                    dVar243 = dVar238;
                    do {
                      lVar144 = -1;
                      do {
                        iVar102 = 0;
                        dVar244 = dVar246;
                        bVar197 = true;
                        do {
                          bVar189 = bVar197;
                          dVar246 = dVar244;
                          if ((((int)lVar144 != 0 || (int)lVar113 != 0) || iVar102 != 0) &&
                             ((1 << ((char)lVar144 * '\x03' + (char)lVar113 * '\t' + '\x12' +
                                     (char)iVar102 & 0x1fU) & uVar29) != 0)) {
                            dVar214 = pdVar56[lVar117 * 2 +
                                              (iVar129 + (int)lVar113) * lVar116 +
                                              (iVar98 + (int)lVar144) * lVar57 +
                                              (long)(iVar102 + iVar99)];
                            dVar246 = dVar214;
                            if (dVar214 <= dVar244) {
                              dVar246 = dVar244;
                            }
                            if (dVar214 < dVar243) {
                              dVar243 = dVar214;
                            }
                          }
                          iVar102 = 1;
                          dVar244 = dVar246;
                          bVar197 = false;
                        } while (bVar189);
                        lVar144 = lVar144 + 1;
                      } while (lVar144 != 2);
                      lVar113 = lVar113 + 1;
                    } while (lVar113 != 2);
                    dVar244 = (((pdVar39 + lVar107 + lVar188 + ((iVar104 - iVar13) + 1))[lVar42] -
                               dVar199) * dVar245 +
                              (pdVar39[lVar107 + lVar188 + ((iVar104 - iVar13) + 1)] - dVar220) *
                              dVar235 + (0.5 - dVar208) * dVar212 + dVar238) - dVar238;
                    if (dVar244 <= 1e-13) {
                      dVar246 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar246 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar246)) {
                        dVar246 = 1.0;
                      }
                    }
                    else {
                      dVar246 = (dVar246 - dVar238) / dVar244;
                      if (1.0 <= dVar246) {
                        dVar246 = 1.0;
                      }
                    }
                    if (dVar236 <= dVar246) {
                      dVar246 = dVar236;
                    }
                  }
                  dVar236 = dVar246;
                  if ((uVar29 >> 0x11 & 1) != 0) {
                    dVar238 = pdVar56[lVar111 + lVar127 + lVar134 + lVar117 * 2];
                    lVar113 = -1;
                    cVar171 = '\x05';
                    dVar236 = dVar238;
                    dVar243 = dVar238;
                    do {
                      lVar144 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar194 = 0;
                        do {
                          if (((int)lVar194 != 1 || ((int)lVar144 != 0 || (int)lVar113 != 0)) &&
                             ((1 << (cVar183 + (char)lVar194 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar56[lVar117 * 2 +
                                              (iVar129 + (int)lVar113) * lVar116 +
                                              (iVar98 + (int)lVar144) * lVar57 +
                                              (long)(iVar105 + (int)lVar194)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar236) {
                              dVar214 = dVar236;
                            }
                            dVar236 = dVar214;
                            if (dVar244 < dVar243) {
                              dVar243 = dVar244;
                            }
                          }
                          lVar194 = lVar194 + 1;
                        } while (lVar194 != 2);
                        lVar144 = lVar144 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar144 != 2);
                      lVar113 = lVar113 + 1;
                      cVar171 = cVar171 + '\t';
                    } while (lVar113 != 2);
                    dVar244 = (((pdVar39 + lVar107 + lVar188 + (iVar104 - iVar13))[lVar42] - dVar199
                               ) * dVar245 +
                              (pdVar39[lVar107 + lVar188 + (iVar104 - iVar13)] - dVar220) * dVar235
                              + (dVar238 - (dVar208 + 0.5) * dVar212)) - dVar238;
                    if (dVar244 <= 1e-13) {
                      dVar236 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar236 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar236)) {
                        dVar236 = 1.0;
                      }
                    }
                    else {
                      dVar236 = (dVar236 - dVar238) / dVar244;
                      if (1.0 <= dVar236) {
                        dVar236 = 1.0;
                      }
                    }
                    if (dVar246 <= dVar236) {
                      dVar236 = dVar246;
                    }
                  }
                  dVar246 = dVar236;
                  if ((uVar29 >> 0x1b & 1) != 0) {
                    dVar238 = pdVar56[lVar111 + lVar127 + lVar134 + lVar117 * 2];
                    iVar99 = 0;
                    dVar246 = dVar238;
                    dVar243 = dVar238;
                    bVar197 = true;
                    do {
                      bVar189 = bVar197;
                      iVar102 = iVar99 * 9 + 0xe;
                      lVar113 = -1;
                      do {
                        lVar144 = 0;
                        do {
                          if (((int)lVar144 != 1 || ((int)lVar113 != 0 || iVar99 != 0)) &&
                             ((1 << ((char)iVar102 + (char)lVar144 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar56[lVar117 * 2 +
                                              (iVar129 + iVar99) * lVar116 +
                                              (iVar98 + (int)lVar113) * lVar57 +
                                              (long)(iVar105 + (int)lVar144)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar246) {
                              dVar214 = dVar246;
                            }
                            dVar246 = dVar214;
                            if (dVar244 < dVar243) {
                              dVar243 = dVar244;
                            }
                          }
                          lVar144 = lVar144 + 1;
                        } while (lVar144 != 3);
                        lVar113 = lVar113 + 1;
                        iVar102 = iVar102 + 3;
                      } while (lVar113 != 2);
                      iVar99 = 1;
                      bVar197 = false;
                    } while (bVar189);
                    dVar244 = ((0.5 - dVar199) * dVar245 +
                              (pdVar161[lVar50] - dVar220) * dVar235 +
                              (*pdVar161 - dVar208) * dVar212 + dVar238) - dVar238;
                    if (dVar244 <= 1e-13) {
                      dVar246 = 1.0;
                      if ((dVar244 < -1e-13) &&
                         (dVar246 = (dVar243 - dVar238) / dVar244, 1.0 <= dVar246)) {
                        dVar246 = 1.0;
                      }
                    }
                    else {
                      dVar246 = (dVar246 - dVar238) / dVar244;
                      if (1.0 <= dVar246) {
                        dVar246 = 1.0;
                      }
                    }
                    if (dVar236 <= dVar246) {
                      dVar246 = dVar236;
                    }
                  }
                  dVar238 = 1.0;
                  dVar236 = dVar246;
                  if ((uVar29 >> 9 & 1) != 0) {
                    dVar243 = pdVar56[lVar111 + lVar127 + lVar134 + lVar117 * 2];
                    cVar171 = '\x05';
                    uVar230 = SUB84(dVar243,0);
                    uVar232 = (undefined4)((ulong)dVar243 >> 0x20);
                    lVar113 = -1;
                    dVar236 = dVar243;
                    do {
                      lVar144 = -1;
                      cVar183 = cVar171;
                      do {
                        lVar194 = 0;
                        do {
                          if (((int)lVar194 != 1 || ((int)lVar144 != 0 || (int)lVar113 != 0)) &&
                             ((1 << (cVar183 + (char)lVar194 & 0x1fU) & uVar29) != 0)) {
                            dVar244 = pdVar56[lVar117 * 2 +
                                              (iVar129 + (int)lVar113) * lVar116 +
                                              (iVar98 + (int)lVar144) * lVar57 +
                                              (long)(iVar105 + (int)lVar194)];
                            dVar214 = dVar244;
                            if (dVar244 <= dVar236) {
                              dVar214 = dVar236;
                            }
                            dVar236 = dVar214;
                            if (dVar244 <= (double)CONCAT44(uVar232,uVar230) &&
                                (double)CONCAT44(uVar232,uVar230) != dVar244) {
                              uVar230 = SUB84(dVar244,0);
                              uVar232 = (undefined4)((ulong)dVar244 >> 0x20);
                            }
                          }
                          lVar194 = lVar194 + 1;
                        } while (lVar194 != 3);
                        lVar144 = lVar144 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar144 != 2);
                      cVar171 = cVar171 + '\t';
                      bVar197 = lVar113 != 0;
                      lVar113 = lVar113 + 1;
                    } while (bVar197);
                    dVar244 = ((((pdVar47 + lVar109 + lVar114 + (iVar128 - iVar21) * lVar49)[lVar50]
                                - dVar220) * dVar235 +
                               (pdVar47[lVar109 + lVar114 + (iVar128 - iVar21) * lVar49] - dVar208)
                               * dVar212 + dVar243) - (dVar199 + 0.5) * dVar245) - dVar243;
                    if (dVar244 <= 1e-13) {
                      dVar236 = dVar238;
                      if ((dVar244 < -1e-13) &&
                         (dVar236 = ((double)CONCAT44(uVar232,uVar230) - dVar243) / dVar244,
                         1.0 <= dVar236)) {
                        dVar236 = dVar238;
                      }
                    }
                    else {
                      dVar236 = (dVar236 - dVar243) / dVar244;
                      if (1.0 <= dVar236) {
                        dVar236 = dVar238;
                      }
                    }
                    if (dVar246 <= dVar236) {
                      dVar236 = dVar246;
                    }
                  }
                  dVar246 = 0.0;
                  if (1 < iVar132) {
                    dVar246 = dVar236;
                  }
                  dVar243 = 0.0;
                  if (1 < iVar100) {
                    dVar243 = dVar236;
                  }
                  dVar244 = 0.0;
                  if (1 < iVar180) {
                    dVar244 = dVar236;
                  }
                  if ((dVar201 == 1.0) && (!NAN(dVar201))) {
                    if ((pdVar53[lVar125 + lVar152 + (int)(~uVar24 + iVar104)] == 1.0) &&
                       (((!NAN(pdVar53[lVar125 + lVar152 + (int)(~uVar24 + iVar104)]) &&
                         (pdVar53[lVar125 + lVar152 + (iVar101 + 1)] == 1.0)) &&
                        (!NAN(pdVar53[lVar125 + lVar152 + (iVar101 + 1)]))))) {
                      dVar246 = 1.0;
                    }
                    if (((pdVar53[lVar152 + lVar179 + lVar137] == 1.0) &&
                        (!NAN(pdVar53[lVar152 + lVar179 + lVar137]))) &&
                       ((pdVar53[lVar152 + lVar112 + lVar137] == 1.0 &&
                        (!NAN(pdVar53[lVar152 + lVar112 + lVar137]))))) {
                      dVar243 = dVar238;
                    }
                    if (((pdVar53[lVar125 + (iVar131 + -2) * lVar55 + lVar137] == 1.0) &&
                        (!NAN(pdVar53[lVar125 + (iVar131 + -2) * lVar55 + lVar137]))) &&
                       ((pdVar53[lVar125 + lVar143 + lVar137] == 1.0 &&
                        (!NAN(pdVar53[lVar125 + lVar143 + lVar137]))))) {
                      dVar244 = dVar238;
                    }
                  }
                  dVar234 = (0.5 - dVar199) * dVar245 * dVar244 +
                            (dVar234 - dVar208) * dVar212 * dVar246 + dVar3 +
                            (dVar248 - dVar220) * dVar235 * dVar243;
                  if (dVar234 <= dVar200) {
                    dVar200 = dVar234;
                  }
                  if (dVar233 <= dVar200) {
                    dVar233 = dVar200;
                  }
                  iVar99 = d_bcrec[2].bc[5];
                  if (iVar6 == iVar192) {
                    iVar101 = d_bcrec[2].bc[2];
                    switch(iVar101) {
                    case 1:
                    case 2:
                    case 4:
                      dVar233 = dVar242;
                    default:
                      if (((iVar101 == 4) || (dVar234 = dVar242, iVar101 == 2)) &&
                         (dVar234 = 0.0, dVar233 = 0.0, dVar242 <= 0.0)) {
                        dVar234 = dVar242;
                        dVar233 = dVar242;
                      }
                      break;
                    case 3:
                      dVar234 = pdVar56[lVar111 + lVar127 + (int)(~uVar28 + iVar192) * lVar116 +
                                                            lVar117 * 2];
                      dVar233 = pdVar56[lVar111 + lVar127 + (int)(~uVar28 + iVar192) * lVar116 +
                                                            lVar117 * 2];
                      break;
                    case -1:
                      dVar234 = 0.0;
                      dVar233 = 0.0;
                    }
                    dVar242 = dVar234;
                    dVar248 = dVar233;
                    if (iVar7 + 1 == iVar192) goto switchD_004553ef_caseD_0;
                  }
                  else {
                    dVar248 = dVar233;
                    if (iVar7 + 1 != iVar192) goto LAB_00455446;
                    switch(iVar99) {
                    case 1:
                    case 2:
                    case 4:
                      dVar242 = dVar233;
                    default:
switchD_004553ef_caseD_0:
                      if (((iVar99 == 4) || (dVar248 = dVar233, iVar99 == 2)) &&
                         (dVar242 = 0.0, dVar248 = 0.0, 0.0 <= dVar233)) {
                        dVar242 = dVar233;
                        dVar248 = dVar233;
                      }
                      break;
                    case 3:
                      dVar242 = pdVar56[lVar111 + lVar127 + lVar135 + lVar117 * 2];
                      dVar248 = dVar242;
                      break;
                    case -1:
                      dVar248 = 0.0;
                      dVar242 = 0.0;
                      goto LAB_0045545a;
                    }
                  }
LAB_00455446:
                  if ((0.0 <= dVar248) || (dVar234 = 0.0, dVar242 <= 0.0)) {
LAB_0045545a:
                    dVar201 = (dVar242 + dVar248) * 0.5;
                    dVar234 = dVar248;
                    if ((dVar201 < 1e-08) && (dVar234 = 0.0, dVar201 <= -1e-08)) {
                      dVar234 = dVar242;
                    }
                  }
                }
                pdVar33[((long)iVar192 - (long)iVar187) * lVar35 +
                        (lVar176 - iVar11) * lVar34 + (lVar168 - iVar10)] = dVar234;
                iVar172 = iVar172 + 1;
                iVar105 = iVar105 + 1;
                bVar197 = iVar104 != iVar9;
                iVar104 = iVar104 + 1;
              } while (bVar197);
            }
            bVar197 = iVar178 != iVar147;
            iVar178 = iVar178 + 1;
          } while (bVar197);
        }
        bVar197 = iVar192 != iVar8;
        iVar192 = iVar192 + 1;
      } while (bVar197);
    }
  }
  return;
}

Assistant:

void
EBMOL::ExtrapVelToFacesBox ( AMREX_D_DECL( Box const& ubx,
                                           Box const& vbx,
                                           Box const& wbx ),
                             AMREX_D_DECL( Array4<Real> const& u,
                                           Array4<Real> const& v,
                                           Array4<Real> const& w ),
                             Array4<Real const> const& vcc,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL( Array4<Real const> const& fcx,
                                           Array4<Real const> const& fcy,
                                           Array4<Real const> const& fcz ),
                             Array4<Real const> const& ccc,
                             Array4<Real const> const& vfrac,
                             const Geometry&  geom,
                             Vector<BCRec> const& h_bcrec,
                             const BCRec* d_bcrec )
{

    const Box& domain_box = geom.Domain();
    AMREX_D_TERM(
        const int domain_ilo = domain_box.smallEnd(0);
        const int domain_ihi = domain_box.bigEnd(0);,
        const int domain_jlo = domain_box.smallEnd(1);
        const int domain_jhi = domain_box.bigEnd(1);,
        const int domain_klo = domain_box.smallEnd(2);
        const int domain_khi = domain_box.bigEnd(2););

    int order = 2;

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************


    int n_for_xbc = 0;

    auto extdir_lohi_x_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_u = extdir_lohi_x_for_u.first;
    bool has_extdir_or_ho_hi_x_for_u = extdir_lohi_x_for_u.second;

    auto extdir_lohi_y_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_u = extdir_lohi_y_for_u.first;
    bool has_extdir_or_ho_hi_y_for_u = extdir_lohi_y_for_u.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_u = extdir_lohi_z_for_u.first;
    bool has_extdir_or_ho_hi_z_for_u = extdir_lohi_z_for_u.second;
#endif



    // ****************************************************************************
    // Predict to x-faces
    // ****************************************************************************
    if ((has_extdir_or_ho_lo_x_for_u && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_u && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_u && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_u && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_u && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_u && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[0].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[0].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[0].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[0].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[0].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[0].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif
               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               Real vcc_mns = vcc(i-1,j,k,0);
               Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }

               if (i == domain_ilo && (d_bcrec[0].lo(0) == BCType::ext_dir)) {
                   u_val = vcc_mns;
               } else if (i == domain_ihi+1 && (d_bcrec[0].hi(0) == BCType::ext_dir)) {
                   u_val = vcc_pls;
               }
            }

            u(i,j,k) = u_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_ilo,domain_ihi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i-1,j,k,0);
               const Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }
            }

            u(i,j,k) = u_val;
        });
    }

    // ****************************************************************************
    // Predict to y-faces
    // ****************************************************************************

    int n_for_ybc = 1;

    auto extdir_lohi_x_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_v = extdir_lohi_x_for_v.first;
    bool has_extdir_or_ho_hi_x_for_v = extdir_lohi_x_for_v.second;

    auto extdir_lohi_y_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_v = extdir_lohi_y_for_v.first;
    bool has_extdir_or_ho_hi_y_for_v = extdir_lohi_y_for_v.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_v = extdir_lohi_z_for_v.first;
    bool has_extdir_or_ho_hi_z_for_v = extdir_lohi_z_for_v.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_v && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_v && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_v && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_v && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_v && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_v && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[1].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[1].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[1].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[1].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[1].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[1].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }

               if (j == domain_jlo && (d_bcrec[1].lo(1) == BCType::ext_dir)) {
                   v_val = vcc_mns;
               }
               else if (j == domain_jhi+1 && (d_bcrec[1].hi(1) == BCType::ext_dir)) {
                   v_val = vcc_pls;
               }
            }

            v(i,j,k) = v_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_jlo,domain_jhi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }
            }

            v(i,j,k) = v_val;
        });
    }

#if (AMREX_SPACEDIM == 3)
    // ****************************************************************************
    // Predict to z-faces
    // ****************************************************************************

    int n_for_zbc = 2;

    auto extdir_lohi_x_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_w = extdir_lohi_x_for_w.first;
    bool has_extdir_or_ho_hi_x_for_w = extdir_lohi_x_for_w.second;

    auto extdir_lohi_y_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_w = extdir_lohi_y_for_w.first;
    bool has_extdir_or_ho_hi_y_for_w = extdir_lohi_y_for_w.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_w = extdir_lohi_z_for_w.first;
    bool has_extdir_or_ho_hi_z_for_w = extdir_lohi_z_for_w.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_w && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_w && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_w && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_w && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_w && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_w && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         domain_ilo,domain_ihi,domain_jlo,domain_jhi,domain_klo,domain_khi,
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            bool extdir_or_ho_ilo = (d_bcrec[2].lo(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (d_bcrec[2].hi(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(0) == BCType::hoextrap);

            bool extdir_or_ho_jlo = (d_bcrec[2].lo(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(1) == BCType::hoextrap);
            bool extdir_or_ho_jhi = (d_bcrec[2].hi(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(1) == BCType::hoextrap);

            bool extdir_or_ho_klo = (d_bcrec[2].lo(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (d_bcrec[2].hi(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(2) == BCType::hoextrap);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }

                if (k == domain_klo && (d_bcrec[2].lo(2) == BCType::ext_dir)) {
                    w_val = vcc_mns;
                }
                else if (k == domain_khi+1 && (d_bcrec[2].hi(2) == BCType::ext_dir)) {
                    w_val = vcc_pls;
                }
            }

            w(i,j,k) = w_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_klo,domain_khi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }
            }

            w(i,j,k) = w_val;
        });
    }
#endif
}